

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE **ppBVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ZSTD_OptPrice_e ZVar6;
  rawSeqStore_t *prVar7;
  ZSTD_match_t *pZVar8;
  seqDef *psVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  ZSTD_optimal_t *pZVar13;
  undefined4 uVar14;
  optState_t *poVar15;
  undefined1 *puVar16;
  U32 i;
  U32 UVar17;
  U32 UVar18;
  U32 UVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  U32 *pUVar23;
  int iVar24;
  int iVar25;
  ZSTD_optimal_t *pZVar26;
  void *pvVar27;
  BYTE *pBVar28;
  uint uVar29;
  int iVar30;
  BYTE *pBVar31;
  bool bVar32;
  BYTE *pStart_2;
  ulong *puVar33;
  undefined1 *puVar34;
  uint uVar35;
  uint uVar36;
  ulong *puVar37;
  ulong uVar38;
  ulong uVar39;
  uint *puVar40;
  int iVar41;
  BYTE *pStart_8;
  ulong *puVar42;
  BYTE *pStart_3;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  BYTE *pStart;
  BYTE *pBVar46;
  U32 *pUVar47;
  uint uVar48;
  BYTE *base_2;
  ZSTD_optimal_t *pZVar49;
  uint uVar50;
  ulong *puVar51;
  ulong *puVar52;
  ulong *puVar53;
  BYTE *pBVar54;
  U32 *pUVar55;
  uint uVar56;
  U32 UVar57;
  BYTE *base;
  ulong *puVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  ZSTD_matchState_t *pZVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_16;
  U32 nbMatches;
  U32 nbMatches_2;
  U32 nextToUpdate3;
  BYTE *local_230;
  BYTE *local_228;
  ulong *local_220;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  BYTE *local_1f8;
  ulong *local_1e0;
  ulong *local_1d8;
  ulong *local_1d0;
  undefined1 local_1c4 [8];
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  void *local_190;
  ulong *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  ZSTD_optimal_t *local_168;
  undefined8 local_160;
  ulong *local_158;
  ZSTD_optimal_t *local_150;
  ulong local_148;
  uint local_140;
  undefined8 local_138;
  ulong *local_130;
  U32 *local_128;
  BYTE *local_120;
  seqStore_t *local_118;
  optState_t *local_110;
  ulong *local_108;
  ulong *local_100;
  ulong *local_f8;
  ZSTD_optimal_t *local_f0;
  undefined8 local_e8;
  U32 *local_e0;
  U32 *local_d8;
  ZSTD_optimal_t *local_d0;
  ZSTD_optimal_t *local_c8;
  ulong *local_c0;
  void *local_b8;
  ulong *local_b0;
  int local_a4;
  ZSTD_optimal_t *local_a0;
  U32 local_94;
  undefined8 local_90;
  U32 local_88;
  U32 *local_80;
  ulong local_78;
  size_t local_70;
  ZSTD_optLdm_t local_68;
  
  local_118 = seqStore;
  local_f8 = (ulong *)rep;
  if (((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) {
    uVar48 = (ms->window).dictLimit;
    if ((uVar48 == (ms->window).lowLimit) &&
       ((0x400 < srcSize && (pBVar46 = (ms->window).base, uVar48 == (int)src - (int)pBVar46)))) {
      local_140 = rep[2];
      local_148 = *(ulong *)rep;
      local_110 = &ms->opt;
      local_1a0 = (ulong *)((long)src + (srcSize - 8));
      uVar29 = (ms->cParams).targetLength;
      uVar56 = 0xfff;
      if (uVar29 < 0xfff) {
        uVar56 = uVar29;
      }
      local_158 = (ulong *)CONCAT44(local_158._4_4_,uVar56);
      uVar29 = (ms->cParams).minMatch;
      local_94 = ms->nextToUpdate;
      prVar7 = ms->ldmSeqStore;
      if (prVar7 == (rawSeqStore_t *)0x0) {
        local_68.seqStore.posInSequence = 0;
        local_68.seqStore.size = 0;
        local_68.seqStore.seq = (rawSeq *)0x0;
        local_68.seqStore.pos = 0;
        local_68.seqStore.capacity = 0;
      }
      else {
        local_68.seqStore.capacity = prVar7->capacity;
        local_68.seqStore.seq = prVar7->seq;
        local_68.seqStore.pos = prVar7->pos;
        local_68.seqStore.posInSequence = prVar7->posInSequence;
        local_68.seqStore.size = prVar7->size;
      }
      pZVar8 = (ms->opt).matchTable;
      local_f0 = (ms->opt).priceTable;
      local_68.offset = 0;
      local_68.startPosInBlock = 0;
      local_68.endPosInBlock = 0;
      ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
      local_70 = srcSize;
      ZSTD_rescaleFreqs(local_110,(BYTE *)src,srcSize,2);
      local_b0 = (ulong *)src;
      puVar42 = (ulong *)((ulong)(pBVar46 + uVar48 == (BYTE *)src) + (long)src);
      if (puVar42 < local_1a0) {
        puVar37 = (ulong *)((long)src + local_70);
        uVar48 = (uint)(uVar29 != 3);
        uVar29 = uVar48 + 3;
        local_120 = (BYTE *)(ulong)(uVar48 + 2);
        puVar1 = (ulong *)((long)puVar37 + -7);
        local_188 = (ulong *)((long)puVar37 + -3);
        puVar2 = (ulong *)((long)puVar37 + -1);
        local_e0 = local_f0->rep;
        local_130 = puVar37 + -4;
        local_78 = (ulong)uVar29;
        local_c0 = (ulong *)(ulong)uVar29;
        local_a0 = local_f0 + 1;
        local_c8 = (ZSTD_optimal_t *)src;
        local_d0 = (ZSTD_optimal_t *)src;
        local_b8 = src;
        local_190 = src;
        local_150 = (ZSTD_optimal_t *)src;
        do {
          iVar25 = (int)puVar42;
          local_168 = (ZSTD_optimal_t *)(ulong)(uint)(iVar25 - (int)local_c8);
          pBVar46 = (ms->window).base;
          uVar48 = ms->nextToUpdate;
          uVar20 = (ulong)uVar48;
          uVar29 = 0;
          if (pBVar46 + uVar20 <= puVar42) {
            UVar18 = (ms->cParams).minMatch;
            uVar29 = iVar25 - (int)pBVar46;
            while (uVar48 < uVar29) {
              UVar17 = ZSTD_insertBt1(ms,pBVar46 + uVar20,(BYTE *)puVar37,UVar18,0);
              uVar48 = (int)uVar20 + UVar17;
              uVar20 = (ulong)uVar48;
            }
            ms->nextToUpdate = uVar29;
            local_160._4_4_ = (undefined4)((ulong)local_160 >> 0x20);
            local_1a8._4_4_ = (uint)((ulong)local_1a8 >> 0x20);
            local_178._4_4_ = (undefined4)((ulong)local_178 >> 0x20);
            local_208 = local_120;
            if (UVar18 - 6 < 2) {
              uVar20 = (ulong)((uint)local_168 == 0);
              uVar48 = (ms->cParams).targetLength;
              if (0xffe < uVar48) {
                uVar48 = 0xfff;
              }
              uStack_1bc = (undefined4)((ulong)unique0x10003264 >> 0x20);
              stack0xfffffffffffffe40 = (ulong *)CONCAT44(uStack_1bc,uVar48);
              local_1b0 = (uint *)(ms->window).base;
              uVar45 = iVar25 - (int)local_1b0;
              local_180 = (ulong *)(*puVar42 * -0x30e4432340650000 >>
                                   (-(char)(ms->cParams).hashLog & 0x3fU));
              uVar29 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar24 = uVar45 - uVar29;
              uVar56 = 0;
              if (uVar45 < uVar29) {
                iVar24 = 0;
              }
              local_1b8._4_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
              local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,iVar24);
              uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar35 = (ms->window).lowLimit;
              uVar50 = uVar45 - uVar36;
              if (uVar45 - uVar35 <= uVar36) {
                uVar50 = uVar35;
              }
              pUVar47 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar50 = uVar35;
              }
              local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar50);
              local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar50 + (uVar50 == 0));
              local_160 = (ZSTD_optimal_t *)CONCAT44(local_160._4_4_,uVar29);
              uVar21 = (ulong)((uVar29 & uVar45) * 2);
              local_170 = (ulong *)(pUVar47 + uVar21);
              local_1d0 = (ulong *)(pUVar47 + uVar21 + 1);
              UVar18 = (ms->window).dictLimit;
              iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar63 = true;
              local_128 = ms->hashTable;
              uVar39 = (ulong)local_128[(long)local_180];
              iVar24 = uVar45 + 9;
              uVar21 = uVar20 + 3;
              puVar58 = (ulong *)((long)puVar42 + 4);
              local_198 = (ulong *)((long)puVar42 + 0xc);
              pZVar62 = ms;
              do {
                uVar29 = (int)local_148 - 1;
                if (uVar20 != 3) {
                  uVar29 = *(uint *)((long)&local_148 + uVar20 * 4);
                }
                pBVar46 = (BYTE *)0x0;
                if (((uVar29 - 1 < uVar45 - UVar18) && (uVar50 <= uVar45 - uVar29)) &&
                   ((uint)*puVar42 == *(uint *)((long)puVar42 - (ulong)uVar29))) {
                  puVar33 = (ulong *)((long)puVar58 - (ulong)uVar29);
                  puVar22 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar43 = *puVar58 ^ *puVar33;
                    uVar38 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                    iVar41 = (int)uVar38;
                    puVar22 = local_198;
                    if (*puVar33 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        if (puVar1 <= puVar22) goto LAB_00700301;
                        uVar43 = *puVar33;
                        uVar10 = *puVar22;
                        uVar11 = 0;
                        if ((uVar10 ^ uVar43) != 0) {
                          for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                          }
                        }
                        puVar51 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar22);
                        puVar22 = puVar22 + 1;
                        if (uVar43 != uVar10) {
                          uVar38 = (long)puVar51 - (long)puVar58;
                          puVar22 = puVar51;
                        }
                        iVar41 = (int)uVar38;
                      } while (uVar43 == uVar10);
                    }
                  }
                  else {
LAB_00700301:
                    if ((puVar22 < local_188) && ((uint)*puVar33 == (uint)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar33 = (ulong *)((long)puVar33 + 4);
                    }
                    if ((puVar22 < puVar2) && ((short)*puVar33 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar33 = (ulong *)((long)puVar33 + 2);
                    }
                    if (puVar22 < puVar37) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar22))
                      ;
                    }
                    iVar41 = (int)puVar22 - (int)puVar58;
                  }
                  pBVar46 = (BYTE *)(ulong)(iVar41 + 4);
                }
                uVar29 = (uint)pBVar46;
                bVar32 = true;
                if (local_208 < pBVar46) {
                  pZVar8[uVar56].off = (int)uVar20 - (uint)((uint)local_168 == 0);
                  uVar35 = uVar56 + 1;
                  pZVar8[uVar56].len = uVar29;
                  bVar64 = (ulong *)((long)puVar42 + (long)pBVar46) != puVar37;
                  bVar32 = bVar64 && uVar29 <= uVar48;
                  pZVar62 = (ZSTD_matchState_t *)((ulong)pZVar62 & 0xffffffff);
                  local_208 = pBVar46;
                  uVar56 = uVar35;
                  if (!bVar64 || uVar29 > uVar48) {
                    pZVar62 = (ZSTD_matchState_t *)(ulong)uVar35;
                  }
                }
                uVar29 = (uint)pZVar62;
                if (!bVar32) break;
                uVar20 = uVar20 + 1;
                bVar63 = uVar20 < uVar21;
              } while (bVar63);
              if (!bVar63) {
                local_128[(long)local_180] = uVar45;
                local_1f8 = (BYTE *)0x0;
                pBVar46 = (BYTE *)0x0;
                uVar20 = (ulong)uVar56;
                do {
                  uVar29 = (uint)uVar20;
                  bVar63 = iVar30 == 0;
                  iVar30 = iVar30 + -1;
                  if (bVar63) break;
                  uVar48 = (uint)uVar39;
                  if (uVar48 < (uint)local_178) break;
                  pBVar28 = local_1f8;
                  if (pBVar46 < local_1f8) {
                    pBVar28 = pBVar46;
                  }
                  puVar58 = (ulong *)((long)puVar42 + (long)pBVar28);
                  puVar22 = (ulong *)((long)local_1b0 + (long)(pBVar28 + uVar39));
                  puVar33 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar38 = *puVar58 ^ *puVar22;
                    uVar21 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar31 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                    if (*puVar22 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        puVar22 = puVar22 + 1;
                        if (puVar1 <= puVar33) goto LAB_007004b2;
                        uVar38 = *puVar33 ^ *puVar22;
                        uVar21 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        pBVar31 = (BYTE *)((long)puVar33 +
                                          ((uVar21 >> 3 & 0x1fffffff) - (long)puVar58));
                      } while (*puVar22 == *puVar33);
                    }
                  }
                  else {
LAB_007004b2:
                    if ((puVar33 < local_188) && ((uint)*puVar22 == (uint)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar22 = (ulong *)((long)puVar22 + 4);
                    }
                    if ((puVar33 < puVar2) && ((short)*puVar22 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar22 = (ulong *)((long)puVar22 + 2);
                    }
                    if (puVar33 < puVar37) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar31 = (BYTE *)((long)puVar33 - (long)puVar58);
                  }
                  pBVar31 = pBVar31 + (long)pBVar28;
                  if (local_208 < pBVar31) {
                    iVar41 = uVar48 + (U32)pBVar31;
                    if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                      iVar41 = iVar24;
                    }
                    pZVar8[uVar20].off = (uVar45 + 2) - uVar48;
                    pZVar8[uVar20].len = (U32)pBVar31;
                    uVar20 = (ulong)(uVar29 + 1);
                    iVar24 = iVar41;
                    local_208 = pBVar31;
                    if ((pBVar31 < (BYTE *)0x1001) &&
                       ((ulong *)((long)puVar42 + (long)pBVar31) != puVar37)) goto LAB_00700569;
LAB_007005f3:
                    bVar63 = false;
                  }
                  else {
LAB_00700569:
                    puVar58 = (ulong *)(pUVar47 + (uVar48 & (uint)local_160) * 2);
                    if (*(byte *)((long)puVar42 + (long)pBVar31) <=
                        *(byte *)((long)local_1b0 + (long)(pBVar31 + uVar39))) {
                      *(uint *)local_1d0 = uVar48;
                      local_1f8 = pBVar31;
                      local_1d0 = puVar58;
                      if ((uint)local_1b8 < uVar48) goto LAB_007005ca;
                      local_1d0 = (ulong *)local_1c4;
                      goto LAB_007005f3;
                    }
                    *(uint *)local_170 = uVar48;
                    pBVar46 = pBVar31;
                    if ((uint)local_1b8 < uVar48) {
                      puVar58 = (ulong *)((long)puVar58 + 4);
                      local_170 = puVar58;
LAB_007005ca:
                      uVar39 = (ulong)(uint)*puVar58;
                      bVar63 = true;
                    }
                    else {
                      bVar63 = false;
                      local_170 = (ulong *)local_1c4;
                    }
                  }
                  uVar29 = (uint)uVar20;
                } while (bVar63);
                *(uint *)local_1d0 = 0;
                puVar58 = local_170;
LAB_007010b8:
                *(uint *)puVar58 = 0;
                ms->nextToUpdate = iVar24 - 8;
              }
            }
            else if (UVar18 == 5) {
              pBVar46 = (BYTE *)(ulong)((uint)local_168 == 0);
              uVar48 = (ms->cParams).targetLength;
              if (0xffe < uVar48) {
                uVar48 = 0xfff;
              }
              local_170 = (ulong *)(ms->window).base;
              uVar35 = iVar25 - (int)local_170;
              local_1a8 = (ulong *)(ulong)uVar35;
              local_128 = (U32 *)(*puVar42 * -0x30e4432345000000 >>
                                 (-(char)(ms->cParams).hashLog & 0x3fU));
              uVar50 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar45 = uVar35 - uVar50;
              uVar56 = 0;
              if (uVar35 < uVar50) {
                uVar45 = 0;
              }
              uVar61 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar29 = (ms->window).lowLimit;
              uVar36 = uVar35 - uVar61;
              if (uVar35 - uVar29 <= uVar61) {
                uVar36 = uVar29;
              }
              local_198 = (ulong *)ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar36 = uVar29;
              }
              local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar36);
              uVar20 = (ulong)((uVar50 & uVar35) * 2);
              local_1b8 = (ulong *)((long)local_198 + uVar20 * 4);
              local_160 = (ZSTD_optimal_t *)((long)local_198 + uVar20 * 4 + 4);
              UVar18 = (ms->window).dictLimit;
              iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_1b0 = (uint *)-(long)pBVar46;
              bVar63 = true;
              local_138 = ms->hashTable;
              uVar20 = (ulong)local_138[(long)local_128];
              iVar24 = uVar35 + 9;
              unique0x00004780 = (ulong *)(pBVar46 + 3);
              puVar58 = (ulong *)((long)puVar42 + 4);
              local_180 = (ulong *)((long)puVar42 + 0xc);
              pZVar62 = ms;
              do {
                uVar29 = (int)local_148 - 1;
                if (pBVar46 != (BYTE *)0x3) {
                  uVar29 = *(uint *)((long)&local_148 + (long)pBVar46 * 4);
                }
                pBVar28 = (BYTE *)0x0;
                if (((uVar29 - 1 < uVar35 - UVar18) && (uVar36 <= uVar35 - uVar29)) &&
                   ((uint)*puVar42 == *(uint *)((long)puVar42 - (ulong)uVar29))) {
                  puVar33 = (ulong *)((long)puVar58 - (ulong)uVar29);
                  puVar22 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar39 = *puVar58 ^ *puVar33;
                    uVar21 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                    iVar41 = (int)uVar21;
                    puVar22 = local_180;
                    if (*puVar33 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        if (puVar1 <= puVar22) goto LAB_0070084a;
                        uVar39 = *puVar33;
                        uVar38 = *puVar22;
                        uVar43 = 0;
                        if ((uVar38 ^ uVar39) != 0) {
                          for (; ((uVar38 ^ uVar39) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        puVar51 = (ulong *)((uVar43 >> 3 & 0x1fffffff) + (long)puVar22);
                        puVar22 = puVar22 + 1;
                        if (uVar39 != uVar38) {
                          uVar21 = (long)puVar51 - (long)puVar58;
                          puVar22 = puVar51;
                        }
                        iVar41 = (int)uVar21;
                      } while (uVar39 == uVar38);
                    }
                  }
                  else {
LAB_0070084a:
                    if ((puVar22 < local_188) && ((uint)*puVar33 == (uint)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar33 = (ulong *)((long)puVar33 + 4);
                    }
                    if ((puVar22 < puVar2) && ((short)*puVar33 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar33 = (ulong *)((long)puVar33 + 2);
                    }
                    if (puVar22 < puVar37) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar22))
                      ;
                    }
                    iVar41 = (int)puVar22 - (int)puVar58;
                  }
                  pBVar28 = (BYTE *)(ulong)(iVar41 + 4);
                }
                uVar29 = (uint)pBVar28;
                bVar32 = true;
                if (local_208 < pBVar28) {
                  pZVar8[uVar56].off = (int)local_1b0 + (int)pBVar46;
                  uVar61 = uVar56 + 1;
                  pZVar8[uVar56].len = uVar29;
                  bVar64 = (ulong *)((long)puVar42 + (long)pBVar28) != puVar37;
                  bVar32 = bVar64 && uVar29 <= uVar48;
                  pZVar62 = (ZSTD_matchState_t *)((ulong)pZVar62 & 0xffffffff);
                  local_208 = pBVar28;
                  uVar56 = uVar61;
                  if (!bVar64 || uVar29 > uVar48) {
                    pZVar62 = (ZSTD_matchState_t *)(ulong)uVar61;
                  }
                }
                uVar29 = (uint)pZVar62;
                if (!bVar32) break;
                pBVar46 = pBVar46 + 1;
                bVar63 = pBVar46 < unique0x00004780;
              } while (bVar63);
              if (!bVar63) {
                local_138[(long)local_128] = uVar35;
                local_1a8 = (ulong *)(ulong)(uVar35 + 2);
                local_1f8 = (BYTE *)0x0;
                pBVar46 = (BYTE *)0x0;
                uVar21 = (ulong)uVar56;
                do {
                  uVar29 = (uint)uVar21;
                  bVar63 = iVar30 == 0;
                  iVar30 = iVar30 + -1;
                  if ((bVar63) || (uVar48 = (uint)uVar20, uVar48 < uVar36 + (uVar36 == 0))) break;
                  pBVar28 = local_1f8;
                  if (pBVar46 < local_1f8) {
                    pBVar28 = pBVar46;
                  }
                  puVar58 = (ulong *)((long)puVar42 + (long)pBVar28);
                  puVar22 = (ulong *)((long)local_170 + (long)(pBVar28 + uVar20));
                  puVar33 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar38 = *puVar58 ^ *puVar22;
                    uVar39 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    pBVar31 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                    if (*puVar22 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        puVar22 = puVar22 + 1;
                        if (puVar1 <= puVar33) goto LAB_007009f4;
                        uVar38 = *puVar33 ^ *puVar22;
                        uVar39 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        pBVar31 = (BYTE *)((long)puVar33 +
                                          ((uVar39 >> 3 & 0x1fffffff) - (long)puVar58));
                      } while (*puVar22 == *puVar33);
                    }
                  }
                  else {
LAB_007009f4:
                    if ((puVar33 < local_188) && ((uint)*puVar22 == (uint)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar22 = (ulong *)((long)puVar22 + 4);
                    }
                    if ((puVar33 < puVar2) && ((short)*puVar22 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar22 = (ulong *)((long)puVar22 + 2);
                    }
                    if (puVar33 < puVar37) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar31 = (BYTE *)((long)puVar33 - (long)puVar58);
                  }
                  pBVar31 = pBVar31 + (long)pBVar28;
                  if (local_208 < pBVar31) {
                    iVar41 = uVar48 + (U32)pBVar31;
                    if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                      iVar41 = iVar24;
                    }
                    pZVar8[uVar21].off = (int)local_1a8 - uVar48;
                    pZVar8[uVar21].len = (U32)pBVar31;
                    uVar21 = (ulong)(uVar29 + 1);
                    iVar24 = iVar41;
                    local_208 = pBVar31;
                    if ((pBVar31 < (BYTE *)0x1001) &&
                       ((ulong *)((long)puVar42 + (long)pBVar31) != puVar37)) goto LAB_00700aaa;
LAB_00700b37:
                    bVar63 = false;
                  }
                  else {
LAB_00700aaa:
                    puVar58 = (ulong *)((long)local_198 + (ulong)((uVar48 & uVar50) * 2) * 4);
                    if (*(byte *)((long)puVar42 + (long)pBVar31) <=
                        *(byte *)((long)local_170 + (long)(pBVar31 + uVar20))) {
                      *(uint *)local_160 = uVar48;
                      local_1f8 = pBVar31;
                      local_160 = (ZSTD_optimal_t *)puVar58;
                      if (uVar45 < uVar48) goto LAB_00700b0b;
                      local_160 = (ZSTD_optimal_t *)local_1c4;
                      goto LAB_00700b37;
                    }
                    *(uint *)local_1b8 = uVar48;
                    pBVar46 = pBVar31;
                    if (uVar45 < uVar48) {
                      puVar58 = (ulong *)((long)puVar58 + 4);
                      local_1b8 = puVar58;
LAB_00700b0b:
                      uVar20 = (ulong)(uint)*puVar58;
                      bVar63 = true;
                    }
                    else {
                      bVar63 = false;
                      local_1b8 = (ulong *)local_1c4;
                    }
                  }
                  uVar29 = (uint)uVar21;
                } while (bVar63);
LAB_007010a4:
                *(uint *)local_160 = 0;
                puVar58 = local_1b8;
                goto LAB_007010b8;
              }
            }
            else if (UVar18 == 3) {
              uVar20 = (ulong)((uint)local_168 == 0);
              uVar48 = (ms->cParams).targetLength;
              if (0xffe < uVar48) {
                uVar48 = 0xfff;
              }
              local_178 = (ms->window).base;
              uVar45 = iVar25 - (int)local_178;
              uVar56 = 0;
              local_180 = (ulong *)(ulong)((uint)*puVar42 * -0x61c8864f >>
                                          (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar29 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar24 = uVar45 - uVar29;
              if (uVar45 < uVar29) {
                iVar24 = 0;
              }
              local_160 = (ZSTD_optimal_t *)CONCAT44(local_160._4_4_,iVar24);
              uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar18 = (ms->window).lowLimit;
              UVar17 = uVar45 - uVar35;
              if (uVar45 - UVar18 <= uVar35) {
                UVar17 = UVar18;
              }
              local_1b8 = (ulong *)ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                UVar17 = UVar18;
              }
              local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,UVar17 + (UVar17 == 0));
              local_170._4_4_ = (undefined4)((ulong)local_170 >> 0x20);
              local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar29);
              uVar21 = (ulong)((uVar29 & uVar45) * 2);
              local_1d0 = (ulong *)((long)local_1b8 + uVar21 * 4);
              local_1b0 = (uint *)((long)local_1b8 + (uVar21 + 1) * 4);
              UVar18 = (ms->window).dictLimit;
              iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              register0x00000010 = (ulong *)-uVar20;
              bVar63 = true;
              local_128 = ms->hashTable;
              local_198 = (ulong *)(ulong)ms->hashTable[(long)local_180];
              iVar30 = uVar45 + 9;
              uVar21 = uVar20 + 3;
              puVar58 = (ulong *)((long)puVar42 + 3);
              local_1f8 = local_120;
              pZVar62 = ms;
              do {
                uVar29 = (int)local_148 - 1;
                if (uVar20 != 3) {
                  uVar29 = *(uint *)((long)&local_148 + uVar20 * 4);
                }
                pBVar46 = (BYTE *)0x0;
                if (((uVar29 - 1 < uVar45 - UVar18) && (UVar17 <= uVar45 - uVar29)) &&
                   (((*(uint *)((long)puVar42 - (ulong)uVar29) ^ (uint)*puVar42) & 0xffffff) == 0))
                {
                  puVar33 = (ulong *)((long)puVar58 - (ulong)uVar29);
                  puVar22 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar38 = *puVar58 ^ *puVar33;
                    uVar39 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    uVar39 = uVar39 >> 3 & 0x1fffffff;
                    iVar41 = (int)uVar39;
                    puVar22 = (ulong *)((long)puVar42 + 0xb);
                    if (*puVar33 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        if (puVar1 <= puVar22) goto LAB_006ffffb;
                        uVar38 = *puVar33;
                        uVar43 = *puVar22;
                        uVar10 = 0;
                        if ((uVar43 ^ uVar38) != 0) {
                          for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                          }
                        }
                        puVar51 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar22);
                        puVar22 = puVar22 + 1;
                        if (uVar38 != uVar43) {
                          uVar39 = (long)puVar51 - (long)puVar58;
                          puVar22 = puVar51;
                        }
                        iVar41 = (int)uVar39;
                      } while (uVar38 == uVar43);
                    }
                  }
                  else {
LAB_006ffffb:
                    if ((puVar22 < local_188) && ((uint)*puVar33 == (uint)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar33 = (ulong *)((long)puVar33 + 4);
                    }
                    if ((puVar22 < puVar2) && ((short)*puVar33 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar33 = (ulong *)((long)puVar33 + 2);
                    }
                    if (puVar22 < puVar37) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar22))
                      ;
                    }
                    iVar41 = (int)puVar22 - (int)puVar58;
                  }
                  pBVar46 = (BYTE *)(ulong)(iVar41 + 3);
                }
                uVar29 = (uint)pBVar46;
                bVar32 = true;
                if (local_1f8 < pBVar46) {
                  pZVar8[uVar56].off = (int)register0x00000010 + (int)uVar20;
                  uVar35 = uVar56 + 1;
                  pZVar8[uVar56].len = uVar29;
                  bVar64 = (ulong *)((long)puVar42 + (long)pBVar46) != puVar37;
                  bVar32 = bVar64 && uVar29 <= uVar48;
                  pZVar62 = (ZSTD_matchState_t *)((ulong)pZVar62 & 0xffffffff);
                  local_1f8 = pBVar46;
                  uVar56 = uVar35;
                  if (!bVar64 || uVar29 > uVar48) {
                    pZVar62 = (ZSTD_matchState_t *)(ulong)uVar35;
                  }
                }
                uVar29 = (uint)pZVar62;
                if (!bVar32) break;
                uVar20 = uVar20 + 1;
                bVar63 = uVar20 < uVar21;
              } while (bVar63);
              if (!bVar63) {
                if (local_1f8 < (BYTE *)0x3) {
                  UVar18 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_94,(BYTE *)puVar42);
                  bVar63 = true;
                  if (((uint)local_1a8 <= UVar18) && (uVar45 - UVar18 < 0x40000)) {
                    puVar22 = (ulong *)(local_178 + UVar18);
                    puVar58 = puVar42;
                    if (puVar42 < puVar1) {
                      uVar21 = *puVar42 ^ *puVar22;
                      uVar20 = 0;
                      if (uVar21 != 0) {
                        for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      pBVar46 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
                      if (*puVar22 == *puVar42) {
                        do {
                          puVar58 = puVar58 + 1;
                          puVar22 = puVar22 + 1;
                          if (puVar1 <= puVar58) goto LAB_00703643;
                          uVar21 = *puVar58 ^ *puVar22;
                          uVar20 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                            }
                          }
                          pBVar46 = (BYTE *)((long)puVar58 +
                                            ((uVar20 >> 3 & 0x1fffffff) - (long)puVar42));
                        } while (*puVar22 == *puVar58);
                      }
                    }
                    else {
LAB_00703643:
                      if ((puVar58 < local_188) && ((uint)*puVar22 == (uint)*puVar58)) {
                        puVar58 = (ulong *)((long)puVar58 + 4);
                        puVar22 = (ulong *)((long)puVar22 + 4);
                      }
                      if ((puVar58 < puVar2) && ((short)*puVar22 == (short)*puVar58)) {
                        puVar58 = (ulong *)((long)puVar58 + 2);
                        puVar22 = (ulong *)((long)puVar22 + 2);
                      }
                      if (puVar58 < puVar37) {
                        puVar58 = (ulong *)((long)puVar58 +
                                           (ulong)((BYTE)*puVar22 == (BYTE)*puVar58));
                      }
                      pBVar46 = (BYTE *)((long)puVar58 - (long)puVar42);
                    }
                    if (&DAT_00000002 < pBVar46) {
                      pZVar8->off = (uVar45 - UVar18) + 2;
                      pZVar8->len = (U32)pBVar46;
                      local_1f8 = pBVar46;
                      if (((BYTE *)(ulong)uVar48 < pBVar46) ||
                         (uVar56 = 1, (ulong *)((long)puVar42 + (long)pBVar46) == puVar37)) {
                        ms->nextToUpdate = uVar45 + 1;
                        uVar56 = 1;
                        bVar63 = false;
                        uVar29 = 1;
                      }
                    }
                  }
                  if (!bVar63) goto LAB_007010cc;
                }
                local_128[(long)local_180] = uVar45;
                uVar20 = (ulong)uVar56;
                pBVar46 = (BYTE *)0x0;
                pBVar28 = (BYTE *)0x0;
                puVar58 = local_198;
                do {
                  uVar29 = (uint)uVar20;
                  bVar63 = iVar24 == 0;
                  iVar24 = iVar24 + -1;
                  if (bVar63) break;
                  uVar48 = (uint)puVar58;
                  if (uVar48 < (uint)local_1a8) break;
                  pBVar31 = pBVar46;
                  if (pBVar28 < pBVar46) {
                    pBVar31 = pBVar28;
                  }
                  puVar22 = (ulong *)((long)puVar42 + (long)pBVar31);
                  puVar33 = (ulong *)(local_178 + (long)(pBVar31 + ((ulong)puVar58 & 0xffffffff)));
                  puVar51 = puVar22;
                  if (puVar22 < puVar1) {
                    uVar39 = *puVar22 ^ *puVar33;
                    uVar21 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar54 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                    if (*puVar33 == *puVar22) {
                      do {
                        puVar51 = puVar51 + 1;
                        puVar33 = puVar33 + 1;
                        if (puVar1 <= puVar51) goto LAB_007037c6;
                        uVar39 = *puVar51 ^ *puVar33;
                        uVar21 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        pBVar54 = (BYTE *)((long)puVar51 +
                                          ((uVar21 >> 3 & 0x1fffffff) - (long)puVar22));
                      } while (*puVar33 == *puVar51);
                    }
                  }
                  else {
LAB_007037c6:
                    if ((puVar51 < local_188) && ((uint)*puVar33 == (uint)*puVar51)) {
                      puVar51 = (ulong *)((long)puVar51 + 4);
                      puVar33 = (ulong *)((long)puVar33 + 4);
                    }
                    if ((puVar51 < puVar2) && ((short)*puVar33 == (short)*puVar51)) {
                      puVar51 = (ulong *)((long)puVar51 + 2);
                      puVar33 = (ulong *)((long)puVar33 + 2);
                    }
                    if (puVar51 < puVar37) {
                      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar51))
                      ;
                    }
                    pBVar54 = (BYTE *)((long)puVar51 - (long)puVar22);
                  }
                  pBVar54 = pBVar54 + (long)pBVar31;
                  iVar41 = iVar30;
                  if (local_1f8 < pBVar54) {
                    iVar41 = (U32)pBVar54 + uVar48;
                    if (pBVar54 <= (BYTE *)(ulong)(iVar30 - uVar48)) {
                      iVar41 = iVar30;
                    }
                    pZVar8[uVar20].off = (uVar45 + 2) - uVar48;
                    pZVar8[uVar20].len = (U32)pBVar54;
                    uVar20 = (ulong)(uVar29 + 1);
                    bVar63 = false;
                    iVar30 = iVar41;
                    local_1f8 = pBVar54;
                    if (pBVar54 < (BYTE *)0x1001) {
                      if ((ulong *)((long)puVar42 + (long)pBVar54) != puVar37) goto LAB_0070388d;
LAB_00703917:
                      bVar63 = false;
                      iVar30 = iVar41;
                    }
                  }
                  else {
LAB_0070388d:
                    puVar40 = (uint *)((long)local_1b8 + (ulong)((uVar48 & (uint)local_170) * 2) * 4
                                      );
                    iVar30 = iVar41;
                    if (local_178[(long)(pBVar54 + ((ulong)puVar58 & 0xffffffff))] <
                        *(byte *)((long)puVar42 + (long)pBVar54)) {
                      *(uint *)local_1d0 = uVar48;
                      pBVar28 = pBVar54;
                      if (uVar48 <= (uint)local_160) {
                        bVar63 = false;
                        local_1d0 = (ulong *)local_1c4;
                        goto LAB_00703929;
                      }
                      puVar40 = puVar40 + 1;
                      local_1d0 = (ulong *)puVar40;
                    }
                    else {
                      *local_1b0 = uVar48;
                      pBVar46 = pBVar54;
                      local_1b0 = puVar40;
                      if (uVar48 <= (uint)local_160) {
                        local_1b0 = (uint *)local_1c4;
                        goto LAB_00703917;
                      }
                    }
                    puVar58 = (ulong *)(ulong)*puVar40;
                    bVar63 = true;
                  }
LAB_00703929:
                  uVar29 = (uint)uVar20;
                } while (bVar63);
                *local_1b0 = 0;
                *(uint *)local_1d0 = 0;
                ms->nextToUpdate = iVar30 - 8;
              }
            }
            else {
              pBVar46 = (BYTE *)(ulong)((uint)local_168 == 0);
              uVar48 = (ms->cParams).targetLength;
              if (0xffe < uVar48) {
                uVar48 = 0xfff;
              }
              local_170 = (ulong *)(ms->window).base;
              uVar35 = iVar25 - (int)local_170;
              local_1a8 = (ulong *)(ulong)uVar35;
              local_128 = (U32 *)(ulong)((uint)*puVar42 * -0x61c8864f >>
                                        (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar50 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar45 = uVar35 - uVar50;
              uVar56 = 0;
              if (uVar35 < uVar50) {
                uVar45 = 0;
              }
              uVar61 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar29 = (ms->window).lowLimit;
              uVar36 = uVar35 - uVar61;
              if (uVar35 - uVar29 <= uVar61) {
                uVar36 = uVar29;
              }
              local_198 = (ulong *)ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar36 = uVar29;
              }
              local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar36);
              uVar20 = (ulong)((uVar50 & uVar35) * 2);
              local_1b8 = (ulong *)((long)local_198 + uVar20 * 4);
              local_160 = (ZSTD_optimal_t *)((long)local_198 + uVar20 * 4 + 4);
              UVar18 = (ms->window).dictLimit;
              iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_1b0 = (uint *)-(long)pBVar46;
              bVar63 = true;
              local_138 = ms->hashTable;
              uVar20 = (ulong)local_138[(long)local_128];
              iVar24 = uVar35 + 9;
              unique0x00004780 = (ulong *)(pBVar46 + 3);
              puVar58 = (ulong *)((long)puVar42 + 4);
              local_180 = (ulong *)((long)puVar42 + 0xc);
              pZVar62 = ms;
              do {
                uVar29 = (int)local_148 - 1;
                if (pBVar46 != (BYTE *)0x3) {
                  uVar29 = *(uint *)((long)&local_148 + (long)pBVar46 * 4);
                }
                pBVar28 = (BYTE *)0x0;
                if (((uVar29 - 1 < uVar35 - UVar18) && (uVar36 <= uVar35 - uVar29)) &&
                   ((uint)*puVar42 == *(uint *)((long)puVar42 - (ulong)uVar29))) {
                  puVar33 = (ulong *)((long)puVar58 - (ulong)uVar29);
                  puVar22 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar39 = *puVar58 ^ *puVar33;
                    uVar21 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                    iVar41 = (int)uVar21;
                    puVar22 = local_180;
                    if (*puVar33 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        if (puVar1 <= puVar22) goto LAB_00700d86;
                        uVar39 = *puVar33;
                        uVar38 = *puVar22;
                        uVar43 = 0;
                        if ((uVar38 ^ uVar39) != 0) {
                          for (; ((uVar38 ^ uVar39) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        puVar51 = (ulong *)((uVar43 >> 3 & 0x1fffffff) + (long)puVar22);
                        puVar22 = puVar22 + 1;
                        if (uVar39 != uVar38) {
                          uVar21 = (long)puVar51 - (long)puVar58;
                          puVar22 = puVar51;
                        }
                        iVar41 = (int)uVar21;
                      } while (uVar39 == uVar38);
                    }
                  }
                  else {
LAB_00700d86:
                    if ((puVar22 < local_188) && ((uint)*puVar33 == (uint)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar33 = (ulong *)((long)puVar33 + 4);
                    }
                    if ((puVar22 < puVar2) && ((short)*puVar33 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar33 = (ulong *)((long)puVar33 + 2);
                    }
                    if (puVar22 < puVar37) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar22))
                      ;
                    }
                    iVar41 = (int)puVar22 - (int)puVar58;
                  }
                  pBVar28 = (BYTE *)(ulong)(iVar41 + 4);
                }
                uVar29 = (uint)pBVar28;
                bVar32 = true;
                if (local_208 < pBVar28) {
                  pZVar8[uVar56].off = (int)local_1b0 + (int)pBVar46;
                  uVar61 = uVar56 + 1;
                  pZVar8[uVar56].len = uVar29;
                  bVar64 = (ulong *)((long)puVar42 + (long)pBVar28) != puVar37;
                  bVar32 = bVar64 && uVar29 <= uVar48;
                  pZVar62 = (ZSTD_matchState_t *)((ulong)pZVar62 & 0xffffffff);
                  local_208 = pBVar28;
                  uVar56 = uVar61;
                  if (!bVar64 || uVar29 > uVar48) {
                    pZVar62 = (ZSTD_matchState_t *)(ulong)uVar61;
                  }
                }
                uVar29 = (uint)pZVar62;
                if (!bVar32) break;
                pBVar46 = pBVar46 + 1;
                bVar63 = pBVar46 < unique0x00004780;
              } while (bVar63);
              if (!bVar63) {
                local_138[(long)local_128] = uVar35;
                local_1a8 = (ulong *)(ulong)(uVar35 + 2);
                local_1f8 = (BYTE *)0x0;
                pBVar46 = (BYTE *)0x0;
                uVar21 = (ulong)uVar56;
                do {
                  uVar29 = (uint)uVar21;
                  bVar63 = iVar30 == 0;
                  iVar30 = iVar30 + -1;
                  if ((bVar63) || (uVar48 = (uint)uVar20, uVar48 < uVar36 + (uVar36 == 0))) break;
                  pBVar28 = local_1f8;
                  if (pBVar46 < local_1f8) {
                    pBVar28 = pBVar46;
                  }
                  puVar58 = (ulong *)((long)puVar42 + (long)pBVar28);
                  puVar22 = (ulong *)((long)local_170 + (long)(pBVar28 + uVar20));
                  puVar33 = puVar58;
                  if (puVar58 < puVar1) {
                    uVar38 = *puVar58 ^ *puVar22;
                    uVar39 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    pBVar31 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                    if (*puVar22 == *puVar58) {
                      do {
                        puVar33 = puVar33 + 1;
                        puVar22 = puVar22 + 1;
                        if (puVar1 <= puVar33) goto LAB_00700f30;
                        uVar38 = *puVar33 ^ *puVar22;
                        uVar39 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        pBVar31 = (BYTE *)((long)puVar33 +
                                          ((uVar39 >> 3 & 0x1fffffff) - (long)puVar58));
                      } while (*puVar22 == *puVar33);
                    }
                  }
                  else {
LAB_00700f30:
                    if ((puVar33 < local_188) && ((uint)*puVar22 == (uint)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar22 = (ulong *)((long)puVar22 + 4);
                    }
                    if ((puVar33 < puVar2) && ((short)*puVar22 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar22 = (ulong *)((long)puVar22 + 2);
                    }
                    if (puVar33 < puVar37) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar31 = (BYTE *)((long)puVar33 - (long)puVar58);
                  }
                  pBVar31 = pBVar31 + (long)pBVar28;
                  if (local_208 < pBVar31) {
                    iVar41 = uVar48 + (U32)pBVar31;
                    if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                      iVar41 = iVar24;
                    }
                    pZVar8[uVar21].off = (int)local_1a8 - uVar48;
                    pZVar8[uVar21].len = (U32)pBVar31;
                    uVar21 = (ulong)(uVar29 + 1);
                    iVar24 = iVar41;
                    local_208 = pBVar31;
                    if ((pBVar31 < (BYTE *)0x1001) &&
                       ((ulong *)((long)puVar42 + (long)pBVar31) != puVar37)) goto LAB_00700fe6;
LAB_00701073:
                    bVar63 = false;
                  }
                  else {
LAB_00700fe6:
                    puVar58 = (ulong *)((long)local_198 + (ulong)((uVar48 & uVar50) * 2) * 4);
                    if (*(byte *)((long)puVar42 + (long)pBVar31) <=
                        *(byte *)((long)local_170 + (long)(pBVar31 + uVar20))) {
                      *(uint *)local_160 = uVar48;
                      local_1f8 = pBVar31;
                      local_160 = (ZSTD_optimal_t *)puVar58;
                      if (uVar45 < uVar48) goto LAB_00701047;
                      local_160 = (ZSTD_optimal_t *)local_1c4;
                      goto LAB_00701073;
                    }
                    *(uint *)local_1b8 = uVar48;
                    pBVar46 = pBVar31;
                    if (uVar45 < uVar48) {
                      puVar58 = (ulong *)((long)puVar58 + 4);
                      local_1b8 = puVar58;
LAB_00701047:
                      uVar20 = (ulong)(uint)*puVar58;
                      bVar63 = true;
                    }
                    else {
                      bVar63 = false;
                      local_1b8 = (ulong *)local_1c4;
                    }
                  }
                  uVar29 = (uint)uVar21;
                } while (bVar63);
                goto LAB_007010a4;
              }
            }
          }
LAB_007010cc:
          local_1c4._0_4_ = uVar29;
          ZSTD_optLdm_processMatchCandidate
                    (&local_68,pZVar8,(U32 *)local_1c4,iVar25 - (int)local_b0,(int)puVar37 - iVar25)
          ;
          pZVar49 = local_f0;
          uVar14 = local_1c4._0_4_;
          if (local_1c4._0_4_ == 0) {
            puVar42 = (ulong *)((long)puVar42 + 1);
            uVar20 = 0;
            iVar25 = 2;
          }
          else {
            local_e0[2] = local_140;
            *(ulong *)local_e0 = local_148;
            local_f0->mlen = 0;
            local_f0->litlen = (U32)local_168;
            UVar18 = ZSTD_litLengthPrice((U32)local_168,local_110,2);
            pZVar49->price = UVar18;
            uVar48 = pZVar8[uVar14 - 1].len;
            if ((uint)local_158 < uVar48) {
              local_b8 = (void *)(ulong)pZVar8[uVar14 - 1].off;
              uVar29 = uVar48 + (int)local_168;
              local_150 = (ZSTD_optimal_t *)0x0;
              iVar25 = 7;
              local_190 = (void *)(ulong)uVar48;
              local_d0 = (ZSTD_optimal_t *)((ulong)local_168 & 0xffffffff);
            }
            else {
              UVar17 = ZSTD_litLengthPrice(0,local_110,2);
              puVar58 = (ulong *)&DAT_00000001;
              pZVar26 = local_a0;
              do {
                pZVar26->price = 0x40000000;
                puVar58 = (ulong *)((long)puVar58 + 1);
                pZVar26 = pZVar26 + 1;
              } while (local_c0 != puVar58);
              uVar20 = 0;
              do {
                uVar48 = pZVar8[uVar20].len;
                if ((uint)puVar58 <= uVar48) {
                  UVar19 = pZVar8[uVar20].off;
                  uVar56 = UVar19 + 1;
                  uVar29 = 0x1f;
                  if (uVar56 != 0) {
                    for (; uVar56 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                    }
                  }
                  ZVar6 = (ms->opt).priceType;
                  uVar56 = (uint)puVar58 * 0x100 - 0x200;
                  do {
                    UVar57 = (U32)puVar58;
                    if (ZVar6 == zop_predef) {
                      iVar25 = 0x1f;
                      if (UVar57 - 2 != 0) {
                        for (; UVar57 - 2 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                        }
                      }
                      iVar25 = (iVar25 + uVar29) * 0x100 + (uVar56 >> ((byte)iVar25 & 0x1f)) +
                               0x1000;
                    }
                    else {
                      uVar35 = UVar57 - 3;
                      uVar45 = (ms->opt).offCodeFreq[uVar29] + 1;
                      iVar25 = 0x1f;
                      if (uVar45 != 0) {
                        for (; uVar45 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                        }
                      }
                      if (uVar35 < 0x80) {
                        uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
                      }
                      else {
                        uVar50 = 0x1f;
                        if (uVar35 != 0) {
                          for (; uVar35 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                          }
                        }
                        uVar35 = (uVar50 ^ 0xffffffe0) + 0x44;
                      }
                      uVar50 = (ms->opt).matchLengthFreq[uVar35] + 1;
                      iVar24 = 0x1f;
                      if (uVar50 != 0) {
                        for (; uVar50 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                        }
                      }
                      iVar25 = ((ML_bits[uVar35] + uVar29) - (iVar25 + iVar24)) * 0x100 +
                               (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice)
                               - ((uVar45 * 0x100 >> ((byte)iVar25 & 0x1f)) +
                                 (uVar50 * 0x100 >> ((byte)iVar24 & 0x1f)))) + 0x33;
                      pZVar49 = local_f0;
                    }
                    uVar21 = (ulong)puVar58 & 0xffffffff;
                    pZVar49[uVar21].mlen = UVar57;
                    pZVar49[uVar21].off = UVar19;
                    pZVar49[uVar21].litlen = (U32)local_168;
                    pZVar49[uVar21].price = iVar25 + UVar17 + UVar18;
                    puVar58 = (ulong *)(ulong)(UVar57 + 1);
                    uVar56 = uVar56 + 0x100;
                  } while (UVar57 + 1 <= uVar48);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar14 + (uint)(uVar14 == 0));
              uVar29 = (int)puVar58 - 1;
              iVar25 = 0;
            }
            uVar20 = (ulong)uVar29;
          }
          if (iVar25 == 7) {
LAB_007031be:
            uVar20 = (ulong)local_150 & 0xffffffff;
            pUVar47 = pZVar49[uVar20].rep;
            uVar48 = (uint)local_b8;
            if ((U32)local_190 == 0) {
              local_140 = pZVar49[uVar20].rep[2];
              local_148 = *(ulong *)pUVar47;
            }
            else {
              if (uVar48 < 3) {
                uVar29 = ((U32)local_d0 == 0) + uVar48;
                if (uVar29 == 0) {
                  uVar21 = *(ulong *)pUVar47;
                  uVar39 = uVar21 >> 0x20;
                  pUVar23 = pZVar49[uVar20].rep + 2;
                  goto LAB_00703239;
                }
                if (uVar29 == 3) {
                  uVar56 = *pUVar47 - 1;
                }
                else {
                  uVar56 = pUVar47[uVar29];
                }
                pUVar23 = pUVar47 + (ulong)(uVar29 == 1) + 1;
                uVar39 = (ulong)*pUVar47;
              }
              else {
                uVar39 = (ulong)*pUVar47;
                pUVar23 = pZVar49[uVar20].rep + 1;
                uVar21 = (ulong)(uVar48 - 2);
LAB_00703239:
                uVar56 = (uint)uVar21;
              }
              local_140 = *pUVar23;
              local_148 = (ulong)uVar56 | uVar39 << 0x20;
            }
            uVar29 = (int)local_150 + 1;
            local_168 = (ZSTD_optimal_t *)(ulong)uVar29;
            pZVar49[(long)local_168].price = local_a4;
            pZVar49[(long)local_168].off = uVar48;
            pZVar49[(long)local_168].mlen = (U32)local_190;
            pZVar49[(long)local_168].litlen = (U32)local_d0;
            *(undefined8 *)pZVar49[(long)local_168].rep = local_90;
            pZVar49[(long)local_168].rep[2] = local_88;
            uVar20 = (ulong)local_150 & 0xffffffff;
            puVar16 = (undefined1 *)((ulong)local_150 & 0xffffffff);
            puVar34 = (undefined1 *)local_168;
            if ((int)local_150 != 0) {
              do {
                puVar34 = puVar16;
                uVar48 = (uint)uVar20;
                uVar56 = pZVar49[uVar20].litlen + pZVar49[uVar20].mlen;
                pZVar26 = pZVar49 + uVar20;
                iVar25 = pZVar26->price;
                UVar17 = pZVar26->off;
                UVar19 = pZVar26->mlen;
                UVar57 = pZVar26->litlen;
                pZVar26 = pZVar49 + uVar20;
                UVar18 = pZVar26->rep[0];
                uVar12 = *(undefined8 *)(&pZVar26->litlen + 2);
                pZVar13 = pZVar49 + (long)puVar34;
                pZVar13->litlen = pZVar26->litlen;
                pZVar13->rep[0] = UVar18;
                *(undefined8 *)(&pZVar13->litlen + 2) = uVar12;
                pZVar26 = pZVar49 + (long)puVar34;
                pZVar26->price = iVar25;
                pZVar26->off = UVar17;
                pZVar26->mlen = UVar19;
                pZVar26->litlen = UVar57;
                uVar20 = (ulong)(uVar48 - uVar56);
                if (uVar56 > uVar48) {
                  uVar20 = 0;
                }
                puVar16 = (undefined1 *)(ulong)((int)puVar34 - 1);
              } while (uVar56 <= uVar48 && uVar48 - uVar56 != 0);
            }
            pZVar26 = local_c8;
            if ((uint)puVar34 <= uVar29) {
              do {
                UVar18 = pZVar49[(long)puVar34].mlen;
                uVar48 = pZVar49[(long)puVar34].litlen;
                uVar20 = (ulong)uVar48;
                if (UVar18 == 0) {
                  puVar42 = (ulong *)(uVar20 + (long)pZVar26);
                }
                else {
                  UVar17 = pZVar49[(long)puVar34].off;
                  ZSTD_updateStats(local_110,uVar48,(BYTE *)pZVar26,UVar17,UVar18);
                  puVar42 = (ulong *)((long)pZVar26 + uVar20);
                  puVar58 = (ulong *)local_118->lit;
                  if (local_130 < puVar42) {
                    puVar22 = puVar58;
                    puVar33 = (ulong *)pZVar26;
                    if (pZVar26 <= local_130) {
                      puVar22 = (ulong *)((long)puVar58 + ((long)local_130 - (long)pZVar26));
                      uVar21 = *(ulong *)((long)pZVar26 + 8);
                      *puVar58 = *(ulong *)pZVar26;
                      puVar58[1] = uVar21;
                      puVar33 = local_130;
                      if (0x10 < (long)local_130 - (long)pZVar26) {
                        lVar44 = 0x10;
                        do {
                          uVar12 = ((undefined8 *)((long)pZVar26 + lVar44))[1];
                          puVar4 = (undefined8 *)((long)puVar58 + lVar44);
                          *puVar4 = *(undefined8 *)((long)pZVar26 + lVar44);
                          puVar4[1] = uVar12;
                          puVar5 = (undefined8 *)((long)pZVar26 + lVar44 + 0x10);
                          uVar12 = puVar5[1];
                          puVar4[2] = *puVar5;
                          puVar4[3] = uVar12;
                          lVar44 = lVar44 + 0x20;
                        } while (puVar4 + 4 < puVar22);
                      }
                    }
                    if (puVar33 < puVar42) {
                      lVar44 = 0;
                      do {
                        *(BYTE *)((long)puVar22 + lVar44) = *(BYTE *)((long)puVar33 + lVar44);
                        lVar44 = lVar44 + 1;
                      } while ((long)puVar42 - (long)puVar33 != lVar44);
                    }
                  }
                  else {
                    uVar21 = *(ulong *)((long)pZVar26 + 8);
                    *puVar58 = *(ulong *)pZVar26;
                    puVar58[1] = uVar21;
                    if (0x10 < uVar48) {
                      pBVar46 = local_118->lit;
                      uVar21 = *(ulong *)((long)pZVar26 + 0x18);
                      *(ulong *)(pBVar46 + 0x10) = *(ulong *)((long)pZVar26 + 0x10);
                      *(ulong *)(pBVar46 + 0x18) = uVar21;
                      if (0x20 < uVar48) {
                        lVar44 = 0;
                        do {
                          puVar4 = (undefined8 *)((long)pZVar26 + lVar44 + 0x20);
                          uVar12 = puVar4[1];
                          pBVar28 = pBVar46 + lVar44 + 0x20;
                          *(undefined8 *)pBVar28 = *puVar4;
                          *(undefined8 *)(pBVar28 + 8) = uVar12;
                          puVar4 = (undefined8 *)((long)pZVar26 + lVar44 + 0x30);
                          uVar12 = puVar4[1];
                          *(undefined8 *)(pBVar28 + 0x10) = *puVar4;
                          *(undefined8 *)(pBVar28 + 0x18) = uVar12;
                          lVar44 = lVar44 + 0x20;
                        } while (pBVar28 + 0x20 < pBVar46 + uVar20);
                      }
                    }
                  }
                  local_118->lit = local_118->lit + uVar20;
                  if (0xffff < uVar48) {
                    local_118->longLengthType = ZSTD_llt_literalLength;
                    local_118->longLengthPos =
                         (U32)((ulong)((long)local_118->sequences - (long)local_118->sequencesStart)
                              >> 3);
                  }
                  psVar9 = local_118->sequences;
                  psVar9->litLength = (U16)uVar48;
                  psVar9->offset = UVar17 + 1;
                  if (0xffff < UVar18 - 3) {
                    local_118->longLengthType = ZSTD_llt_matchLength;
                    local_118->longLengthPos =
                         (U32)((ulong)((long)psVar9 - (long)local_118->sequencesStart) >> 3);
                  }
                  psVar9->matchLength = (U16)(UVar18 - 3);
                  local_118->sequences = psVar9 + 1;
                  puVar42 = (ulong *)((long)pZVar26 + (ulong)(UVar18 + uVar48));
                  pZVar26 = (ZSTD_optimal_t *)puVar42;
                }
                uVar48 = (int)puVar34 + 1;
                puVar34 = (undefined1 *)(ulong)uVar48;
              } while (uVar48 <= (uint)local_168);
            }
            local_c8 = pZVar26;
            ZSTD_setBasePrices(local_110,2);
          }
          else if (iVar25 == 0) {
            if ((int)uVar20 != 0) {
              local_168 = (ZSTD_optimal_t *)&DAT_00000001;
              do {
                poVar15 = local_110;
                uVar48 = (int)local_168 - 1;
                pZVar26 = pZVar49 + uVar48;
                UVar18 = 1;
                if (pZVar49[uVar48].mlen == 0) {
                  UVar18 = pZVar26->litlen + 1;
                }
                puVar58 = (ulong *)((long)puVar42 + (long)local_168);
                iVar25 = 0x800;
                if (((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) &&
                   (iVar25 = 0x600, (ms->opt).priceType != zop_predef)) {
                  uVar48 = (ms->opt).litFreq[*(byte *)((long)puVar58 + -1)] + 1;
                  iVar25 = 0x1f;
                  if (uVar48 != 0) {
                    for (; uVar48 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                    }
                  }
                  iVar25 = (ms->opt).litSumBasePrice -
                           (iVar25 * 0x100 + (uVar48 * 0x100 >> ((byte)iVar25 & 0x1f)));
                }
                iVar24 = pZVar26->price;
                local_150 = local_168;
                UVar17 = ZSTD_litLengthPrice(UVar18,local_110,2);
                UVar19 = ZSTD_litLengthPrice(UVar18 - 1,poVar15,2);
                iVar25 = (UVar17 + iVar25 + iVar24) - UVar19;
                pZVar49 = local_f0 + (long)local_168;
                if (iVar25 <= local_f0[(long)local_168].price) {
                  pZVar49->off = 0;
                  pZVar49->mlen = 0;
                  pZVar49->litlen = UVar18;
                  pZVar49->price = iVar25;
                }
                if (pZVar49->mlen == 0) {
                  pZVar49->rep[2] = pZVar26->rep[2];
                  *(undefined8 *)pZVar49->rep = *(undefined8 *)pZVar26->rep;
                }
                else {
                  uVar29 = (int)local_150 - pZVar49->mlen;
                  pUVar47 = local_f0[uVar29].rep;
                  uVar48 = pZVar49->off;
                  if (uVar48 < 3) {
                    uVar48 = uVar48 + (pZVar49->litlen == 0);
                    if (uVar48 == 0) {
                      uVar21 = *(ulong *)pUVar47;
                      uVar39 = uVar21 >> 0x20;
                      pUVar23 = local_f0[uVar29].rep + 2;
                    }
                    else {
                      if (uVar48 == 3) {
                        uVar29 = *pUVar47 - 1;
                      }
                      else {
                        uVar29 = pUVar47[uVar48];
                      }
                      uVar21 = (ulong)uVar29;
                      pUVar23 = pUVar47 + (ulong)(uVar48 == 1) + 1;
                      uVar39 = (ulong)*pUVar47;
                    }
                  }
                  else {
                    uVar39 = (ulong)*pUVar47;
                    pUVar23 = local_f0[uVar29].rep + 1;
                    uVar21 = (ulong)(uVar48 - 2);
                  }
                  UVar18 = *pUVar23;
                  *(ulong *)pZVar49->rep = uVar21 & 0xffffffff | uVar39 << 0x20;
                  pZVar49->rep[2] = UVar18;
                }
                uVar48 = 0x13;
                if ((puVar58 <= local_1a0) && (uVar48 = 0x11, (int)local_150 != (int)uVar20)) {
                  UVar18 = pZVar49->mlen;
                  local_208 = (BYTE *)0x0;
                  if (UVar18 == 0) {
                    local_208 = (BYTE *)(ulong)pZVar49->litlen;
                  }
                  local_128 = (U32 *)CONCAT44(local_128._4_4_,pZVar49->price);
                  UVar17 = ZSTD_litLengthPrice(0,local_110,2);
                  local_168 = (ZSTD_optimal_t *)CONCAT44(local_168._4_4_,UVar17);
                  pBVar46 = (ms->window).base;
                  uVar48 = ms->nextToUpdate;
                  uVar21 = (ulong)uVar48;
                  iVar25 = (int)puVar58;
                  uVar29 = 0;
                  if (pBVar46 + uVar21 <= puVar58) {
                    stack0xfffffffffffffe40 = (ulong *)CONCAT44(uStack_1bc,UVar18);
                    UVar18 = (ms->cParams).minMatch;
                    uVar56 = iVar25 - (int)pBVar46;
                    while (uVar48 < uVar56) {
                      UVar17 = ZSTD_insertBt1(ms,pBVar46 + uVar21,(BYTE *)puVar37,UVar18,0);
                      uVar48 = (int)uVar21 + UVar17;
                      uVar21 = (ulong)uVar48;
                      uVar29 = uVar56;
                    }
                    ms->nextToUpdate = uVar56;
                    local_1a8._4_4_ = (uint)((ulong)local_1a8 >> 0x20);
                    local_198._4_4_ = (undefined4)((ulong)local_198 >> 0x20);
                    local_178._4_4_ = (undefined4)((ulong)local_178 >> 0x20);
                    local_1b0._4_4_ = (undefined4)((ulong)local_1b0 >> 0x20);
                    local_170._4_4_ = (undefined4)((ulong)local_170 >> 0x20);
                    local_138._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
                    unique0x10009067 = (ulong *)local_120;
                    if (UVar18 - 6 < 2) {
                      bVar63 = local_1c4._4_4_ != 0;
                      puVar22 = (ulong *)(ulong)bVar63;
                      uVar48 = (ms->cParams).targetLength;
                      if (0xffe < uVar48) {
                        uVar48 = 0xfff;
                      }
                      local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar48);
                      local_160 = (ZSTD_optimal_t *)(ms->window).base;
                      uVar56 = iVar25 - (int)local_160;
                      local_108 = (ulong *)(*puVar58 * -0x30e4432340650000 >>
                                           (-(char)(ms->cParams).hashLog & 0x3fU));
                      uVar45 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                      iVar24 = uVar56 - uVar45;
                      local_1a8 = (ulong *)((ulong)local_1a8._4_4_ << 0x20);
                      if (uVar56 < uVar45) {
                        iVar24 = 0;
                      }
                      local_198 = (ulong *)CONCAT44(local_198._4_4_,iVar24);
                      local_180 = (ulong *)ms->chainTable;
                      uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                      UVar18 = (ms->window).lowLimit;
                      UVar17 = uVar56 - uVar35;
                      if (uVar56 - UVar18 <= uVar35) {
                        UVar17 = UVar18;
                      }
                      if (ms->loadedDictEnd != 0) {
                        UVar17 = UVar18;
                      }
                      local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,UVar17);
                      local_170 = (ulong *)CONCAT44(local_170._4_4_,UVar17 + (UVar17 == 0));
                      uVar21 = (ulong)((uVar45 & uVar56) * 2);
                      local_1d8 = (ulong *)((long)local_180 + uVar21 * 4);
                      local_1b8 = (ulong *)((long)local_180 + uVar21 * 4 + 4);
                      iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                      uVar35 = uVar56 - (ms->window).dictLimit;
                      bVar32 = true;
                      local_d8 = ms->hashTable;
                      uVar21 = (ulong)local_d8[(long)local_108];
                      iVar24 = uVar56 + 9;
                      local_100 = (ulong *)((long)puVar22 + 3);
                      puVar33 = (ulong *)((long)puVar58 + 4);
                      local_e8 = (ulong *)((long)puVar58 + 0xc);
                      local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar35);
                      do {
                        if (puVar22 == (ulong *)0x3) {
                          uVar50 = pZVar49->rep[0] - 1;
                        }
                        else {
                          uVar50 = pZVar49->rep[(long)puVar22];
                        }
                        pBVar46 = (BYTE *)0x0;
                        if (((uVar50 - 1 < uVar35) && (UVar17 <= uVar56 - uVar50)) &&
                           ((uint)*puVar58 == *(uint *)((long)puVar58 - (ulong)uVar50))) {
                          puVar52 = (ulong *)((long)puVar33 - (ulong)uVar50);
                          puVar51 = puVar33;
                          if (puVar33 < puVar1) {
                            uVar38 = *puVar33 ^ *puVar52;
                            uVar39 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                              }
                            }
                            uVar39 = uVar39 >> 3 & 0x1fffffff;
                            iVar41 = (int)uVar39;
                            puVar51 = local_e8;
                            if (*puVar52 == *puVar33) {
                              do {
                                puVar52 = puVar52 + 1;
                                if (puVar1 <= puVar51) goto LAB_00701caf;
                                uVar38 = *puVar52;
                                uVar43 = *puVar51;
                                uVar10 = 0;
                                if ((uVar43 ^ uVar38) != 0) {
                                  for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1
                                      ) {
                                  }
                                }
                                puVar53 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar51);
                                puVar51 = puVar51 + 1;
                                if (uVar38 != uVar43) {
                                  uVar39 = (long)puVar53 - (long)puVar33;
                                  puVar51 = puVar53;
                                }
                                iVar41 = (int)uVar39;
                              } while (uVar38 == uVar43);
                            }
                          }
                          else {
LAB_00701caf:
                            if ((puVar51 < local_188) && ((uint)*puVar52 == (uint)*puVar51)) {
                              puVar51 = (ulong *)((long)puVar51 + 4);
                              puVar52 = (ulong *)((long)puVar52 + 4);
                            }
                            if ((puVar51 < puVar2) && ((short)*puVar52 == (short)*puVar51)) {
                              puVar51 = (ulong *)((long)puVar51 + 2);
                              puVar52 = (ulong *)((long)puVar52 + 2);
                            }
                            if (puVar51 < puVar37) {
                              puVar51 = (ulong *)((long)puVar51 +
                                                 (ulong)((BYTE)*puVar52 == (BYTE)*puVar51));
                            }
                            iVar41 = (int)puVar51 - (int)puVar33;
                          }
                          pBVar46 = (BYTE *)(ulong)(iVar41 + 4);
                        }
                        uVar50 = (uint)pBVar46;
                        bVar64 = true;
                        if (stack0xfffffffffffffe40 < pBVar46) {
                          pZVar8[(ulong)local_1a8 & 0xffffffff].off = (int)puVar22 - (uint)bVar63;
                          uVar36 = (uint)local_1a8 + 1;
                          pZVar8[(ulong)local_1a8 & 0xffffffff].len = uVar50;
                          bVar65 = (ulong *)((long)puVar58 + (long)pBVar46) != puVar37;
                          bVar64 = bVar65 && uVar50 <= uVar48;
                          local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar36);
                          unique0x10008bd7 = (ulong *)pBVar46;
                          if (!bVar65 || uVar50 > uVar48) {
                            uVar29 = uVar36;
                          }
                        }
                        if (!bVar64) break;
                        puVar22 = (ulong *)((long)puVar22 + 1);
                        bVar32 = puVar22 < local_100;
                      } while (bVar32);
                      if (!bVar32) {
                        local_d8[(long)local_108] = uVar56;
                        local_1f8 = (BYTE *)0x0;
                        pBVar46 = (BYTE *)0x0;
                        do {
                          bVar63 = iVar30 == 0;
                          iVar30 = iVar30 + -1;
                          if (bVar63) break;
                          uVar48 = (uint)uVar21;
                          if (uVar48 < (uint)local_170) break;
                          pBVar28 = local_1f8;
                          if (pBVar46 < local_1f8) {
                            pBVar28 = pBVar46;
                          }
                          puVar22 = (ulong *)((long)puVar58 + (long)pBVar28);
                          puVar33 = (ulong *)((long)local_160 + (long)(pBVar28 + uVar21));
                          puVar51 = puVar22;
                          if (puVar22 < puVar1) {
                            uVar38 = *puVar22 ^ *puVar33;
                            uVar39 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                              }
                            }
                            pBVar31 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                            if (*puVar33 == *puVar22) {
                              do {
                                puVar51 = puVar51 + 1;
                                puVar33 = puVar33 + 1;
                                if (puVar1 <= puVar51) goto LAB_00701e6f;
                                uVar38 = *puVar51 ^ *puVar33;
                                uVar39 = 0;
                                if (uVar38 != 0) {
                                  for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                  }
                                }
                                pBVar31 = (BYTE *)((long)puVar51 +
                                                  ((uVar39 >> 3 & 0x1fffffff) - (long)puVar22));
                              } while (*puVar33 == *puVar51);
                            }
                          }
                          else {
LAB_00701e6f:
                            if ((puVar51 < local_188) && ((uint)*puVar33 == (uint)*puVar51)) {
                              puVar51 = (ulong *)((long)puVar51 + 4);
                              puVar33 = (ulong *)((long)puVar33 + 4);
                            }
                            if ((puVar51 < puVar2) && ((short)*puVar33 == (short)*puVar51)) {
                              puVar51 = (ulong *)((long)puVar51 + 2);
                              puVar33 = (ulong *)((long)puVar33 + 2);
                            }
                            if (puVar51 < puVar37) {
                              puVar51 = (ulong *)((long)puVar51 +
                                                 (ulong)((BYTE)*puVar33 == (BYTE)*puVar51));
                            }
                            pBVar31 = (BYTE *)((long)puVar51 - (long)puVar22);
                          }
                          pBVar31 = pBVar31 + (long)pBVar28;
                          if (stack0xfffffffffffffe40 < pBVar31) {
                            iVar41 = uVar48 + (U32)pBVar31;
                            if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                              iVar41 = iVar24;
                            }
                            pZVar8[(ulong)local_1a8 & 0xffffffff].off = (uVar56 + 2) - uVar48;
                            pZVar8[(ulong)local_1a8 & 0xffffffff].len = (U32)pBVar31;
                            local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,(uint)local_1a8 + 1);
                            bVar63 = false;
                            iVar24 = iVar41;
                            unique0x10008b57 = (ulong *)pBVar31;
                            if ((pBVar31 < (BYTE *)0x1001) &&
                               ((ulong *)((long)puVar58 + (long)pBVar31) != puVar37))
                            goto LAB_00701f2d;
                          }
                          else {
LAB_00701f2d:
                            puVar22 = (ulong *)((long)local_180 + (ulong)((uVar48 & uVar45) * 2) * 4
                                               );
                            if (*(byte *)((long)local_160 + (long)(pBVar31 + uVar21)) <
                                *(byte *)((long)puVar58 + (long)pBVar31)) {
                              *(uint *)local_1d8 = uVar48;
                              pBVar46 = pBVar31;
                              if ((uint)local_198 < uVar48) {
                                puVar22 = (ulong *)((long)puVar22 + 4);
                                local_1d8 = puVar22;
LAB_00701f92:
                                uVar21 = (ulong)(uint)*puVar22;
                                bVar63 = true;
                              }
                              else {
                                bVar63 = false;
                                local_1d8 = (ulong *)local_1c4;
                              }
                            }
                            else {
                              *(uint *)local_1b8 = uVar48;
                              local_1f8 = pBVar31;
                              local_1b8 = puVar22;
                              if ((uint)local_198 < uVar48) goto LAB_00701f92;
                              bVar63 = false;
                              local_1b8 = (ulong *)local_1c4;
                            }
                          }
                        } while (bVar63);
                        *(uint *)local_1b8 = 0;
                        *(uint *)local_1d8 = 0;
                        ms->nextToUpdate = iVar24 - 8;
                        uVar29 = (uint)local_1a8;
                      }
                    }
                    else {
                      local_1b8._4_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
                      local_180._4_4_ = (undefined4)((ulong)local_180 >> 0x20);
                      local_e8._4_4_ = (undefined4)((ulong)local_e8 >> 0x20);
                      if (UVar18 == 5) {
                        pBVar46 = (BYTE *)(ulong)(local_1c4._4_4_ != 0);
                        uVar48 = (ms->cParams).targetLength;
                        if (0xffe < uVar48) {
                          uVar48 = 0xfff;
                        }
                        pBVar28 = (ms->window).base;
                        uVar56 = iVar25 - (int)pBVar28;
                        local_1b0 = (uint *)(ulong)uVar56;
                        local_d8 = (U32 *)(*puVar58 * -0x30e4432345000000 >>
                                          (-(char)(ms->cParams).hashLog & 0x3fU));
                        uVar45 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        iVar24 = uVar56 - uVar45;
                        local_1a8 = (ulong *)((ulong)local_1a8._4_4_ << 0x20);
                        if (uVar56 < uVar45) {
                          iVar24 = 0;
                        }
                        local_138 = (U32 *)CONCAT44(local_138._4_4_,iVar24);
                        local_100 = (ulong *)ms->chainTable;
                        uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                        UVar18 = (ms->window).lowLimit;
                        UVar17 = uVar56 - uVar35;
                        if (uVar56 - UVar18 <= uVar35) {
                          UVar17 = UVar18;
                        }
                        if (ms->loadedDictEnd != 0) {
                          UVar17 = UVar18;
                        }
                        local_170 = (ulong *)CONCAT44(local_170._4_4_,UVar17);
                        local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,UVar17 + (UVar17 == 0));
                        local_180 = (ulong *)CONCAT44(local_180._4_4_,uVar45);
                        uVar21 = (ulong)((uVar45 & uVar56) * 2);
                        local_198 = (ulong *)((long)local_100 + uVar21 * 4);
                        local_1e0 = (ulong *)((long)local_100 + uVar21 * 4 + 4);
                        iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        uVar45 = uVar56 - (ms->window).dictLimit;
                        local_160 = (ZSTD_optimal_t *)-(long)pBVar46;
                        bVar63 = true;
                        local_80 = ms->hashTable;
                        uVar21 = (ulong)local_80[(long)local_d8];
                        iVar24 = uVar56 + 9;
                        local_178 = pBVar46 + 3;
                        puVar22 = (ulong *)((long)puVar58 + 4);
                        local_108 = (ulong *)((long)puVar58 + 0xc);
                        local_e8 = (ulong *)CONCAT44(local_e8._4_4_,uVar45);
                        do {
                          if (pBVar46 == (BYTE *)0x3) {
                            uVar35 = pZVar49->rep[0] - 1;
                          }
                          else {
                            uVar35 = pZVar49->rep[(long)pBVar46];
                          }
                          pBVar31 = (BYTE *)0x0;
                          if (((uVar35 - 1 < uVar45) && (UVar17 <= uVar56 - uVar35)) &&
                             ((uint)*puVar58 == *(uint *)((long)puVar58 - (ulong)uVar35))) {
                            puVar51 = (ulong *)((long)puVar22 - (ulong)uVar35);
                            puVar33 = puVar22;
                            if (puVar22 < puVar1) {
                              uVar38 = *puVar22 ^ *puVar51;
                              uVar39 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                }
                              }
                              uVar39 = uVar39 >> 3 & 0x1fffffff;
                              iVar41 = (int)uVar39;
                              puVar33 = local_108;
                              if (*puVar51 == *puVar22) {
                                do {
                                  puVar51 = puVar51 + 1;
                                  if (puVar1 <= puVar33) goto LAB_0070220d;
                                  uVar38 = *puVar51;
                                  uVar43 = *puVar33;
                                  uVar10 = 0;
                                  if ((uVar43 ^ uVar38) != 0) {
                                    for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0;
                                        uVar10 = uVar10 + 1) {
                                    }
                                  }
                                  puVar52 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar33);
                                  puVar33 = puVar33 + 1;
                                  if (uVar38 != uVar43) {
                                    uVar39 = (long)puVar52 - (long)puVar22;
                                    puVar33 = puVar52;
                                  }
                                  iVar41 = (int)uVar39;
                                } while (uVar38 == uVar43);
                              }
                            }
                            else {
LAB_0070220d:
                              if ((puVar33 < local_188) && ((uint)*puVar51 == (uint)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 4);
                                puVar51 = (ulong *)((long)puVar51 + 4);
                              }
                              if ((puVar33 < puVar2) && ((short)*puVar51 == (short)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 2);
                                puVar51 = (ulong *)((long)puVar51 + 2);
                              }
                              if (puVar33 < puVar37) {
                                puVar33 = (ulong *)((long)puVar33 +
                                                   (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                              }
                              iVar41 = (int)puVar33 - (int)puVar22;
                            }
                            pBVar31 = (BYTE *)(ulong)(iVar41 + 4);
                          }
                          uVar35 = (uint)pBVar31;
                          bVar32 = true;
                          if (stack0xfffffffffffffe40 < pBVar31) {
                            pZVar8[(ulong)local_1a8 & 0xffffffff].off =
                                 (int)pBVar46 + (int)local_160;
                            uVar50 = (uint)local_1a8 + 1;
                            pZVar8[(ulong)local_1a8 & 0xffffffff].len = uVar35;
                            bVar64 = (ulong *)((long)puVar58 + (long)pBVar31) != puVar37;
                            bVar32 = bVar64 && uVar35 <= uVar48;
                            local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar50);
                            unique0x10008bb7 = (ulong *)pBVar31;
                            if (!bVar64 || uVar35 > uVar48) {
                              uVar29 = uVar50;
                            }
                          }
                          if (!bVar32) break;
                          pBVar46 = pBVar46 + 1;
                          bVar63 = pBVar46 < local_178;
                        } while (bVar63);
                        if (!bVar63) {
                          local_80[(long)local_d8] = uVar56;
                          local_1b0 = (uint *)(ulong)(uVar56 + 2);
                          local_1f8 = (BYTE *)0x0;
                          pBVar46 = (BYTE *)0x0;
                          do {
                            bVar63 = iVar30 == 0;
                            iVar30 = iVar30 + -1;
                            if (bVar63) break;
                            uVar48 = (uint)uVar21;
                            if (uVar48 < (uint)local_1b8) break;
                            pBVar31 = local_1f8;
                            if (pBVar46 < local_1f8) {
                              pBVar31 = pBVar46;
                            }
                            puVar22 = (ulong *)((long)puVar58 + (long)pBVar31);
                            puVar33 = (ulong *)(pBVar28 + (long)(pBVar31 + uVar21));
                            puVar51 = puVar22;
                            if (puVar22 < puVar1) {
                              uVar38 = *puVar22 ^ *puVar33;
                              uVar39 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                              if (*puVar33 == *puVar22) {
                                do {
                                  puVar51 = puVar51 + 1;
                                  puVar33 = puVar33 + 1;
                                  if (puVar1 <= puVar51) goto LAB_007023c1;
                                  uVar38 = *puVar51 ^ *puVar33;
                                  uVar39 = 0;
                                  if (uVar38 != 0) {
                                    for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                    }
                                  }
                                  pBVar54 = (BYTE *)((long)puVar51 +
                                                    ((uVar39 >> 3 & 0x1fffffff) - (long)puVar22));
                                } while (*puVar33 == *puVar51);
                              }
                            }
                            else {
LAB_007023c1:
                              if ((puVar51 < local_188) && ((uint)*puVar33 == (uint)*puVar51)) {
                                puVar51 = (ulong *)((long)puVar51 + 4);
                                puVar33 = (ulong *)((long)puVar33 + 4);
                              }
                              if ((puVar51 < puVar2) && ((short)*puVar33 == (short)*puVar51)) {
                                puVar51 = (ulong *)((long)puVar51 + 2);
                                puVar33 = (ulong *)((long)puVar33 + 2);
                              }
                              if (puVar51 < puVar37) {
                                puVar51 = (ulong *)((long)puVar51 +
                                                   (ulong)((BYTE)*puVar33 == (BYTE)*puVar51));
                              }
                              pBVar54 = (BYTE *)((long)puVar51 - (long)puVar22);
                            }
                            pBVar54 = pBVar54 + (long)pBVar31;
                            if (stack0xfffffffffffffe40 < pBVar54) {
                              iVar41 = uVar48 + (U32)pBVar54;
                              if (pBVar54 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                                iVar41 = iVar24;
                              }
                              pZVar8[(ulong)local_1a8 & 0xffffffff].off = (int)local_1b0 - uVar48;
                              pZVar8[(ulong)local_1a8 & 0xffffffff].len = (U32)pBVar54;
                              local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,(uint)local_1a8 + 1);
                              bVar63 = false;
                              iVar24 = iVar41;
                              unique0x10008b27 = (ulong *)pBVar54;
                              if ((pBVar54 < (BYTE *)0x1001) &&
                                 ((ulong *)((long)puVar58 + (long)pBVar54) != puVar37))
                              goto LAB_0070247e;
                            }
                            else {
LAB_0070247e:
                              puVar22 = (ulong *)((long)local_100 +
                                                 (ulong)((uVar48 & (uint)local_180) * 2) * 4);
                              if (pBVar28[(long)(pBVar54 + uVar21)] <
                                  *(byte *)((long)puVar58 + (long)pBVar54)) {
                                *(uint *)local_198 = uVar48;
                                pBVar46 = pBVar54;
                                if ((uint)local_138 < uVar48) {
                                  puVar22 = (ulong *)((long)puVar22 + 4);
                                  local_198 = puVar22;
LAB_007024e6:
                                  uVar21 = (ulong)(uint)*puVar22;
                                  bVar63 = true;
                                }
                                else {
                                  bVar63 = false;
                                  local_198 = (ulong *)local_1c4;
                                }
                              }
                              else {
                                *(uint *)local_1e0 = uVar48;
                                local_1f8 = pBVar54;
                                local_1e0 = puVar22;
                                if ((uint)local_138 < uVar48) goto LAB_007024e6;
                                bVar63 = false;
                                local_1e0 = (ulong *)local_1c4;
                              }
                            }
                          } while (bVar63);
LAB_00702aa2:
                          *(uint *)local_1e0 = 0;
                          *(uint *)local_198 = 0;
                          ms->nextToUpdate = iVar24 - 8;
                          uVar29 = (uint)local_1a8;
                        }
                      }
                      else if (UVar18 == 3) {
                        uVar21 = (ulong)(local_1c4._4_4_ != 0);
                        uVar48 = (ms->cParams).targetLength;
                        if (0xffe < uVar48) {
                          uVar48 = 0xfff;
                        }
                        local_1b8 = (ulong *)(ms->window).base;
                        uVar56 = iVar25 - (int)local_1b8;
                        local_108 = (ulong *)(ulong)((uint)*puVar58 * -0x61c8864f >>
                                                    (-(char)(ms->cParams).hashLog & 0x1fU));
                        uVar45 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        iVar24 = uVar56 - uVar45;
                        local_1a8 = (ulong *)((ulong)local_1a8._4_4_ << 0x20);
                        if (uVar56 < uVar45) {
                          iVar24 = 0;
                        }
                        local_180 = (ulong *)CONCAT44(local_180._4_4_,iVar24);
                        local_138 = ms->chainTable;
                        uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                        uVar35 = (ms->window).lowLimit;
                        uVar50 = uVar56 - uVar36;
                        if (uVar56 - uVar35 <= uVar36) {
                          uVar50 = uVar35;
                        }
                        if (ms->loadedDictEnd != 0) {
                          uVar50 = uVar35;
                        }
                        local_160._4_4_ = (undefined4)((ulong)local_160 >> 0x20);
                        local_160 = (ZSTD_optimal_t *)
                                    CONCAT44(local_160._4_4_,uVar50 + (uVar50 == 0));
                        local_198 = (ulong *)CONCAT44(local_198._4_4_,uVar45);
                        uVar39 = (ulong)((uVar45 & uVar56) * 2);
                        local_1e0 = (ulong *)(local_138 + uVar39);
                        local_1d8 = (ulong *)(local_138 + uVar39 + 1);
                        local_178 = (BYTE *)CONCAT44(local_178._4_4_,
                                                     1 << ((byte)(ms->cParams).searchLog & 0x1f));
                        UVar18 = (ms->window).dictLimit;
                        local_170 = (ulong *)-uVar21;
                        bVar63 = true;
                        local_d8 = ms->hashTable;
                        local_e8 = (ulong *)(ulong)local_d8[(long)local_108];
                        local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,uVar56 + 9);
                        uVar39 = uVar21 + 3;
                        puVar22 = (ulong *)((long)puVar58 + 3);
                        local_100 = (ulong *)((long)puVar58 + 0xb);
                        do {
                          if (uVar21 == 3) {
                            UVar17 = pZVar49->rep[0] - 1;
                          }
                          else {
                            UVar17 = pZVar49->rep[uVar21];
                          }
                          pBVar46 = (BYTE *)0x0;
                          if (((UVar17 - 1 < uVar56 - UVar18) && (uVar50 <= uVar56 - UVar17)) &&
                             (((*(uint *)((long)puVar58 - (ulong)UVar17) ^ (uint)*puVar58) &
                              0xffffff) == 0)) {
                            puVar51 = (ulong *)((long)puVar22 - (ulong)UVar17);
                            puVar33 = puVar22;
                            if (puVar22 < puVar1) {
                              uVar43 = *puVar22 ^ *puVar51;
                              uVar38 = 0;
                              if (uVar43 != 0) {
                                for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                                }
                              }
                              uVar38 = uVar38 >> 3 & 0x1fffffff;
                              iVar24 = (int)uVar38;
                              puVar33 = local_100;
                              if (*puVar51 == *puVar22) {
                                do {
                                  puVar51 = puVar51 + 1;
                                  if (puVar1 <= puVar33) goto LAB_007018cd;
                                  uVar43 = *puVar51;
                                  uVar10 = *puVar33;
                                  uVar11 = 0;
                                  if ((uVar10 ^ uVar43) != 0) {
                                    for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0;
                                        uVar11 = uVar11 + 1) {
                                    }
                                  }
                                  puVar52 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar33);
                                  puVar33 = puVar33 + 1;
                                  if (uVar43 != uVar10) {
                                    uVar38 = (long)puVar52 - (long)puVar22;
                                    puVar33 = puVar52;
                                  }
                                  iVar24 = (int)uVar38;
                                } while (uVar43 == uVar10);
                              }
                            }
                            else {
LAB_007018cd:
                              if ((puVar33 < local_188) && ((uint)*puVar51 == (uint)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 4);
                                puVar51 = (ulong *)((long)puVar51 + 4);
                              }
                              if ((puVar33 < puVar2) && ((short)*puVar51 == (short)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 2);
                                puVar51 = (ulong *)((long)puVar51 + 2);
                              }
                              if (puVar33 < puVar37) {
                                puVar33 = (ulong *)((long)puVar33 +
                                                   (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                              }
                              iVar24 = (int)puVar33 - (int)puVar22;
                            }
                            pBVar46 = (BYTE *)(ulong)(iVar24 + 3);
                          }
                          uVar45 = (uint)pBVar46;
                          bVar32 = true;
                          if (stack0xfffffffffffffe40 < pBVar46) {
                            pZVar8[(ulong)local_1a8 & 0xffffffff].off = (int)local_170 + (int)uVar21
                            ;
                            uVar35 = (uint)local_1a8 + 1;
                            pZVar8[(ulong)local_1a8 & 0xffffffff].len = uVar45;
                            bVar64 = (ulong *)((long)puVar58 + (long)pBVar46) != puVar37;
                            bVar32 = bVar64 && uVar45 <= uVar48;
                            local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar35);
                            unique0x10008b8f = (ulong *)pBVar46;
                            if (!bVar64 || uVar45 > uVar48) {
                              uVar29 = uVar35;
                            }
                          }
                          if (!bVar32) break;
                          uVar21 = uVar21 + 1;
                          bVar63 = uVar21 < uVar39;
                        } while (bVar63);
                        if (!bVar63) {
                          if (stack0xfffffffffffffe40 < (BYTE *)0x3) {
                            UVar18 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_94,(BYTE *)puVar58)
                            ;
                            bVar63 = true;
                            if ((UVar18 < (uint)local_160) || (0x3ffff < uVar56 - UVar18)) {
LAB_00702b85:
                              uVar48 = (uint)local_1a8;
                            }
                            else {
                              puVar33 = (ulong *)((ulong)UVar18 + (long)local_1b8);
                              puVar22 = puVar58;
                              if (puVar58 < puVar1) {
                                uVar39 = *puVar58 ^ *puVar33;
                                uVar21 = 0;
                                if (uVar39 != 0) {
                                  for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                  }
                                }
                                pBVar46 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                                if (*puVar33 == *puVar58) {
                                  do {
                                    puVar22 = puVar22 + 1;
                                    puVar33 = puVar33 + 1;
                                    if (puVar1 <= puVar22) goto LAB_00702ae5;
                                    uVar39 = *puVar22 ^ *puVar33;
                                    uVar21 = 0;
                                    if (uVar39 != 0) {
                                      for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                      }
                                    }
                                    pBVar46 = (BYTE *)((long)puVar22 +
                                                      ((uVar21 >> 3 & 0x1fffffff) - (long)puVar58));
                                  } while (*puVar33 == *puVar22);
                                }
                              }
                              else {
LAB_00702ae5:
                                if ((puVar22 < local_188) && ((uint)*puVar33 == (uint)*puVar22)) {
                                  puVar22 = (ulong *)((long)puVar22 + 4);
                                  puVar33 = (ulong *)((long)puVar33 + 4);
                                }
                                if ((puVar22 < puVar2) && ((short)*puVar33 == (short)*puVar22)) {
                                  puVar22 = (ulong *)((long)puVar22 + 2);
                                  puVar33 = (ulong *)((long)puVar33 + 2);
                                }
                                if (puVar22 < puVar37) {
                                  puVar22 = (ulong *)((long)puVar22 +
                                                     (ulong)((BYTE)*puVar33 == (BYTE)*puVar22));
                                }
                                pBVar46 = (BYTE *)((long)puVar22 - (long)puVar58);
                              }
                              if (pBVar46 < (BYTE *)0x3) goto LAB_00702b85;
                              pZVar8->off = (uVar56 - UVar18) + 2;
                              pZVar8->len = (U32)pBVar46;
                              unique0x1000905f = (ulong *)pBVar46;
                              if (((BYTE *)(ulong)uVar48 < pBVar46) ||
                                 (uVar48 = 1, (ulong *)((long)puVar58 + (long)pBVar46) == puVar37))
                              {
                                ms->nextToUpdate = uVar56 + 1;
                                bVar63 = false;
                                uVar29 = 1;
                                uVar48 = 1;
                              }
                            }
                            if (!bVar63) goto LAB_00702e27;
                          }
                          else {
                            uVar48 = (uint)local_1a8;
                          }
                          local_d8[(long)local_108] = uVar56;
                          pBVar28 = (BYTE *)0x0;
                          pBVar46 = (BYTE *)0x0;
                          puVar22 = local_e8;
                          do {
                            iVar24 = (int)local_1b0;
                            if ((uint)local_178 == 0) break;
                            uVar29 = (uint)puVar22;
                            if (uVar29 < (uint)local_160) break;
                            local_178 = (BYTE *)CONCAT44(local_178._4_4_,(uint)local_178 + -1);
                            pBVar31 = pBVar28;
                            if (pBVar46 < pBVar28) {
                              pBVar31 = pBVar46;
                            }
                            puVar33 = (ulong *)((long)puVar58 + (long)pBVar31);
                            puVar51 = (ulong *)((long)local_1b8 +
                                               (long)(pBVar31 + ((ulong)puVar22 & 0xffffffff)));
                            puVar52 = puVar33;
                            if (puVar33 < puVar1) {
                              uVar39 = *puVar33 ^ *puVar51;
                              uVar21 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                              if (*puVar51 == *puVar33) {
                                do {
                                  puVar52 = puVar52 + 1;
                                  puVar51 = puVar51 + 1;
                                  if (puVar1 <= puVar52) goto LAB_00702c7d;
                                  uVar39 = *puVar52 ^ *puVar51;
                                  uVar21 = 0;
                                  if (uVar39 != 0) {
                                    for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                    }
                                  }
                                  pBVar54 = (BYTE *)((long)puVar52 +
                                                    ((uVar21 >> 3 & 0x1fffffff) - (long)puVar33));
                                } while (*puVar51 == *puVar52);
                              }
                            }
                            else {
LAB_00702c7d:
                              if ((puVar52 < local_188) && ((uint)*puVar51 == (uint)*puVar52)) {
                                puVar52 = (ulong *)((long)puVar52 + 4);
                                puVar51 = (ulong *)((long)puVar51 + 4);
                              }
                              if ((puVar52 < puVar2) && ((short)*puVar51 == (short)*puVar52)) {
                                puVar52 = (ulong *)((long)puVar52 + 2);
                                puVar51 = (ulong *)((long)puVar51 + 2);
                              }
                              if (puVar52 < puVar37) {
                                puVar52 = (ulong *)((long)puVar52 +
                                                   (ulong)((BYTE)*puVar51 == (BYTE)*puVar52));
                              }
                              pBVar54 = (BYTE *)((long)puVar52 - (long)puVar33);
                            }
                            pBVar54 = pBVar54 + (long)pBVar31;
                            if (stack0xfffffffffffffe40 < pBVar54) {
                              iVar24 = uVar29 + (U32)pBVar54;
                              if (pBVar54 <= (BYTE *)(ulong)((int)local_1b0 - uVar29)) {
                                iVar24 = (int)local_1b0;
                              }
                              pZVar8[uVar48].off = (uVar56 + 2) - uVar29;
                              pZVar8[uVar48].len = (U32)pBVar54;
                              uVar48 = uVar48 + 1;
                              bVar63 = false;
                              unique0x10008ac7 = (ulong *)pBVar54;
                              if ((pBVar54 < (BYTE *)0x1001) &&
                                 ((ulong *)((long)puVar58 + (long)pBVar54) != puVar37))
                              goto LAB_00702d55;
                            }
                            else {
LAB_00702d55:
                              puVar40 = local_138 + (uVar29 & (uint)local_198) * 2;
                              if (*(byte *)((long)local_1b8 +
                                           (long)(pBVar54 + ((ulong)puVar22 & 0xffffffff))) <
                                  *(byte *)((long)puVar58 + (long)pBVar54)) {
                                *(uint *)local_1e0 = uVar29;
                                pBVar46 = pBVar54;
                                if ((uint)local_180 < uVar29) {
                                  puVar40 = puVar40 + 1;
                                  pBVar54 = pBVar28;
                                  local_1e0 = (ulong *)puVar40;
LAB_00702db6:
                                  puVar22 = (ulong *)(ulong)*puVar40;
                                  bVar63 = true;
                                  pBVar28 = pBVar54;
                                }
                                else {
                                  bVar63 = false;
                                  local_1e0 = (ulong *)local_1c4;
                                }
                              }
                              else {
                                *(uint *)local_1d8 = uVar29;
                                local_1d8 = (ulong *)puVar40;
                                if ((uint)local_180 < uVar29) goto LAB_00702db6;
                                bVar63 = false;
                                local_1d8 = (ulong *)local_1c4;
                                pBVar28 = pBVar54;
                              }
                            }
                            local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,iVar24);
                          } while (bVar63);
                          *(uint *)local_1d8 = 0;
                          *(uint *)local_1e0 = 0;
                          ms->nextToUpdate = iVar24 - 8;
                          uVar29 = uVar48;
                        }
                      }
                      else {
                        pBVar46 = (BYTE *)(ulong)(local_1c4._4_4_ != 0);
                        uVar48 = (ms->cParams).targetLength;
                        if (0xffe < uVar48) {
                          uVar48 = 0xfff;
                        }
                        pBVar28 = (ms->window).base;
                        uVar56 = iVar25 - (int)pBVar28;
                        local_1b0 = (uint *)(ulong)uVar56;
                        local_d8 = (U32 *)(ulong)((uint)*puVar58 * -0x61c8864f >>
                                                 (-(char)(ms->cParams).hashLog & 0x1fU));
                        uVar45 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        iVar24 = uVar56 - uVar45;
                        local_1a8 = (ulong *)((ulong)local_1a8._4_4_ << 0x20);
                        if (uVar56 < uVar45) {
                          iVar24 = 0;
                        }
                        local_138 = (U32 *)CONCAT44(local_138._4_4_,iVar24);
                        local_100 = (ulong *)ms->chainTable;
                        uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                        UVar18 = (ms->window).lowLimit;
                        UVar17 = uVar56 - uVar35;
                        if (uVar56 - UVar18 <= uVar35) {
                          UVar17 = UVar18;
                        }
                        if (ms->loadedDictEnd != 0) {
                          UVar17 = UVar18;
                        }
                        local_170 = (ulong *)CONCAT44(local_170._4_4_,UVar17);
                        local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,UVar17 + (UVar17 == 0));
                        local_180 = (ulong *)CONCAT44(local_180._4_4_,uVar45);
                        uVar21 = (ulong)((uVar45 & uVar56) * 2);
                        local_198 = (ulong *)((long)local_100 + uVar21 * 4);
                        local_1e0 = (ulong *)((long)local_100 + uVar21 * 4 + 4);
                        iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        uVar45 = uVar56 - (ms->window).dictLimit;
                        local_160 = (ZSTD_optimal_t *)-(long)pBVar46;
                        bVar63 = true;
                        local_80 = ms->hashTable;
                        uVar21 = (ulong)local_80[(long)local_d8];
                        iVar24 = uVar56 + 9;
                        local_178 = pBVar46 + 3;
                        puVar22 = (ulong *)((long)puVar58 + 4);
                        local_108 = (ulong *)((long)puVar58 + 0xc);
                        local_e8 = (ulong *)CONCAT44(local_e8._4_4_,uVar45);
                        do {
                          if (pBVar46 == (BYTE *)0x3) {
                            uVar35 = pZVar49->rep[0] - 1;
                          }
                          else {
                            uVar35 = pZVar49->rep[(long)pBVar46];
                          }
                          pBVar31 = (BYTE *)0x0;
                          if (((uVar35 - 1 < uVar45) && (UVar17 <= uVar56 - uVar35)) &&
                             ((uint)*puVar58 == *(uint *)((long)puVar58 - (ulong)uVar35))) {
                            puVar51 = (ulong *)((long)puVar22 - (ulong)uVar35);
                            puVar33 = puVar22;
                            if (puVar22 < puVar1) {
                              uVar38 = *puVar22 ^ *puVar51;
                              uVar39 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                }
                              }
                              uVar39 = uVar39 >> 3 & 0x1fffffff;
                              iVar41 = (int)uVar39;
                              puVar33 = local_108;
                              if (*puVar51 == *puVar22) {
                                do {
                                  puVar51 = puVar51 + 1;
                                  if (puVar1 <= puVar33) goto LAB_00702756;
                                  uVar38 = *puVar51;
                                  uVar43 = *puVar33;
                                  uVar10 = 0;
                                  if ((uVar43 ^ uVar38) != 0) {
                                    for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0;
                                        uVar10 = uVar10 + 1) {
                                    }
                                  }
                                  puVar52 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar33);
                                  puVar33 = puVar33 + 1;
                                  if (uVar38 != uVar43) {
                                    uVar39 = (long)puVar52 - (long)puVar22;
                                    puVar33 = puVar52;
                                  }
                                  iVar41 = (int)uVar39;
                                } while (uVar38 == uVar43);
                              }
                            }
                            else {
LAB_00702756:
                              if ((puVar33 < local_188) && ((uint)*puVar51 == (uint)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 4);
                                puVar51 = (ulong *)((long)puVar51 + 4);
                              }
                              if ((puVar33 < puVar2) && ((short)*puVar51 == (short)*puVar33)) {
                                puVar33 = (ulong *)((long)puVar33 + 2);
                                puVar51 = (ulong *)((long)puVar51 + 2);
                              }
                              if (puVar33 < puVar37) {
                                puVar33 = (ulong *)((long)puVar33 +
                                                   (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                              }
                              iVar41 = (int)puVar33 - (int)puVar22;
                            }
                            pBVar31 = (BYTE *)(ulong)(iVar41 + 4);
                          }
                          uVar35 = (uint)pBVar31;
                          bVar32 = true;
                          if (stack0xfffffffffffffe40 < pBVar31) {
                            pZVar8[(ulong)local_1a8 & 0xffffffff].off =
                                 (int)pBVar46 + (int)local_160;
                            uVar50 = (uint)local_1a8 + 1;
                            pZVar8[(ulong)local_1a8 & 0xffffffff].len = uVar35;
                            bVar64 = (ulong *)((long)puVar58 + (long)pBVar31) != puVar37;
                            bVar32 = bVar64 && uVar35 <= uVar48;
                            local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar50);
                            unique0x10008b77 = (ulong *)pBVar31;
                            if (!bVar64 || uVar35 > uVar48) {
                              uVar29 = uVar50;
                            }
                          }
                          if (!bVar32) break;
                          pBVar46 = pBVar46 + 1;
                          bVar63 = pBVar46 < local_178;
                        } while (bVar63);
                        if (!bVar63) {
                          local_80[(long)local_d8] = uVar56;
                          local_1b0 = (uint *)(ulong)(uVar56 + 2);
                          local_1f8 = (BYTE *)0x0;
                          pBVar46 = (BYTE *)0x0;
                          do {
                            bVar63 = iVar30 == 0;
                            iVar30 = iVar30 + -1;
                            if (bVar63) break;
                            uVar48 = (uint)uVar21;
                            if (uVar48 < (uint)local_1b8) break;
                            pBVar31 = local_1f8;
                            if (pBVar46 < local_1f8) {
                              pBVar31 = pBVar46;
                            }
                            puVar22 = (ulong *)((long)puVar58 + (long)pBVar31);
                            puVar33 = (ulong *)(pBVar28 + (long)(pBVar31 + uVar21));
                            puVar51 = puVar22;
                            if (puVar22 < puVar1) {
                              uVar38 = *puVar22 ^ *puVar33;
                              uVar39 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                              if (*puVar33 == *puVar22) {
                                do {
                                  puVar51 = puVar51 + 1;
                                  puVar33 = puVar33 + 1;
                                  if (puVar1 <= puVar51) goto LAB_0070290a;
                                  uVar38 = *puVar51 ^ *puVar33;
                                  uVar39 = 0;
                                  if (uVar38 != 0) {
                                    for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                    }
                                  }
                                  pBVar54 = (BYTE *)((long)puVar51 +
                                                    ((uVar39 >> 3 & 0x1fffffff) - (long)puVar22));
                                } while (*puVar33 == *puVar51);
                              }
                            }
                            else {
LAB_0070290a:
                              if ((puVar51 < local_188) && ((uint)*puVar33 == (uint)*puVar51)) {
                                puVar51 = (ulong *)((long)puVar51 + 4);
                                puVar33 = (ulong *)((long)puVar33 + 4);
                              }
                              if ((puVar51 < puVar2) && ((short)*puVar33 == (short)*puVar51)) {
                                puVar51 = (ulong *)((long)puVar51 + 2);
                                puVar33 = (ulong *)((long)puVar33 + 2);
                              }
                              if (puVar51 < puVar37) {
                                puVar51 = (ulong *)((long)puVar51 +
                                                   (ulong)((BYTE)*puVar33 == (BYTE)*puVar51));
                              }
                              pBVar54 = (BYTE *)((long)puVar51 - (long)puVar22);
                            }
                            pBVar54 = pBVar54 + (long)pBVar31;
                            if (stack0xfffffffffffffe40 < pBVar54) {
                              iVar41 = uVar48 + (U32)pBVar54;
                              if (pBVar54 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                                iVar41 = iVar24;
                              }
                              pZVar8[(ulong)local_1a8 & 0xffffffff].off = (int)local_1b0 - uVar48;
                              pZVar8[(ulong)local_1a8 & 0xffffffff].len = (U32)pBVar54;
                              local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,(uint)local_1a8 + 1);
                              bVar63 = false;
                              iVar24 = iVar41;
                              unique0x10008af7 = (ulong *)pBVar54;
                              if ((pBVar54 < (BYTE *)0x1001) &&
                                 ((ulong *)((long)puVar58 + (long)pBVar54) != puVar37))
                              goto LAB_007029c7;
                            }
                            else {
LAB_007029c7:
                              puVar22 = (ulong *)((long)local_100 +
                                                 (ulong)((uVar48 & (uint)local_180) * 2) * 4);
                              if (pBVar28[(long)(pBVar54 + uVar21)] <
                                  *(byte *)((long)puVar58 + (long)pBVar54)) {
                                *(uint *)local_198 = uVar48;
                                pBVar46 = pBVar54;
                                if ((uint)local_138 < uVar48) {
                                  puVar22 = (ulong *)((long)puVar22 + 4);
                                  local_198 = puVar22;
LAB_00702a2f:
                                  uVar21 = (ulong)(uint)*puVar22;
                                  bVar63 = true;
                                }
                                else {
                                  bVar63 = false;
                                  local_198 = (ulong *)local_1c4;
                                }
                              }
                              else {
                                *(uint *)local_1e0 = uVar48;
                                local_1f8 = pBVar54;
                                local_1e0 = puVar22;
                                if ((uint)local_138 < uVar48) goto LAB_00702a2f;
                                bVar63 = false;
                                local_1e0 = (ulong *)local_1c4;
                              }
                            }
                          } while (bVar63);
                          goto LAB_00702aa2;
                        }
                      }
                    }
                  }
LAB_00702e27:
                  local_1c4._0_4_ = uVar29;
                  ZSTD_optLdm_processMatchCandidate
                            (&local_68,pZVar8,(U32 *)local_1c4,iVar25 - (int)local_b0,
                             (int)puVar37 - iVar25);
                  if (local_1c4._0_4_ == 0) {
                    uVar48 = 0x13;
                  }
                  else {
                    uVar29 = pZVar8[local_1c4._0_4_ - 1].len;
                    pvVar27 = (void *)(ulong)uVar29;
                    bVar63 = 0xfff < (int)local_150 + uVar29;
                    uVar48 = 0;
                    if (bVar63 || (uint)local_158 < uVar29) {
                      UVar18 = 0;
                      if (pZVar49->mlen == 0) {
                        UVar18 = pZVar49->litlen;
                      }
                      local_b8 = (void *)(ulong)pZVar8[local_1c4._0_4_ - 1].off;
                      uVar48 = (int)local_150 - UVar18;
                      uVar20 = (ulong)(uVar29 + (U32)local_208 + uVar48);
                      if (0x1000 < uVar48) {
                        uVar48 = 0;
                      }
                      local_150 = (ZSTD_optimal_t *)(ulong)uVar48;
                      uVar48 = 7;
                      local_d0 = (ZSTD_optimal_t *)local_208;
                    }
                    else {
                      pvVar27 = (void *)((ulong)local_190 & 0xffffffff);
                    }
                    local_190 = pvVar27;
                    if (!bVar63 && (uint)local_158 >= uVar29) {
                      iVar25 = (uint)local_168 + (int)local_128;
                      local_168 = (ZSTD_optimal_t *)CONCAT44(local_168._4_4_,iVar25);
                      uVar21 = 0;
                      do {
                        uVar48 = (uint)local_78;
                        if (uVar21 != 0) {
                          uVar48 = pZVar8[uVar21 - 1].len + 1;
                        }
                        uVar29 = pZVar8[uVar21].len;
                        if (uVar48 <= uVar29) {
                          UVar18 = pZVar8[uVar21].off;
                          uVar56 = UVar18 + 1;
                          uVar45 = 0x1f;
                          if (uVar56 != 0) {
                            for (; uVar56 >> uVar45 == 0; uVar45 = uVar45 - 1) {
                            }
                          }
                          ZVar6 = (ms->opt).priceType;
                          do {
                            if (ZVar6 == zop_predef) {
                              uVar56 = uVar29 - 2;
                              iVar24 = 0x1f;
                              if (uVar56 != 0) {
                                for (; uVar56 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                                }
                              }
                              iVar24 = (uVar56 * 0x100 >> ((byte)iVar24 & 0x1f)) +
                                       (iVar24 + uVar45) * 0x100 + 0x1000;
                            }
                            else {
                              uVar35 = uVar29 - 3;
                              uVar56 = (ms->opt).offCodeFreq[uVar45] + 1;
                              iVar24 = 0x1f;
                              if (uVar56 != 0) {
                                for (; uVar56 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                                }
                              }
                              if (uVar35 < 0x80) {
                                uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
                              }
                              else {
                                uVar50 = 0x1f;
                                if (uVar35 != 0) {
                                  for (; uVar35 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                                  }
                                }
                                uVar35 = (uVar50 ^ 0xffffffe0) + 0x44;
                              }
                              uVar50 = (ms->opt).matchLengthFreq[uVar35] + 1;
                              iVar30 = 0x1f;
                              if (uVar50 != 0) {
                                for (; uVar50 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                                }
                              }
                              iVar24 = (((ms->opt).offCodeSumBasePrice +
                                        (ms->opt).matchLengthSumBasePrice) -
                                       ((uVar56 * 0x100 >> ((byte)iVar24 & 0x1f)) +
                                       (uVar50 * 0x100 >> ((byte)iVar30 & 0x1f)))) +
                                       ((ML_bits[uVar35] + uVar45) - (iVar24 + iVar30)) * 0x100 +
                                       0x33;
                            }
                            iVar24 = iVar24 + iVar25;
                            uVar56 = uVar29 + (int)local_150;
                            uVar39 = (ulong)uVar56;
                            if ((uint)uVar20 < uVar56) {
LAB_00703067:
                              uVar20 = uVar20 & 0xffffffff;
                              pZVar49 = local_a0 + uVar20;
                              do {
                                uVar20 = uVar20 + 1;
                                pZVar49->price = 0x40000000;
                                pZVar49 = pZVar49 + 1;
                              } while (uVar20 < uVar39);
LAB_00703093:
                              local_f0[uVar39].mlen = uVar29;
                              local_f0[uVar39].off = UVar18;
                              local_f0[uVar39].litlen = (U32)local_208;
                              local_f0[uVar39].price = iVar24;
                            }
                            else if (iVar24 < local_f0[uVar39].price) {
                              if ((uint)uVar20 < uVar56) goto LAB_00703067;
                              goto LAB_00703093;
                            }
                            uVar29 = uVar29 - 1;
                          } while (uVar48 <= uVar29);
                        }
                        uVar21 = uVar21 + 1;
                      } while (uVar21 != local_1c4._0_4_ + (uint)(local_1c4._0_4_ == 0));
                      uVar48 = 0;
                    }
                  }
                }
                pZVar49 = local_f0;
                if (uVar48 < 0x11) {
                  if (uVar48 != 0) {
                    if (uVar48 != 7) goto LAB_0070352f;
                    goto LAB_007031be;
                  }
                }
                else if (uVar48 != 0x13) {
                  if (uVar48 != 0x11) goto LAB_0070352f;
                  break;
                }
                uVar48 = (int)local_150 + 1;
                local_168 = (ZSTD_optimal_t *)(ulong)uVar48;
              } while (uVar48 <= (uint)uVar20);
            }
            uVar21 = uVar20 & 0xffffffff;
            local_a4 = pZVar49[uVar21].price;
            local_b8 = (void *)(ulong)pZVar49[uVar21].off;
            local_190 = (void *)(ulong)pZVar49[uVar21].mlen;
            local_d0 = (ZSTD_optimal_t *)(ulong)pZVar49[uVar21].litlen;
            local_88 = pZVar49[uVar21].rep[2];
            local_90 = *(undefined8 *)pZVar49[uVar21].rep;
            uVar48 = pZVar49[uVar21].litlen + pZVar49[uVar21].mlen;
            local_150 = (ZSTD_optimal_t *)(ulong)((uint)uVar20 - uVar48);
            if ((uint)uVar20 < uVar48) {
              local_150 = (ZSTD_optimal_t *)0x0;
            }
            goto LAB_007031be;
          }
LAB_0070352f:
        } while (puVar42 < local_1a0);
      }
      ZSTD_resetSeqStore(local_118);
      ppBVar3 = &(ms->window).base;
      *ppBVar3 = *ppBVar3 + -local_70;
      UVar18 = (ms->window).dictLimit + (int)local_70;
      (ms->window).dictLimit = UVar18;
      (ms->window).lowLimit = UVar18;
      ms->nextToUpdate = UVar18;
      if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
        puVar40 = local_110->litFreq;
        lVar44 = 0;
        UVar18 = 0;
        do {
          iVar25 = puVar40[lVar44] * 0x10;
          puVar40[lVar44] = iVar25 - 1;
          UVar18 = (UVar18 + iVar25) - 1;
          lVar44 = lVar44 + 1;
        } while (lVar44 != 0x100);
        (ms->opt).litSum = UVar18;
      }
      puVar40 = (ms->opt).litLengthFreq;
      lVar44 = 0;
      UVar18 = 0;
      do {
        iVar25 = puVar40[lVar44] * 0x10;
        puVar40[lVar44] = iVar25 - 1;
        UVar18 = (UVar18 + iVar25) - 1;
        lVar44 = lVar44 + 1;
      } while (lVar44 != 0x24);
      (ms->opt).litLengthSum = UVar18;
      puVar40 = (ms->opt).matchLengthFreq;
      lVar44 = 0;
      UVar18 = 0;
      do {
        iVar25 = puVar40[lVar44] * 0x10;
        puVar40[lVar44] = iVar25 - 1;
        UVar18 = (UVar18 + iVar25) - 1;
        lVar44 = lVar44 + 1;
      } while (lVar44 != 0x35);
      (ms->opt).matchLengthSum = UVar18;
      puVar40 = (ms->opt).offCodeFreq;
      lVar44 = 0;
      UVar18 = 0;
      do {
        iVar25 = puVar40[lVar44] * 0x10;
        puVar40[lVar44] = iVar25 - 1;
        UVar18 = (UVar18 + iVar25) - 1;
        lVar44 = lVar44 + 1;
      } while (lVar44 != 0x20);
      (ms->opt).offCodeSum = UVar18;
      src = local_b0;
      srcSize = local_70;
    }
  }
  local_110 = &ms->opt;
  register0x00000000 = (ulong *)((long)src + (srcSize - 8));
  uVar48 = (ms->window).dictLimit;
  pBVar46 = (ms->window).base;
  uVar29 = (ms->cParams).targetLength;
  uVar56 = 0xfff;
  if (uVar29 < 0xfff) {
    uVar56 = uVar29;
  }
  local_b8 = (void *)CONCAT44(local_b8._4_4_,uVar56);
  uVar29 = (ms->cParams).minMatch;
  local_1c4._0_4_ = ms->nextToUpdate;
  prVar7 = ms->ldmSeqStore;
  if (prVar7 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar7->capacity;
    local_68.seqStore.seq = prVar7->seq;
    local_68.seqStore.pos = prVar7->pos;
    local_68.seqStore.posInSequence = prVar7->posInSequence;
    local_68.seqStore.size = prVar7->size;
  }
  puVar42 = (ulong *)((long)src + srcSize);
  pZVar8 = (ms->opt).matchTable;
  pZVar49 = (ms->opt).priceTable;
  local_68.offset = 0;
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_110,(BYTE *)src,srcSize,2);
  local_220 = (ulong *)((ulong)(pBVar46 + uVar48 == (BYTE *)src) + (long)src);
  local_1a8 = (ulong *)src;
  if (local_220 < stack0xfffffffffffffe40) {
    uVar48 = (uint)(uVar29 != 3);
    uVar29 = uVar48 + 3;
    local_78 = (ulong)uVar29;
    local_120 = (BYTE *)(ulong)(uVar48 + 2);
    puVar1 = (ulong *)((long)puVar42 + -7);
    local_130 = (ulong *)((long)puVar42 + -3);
    local_188 = (ulong *)((long)puVar42 + -1);
    puVar2 = puVar42 + -4;
    local_e8 = (ulong *)(ulong)uVar29;
    local_160 = pZVar49 + 1;
    local_150 = local_160;
    local_f0 = pZVar49;
    local_d0 = local_160;
    local_c8 = local_160;
    local_b0 = (ulong *)src;
    local_a0 = local_160;
    do {
      iVar25 = (int)local_220;
      local_168 = (ZSTD_optimal_t *)(ulong)(iVar25 - (uint)local_1a8);
      pBVar46 = (ms->window).base;
      uVar20 = (ulong)ms->nextToUpdate;
      uVar48 = 0;
      puVar37 = local_f8;
      if (local_220 < pBVar46 + uVar20) goto LAB_00705077;
      UVar18 = (ms->cParams).minMatch;
      uVar48 = iVar25 - (int)pBVar46;
      for (; puVar37 = local_f8, (uint)uVar20 < uVar48; uVar20 = (ulong)((uint)uVar20 + UVar17)) {
        UVar17 = ZSTD_insertBt1(ms,pBVar46 + uVar20,(BYTE *)puVar42,UVar18,0);
      }
      ms->nextToUpdate = uVar48;
      if (UVar18 - 6 < 2) {
        uVar20 = (ulong)((uint)local_168 == 0);
        uVar29 = (ms->cParams).targetLength;
        if (0xffe < uVar29) {
          uVar29 = 0xfff;
        }
        local_190 = (void *)CONCAT44(local_190._4_4_,uVar29);
        local_158 = (ulong *)(ms->window).base;
        uVar35 = iVar25 - (int)local_158;
        local_1a0 = (ulong *)(ulong)uVar35;
        local_180 = (ulong *)(*local_220 * -0x30e4432340650000 >>
                             (-(char)(ms->cParams).hashLog & 0x3fU));
        uVar50 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar45 = uVar35 - uVar50;
        uVar56 = 0;
        if (uVar35 < uVar50) {
          uVar45 = 0;
        }
        pUVar47 = ms->chainTable;
        uVar61 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar48 = (ms->window).lowLimit;
        uVar36 = uVar35 - uVar61;
        if (uVar35 - uVar48 <= uVar61) {
          uVar36 = uVar48;
        }
        if (ms->loadedDictEnd != 0) {
          uVar36 = uVar48;
        }
        uVar61 = uVar36 + (uVar36 == 0);
        local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,uVar61);
        local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,uVar50);
        uVar21 = (ulong)((uVar50 & uVar35) * 2);
        local_170 = (ulong *)(pUVar47 + uVar21);
        local_1d0 = (ulong *)(pUVar47 + uVar21 + 1);
        iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar18 = (ms->window).dictLimit;
        local_178 = (BYTE *)-uVar20;
        bVar63 = true;
        local_128 = ms->hashTable;
        uVar39 = (ulong)local_128[(long)local_180];
        iVar24 = uVar35 + 9;
        uVar21 = uVar20 + 3;
        puVar58 = (ulong *)((long)local_220 + 4);
        local_228 = local_120;
        uVar48 = uVar36;
        do {
          if (uVar20 == 3) {
            uVar60 = (int)*local_f8 - 1;
          }
          else {
            uVar60 = *(uint *)((long)local_f8 + uVar20 * 4);
          }
          pBVar46 = (BYTE *)0x0;
          if (((uVar60 - 1 < uVar35 - UVar18) && (uVar36 <= uVar35 - uVar60)) &&
             ((uint)*local_220 == *(uint *)((long)local_220 - (ulong)uVar60))) {
            puVar33 = (ulong *)((long)puVar58 - (ulong)uVar60);
            puVar22 = puVar58;
            if (puVar58 < puVar1) {
              uVar43 = *puVar58 ^ *puVar33;
              uVar38 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar38 = uVar38 >> 3 & 0x1fffffff;
              iVar41 = (int)uVar38;
              puVar22 = (ulong *)((long)local_220 + 0xc);
              if (*puVar33 == *puVar58) {
                do {
                  puVar33 = puVar33 + 1;
                  if (puVar1 <= puVar22) goto LAB_007042af;
                  uVar43 = *puVar33;
                  uVar10 = *puVar22;
                  uVar11 = 0;
                  if ((uVar10 ^ uVar43) != 0) {
                    for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  puVar51 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar22);
                  puVar22 = puVar22 + 1;
                  if (uVar43 != uVar10) {
                    uVar38 = (long)puVar51 - (long)puVar58;
                    puVar22 = puVar51;
                  }
                  iVar41 = (int)uVar38;
                } while (uVar43 == uVar10);
              }
            }
            else {
LAB_007042af:
              if ((puVar22 < local_130) && ((uint)*puVar33 == (uint)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar22 < local_188) && ((short)*puVar33 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar22 < puVar42) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar22));
              }
              iVar41 = (int)puVar22 - (int)puVar58;
            }
            pBVar46 = (BYTE *)(ulong)(iVar41 + 4);
          }
          uVar60 = (uint)pBVar46;
          bVar32 = true;
          if (local_228 < pBVar46) {
            pZVar8[uVar56].off = (int)local_178 + (int)uVar20;
            uVar59 = uVar56 + 1;
            pZVar8[uVar56].len = uVar60;
            bVar64 = (ulong *)((long)local_220 + (long)pBVar46) != puVar42;
            bVar32 = bVar64 && uVar60 <= uVar29;
            local_228 = pBVar46;
            uVar56 = uVar59;
            if (!bVar64 || uVar60 > uVar29) {
              uVar48 = uVar59;
            }
          }
          if (!bVar32) break;
          uVar20 = uVar20 + 1;
          bVar63 = uVar20 < uVar21;
        } while (bVar63);
        if (!bVar63) {
          local_128[(long)local_180] = uVar35;
          local_1a0 = (ulong *)(ulong)(uVar35 + 2);
          local_210 = (BYTE *)0x0;
          pBVar46 = (BYTE *)0x0;
          uVar20 = (ulong)uVar56;
          do {
            puVar58 = local_f8;
            uVar48 = (uint)uVar20;
            bVar63 = iVar30 == 0;
            iVar30 = iVar30 + -1;
            if ((bVar63) || (uVar29 = (uint)uVar39, uVar29 < uVar61)) break;
            pBVar28 = local_210;
            if (pBVar46 < local_210) {
              pBVar28 = pBVar46;
            }
            puVar37 = (ulong *)((long)local_220 + (long)pBVar28);
            puVar22 = (ulong *)((long)local_158 + (long)(pBVar28 + uVar39));
            puVar33 = puVar37;
            if (puVar37 < puVar1) {
              uVar38 = *puVar37 ^ *puVar22;
              uVar21 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              pBVar31 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
              if (*puVar22 == *puVar37) {
                do {
                  puVar33 = puVar33 + 1;
                  puVar22 = puVar22 + 1;
                  if (puVar1 <= puVar33) goto LAB_0070445e;
                  uVar38 = *puVar33 ^ *puVar22;
                  uVar21 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  pBVar31 = (BYTE *)((long)puVar33 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar37));
                } while (*puVar22 == *puVar33);
              }
            }
            else {
LAB_0070445e:
              if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar33 < puVar42) {
                puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
              }
              pBVar31 = (BYTE *)((long)puVar33 - (long)puVar37);
            }
            pBVar31 = pBVar31 + (long)pBVar28;
            if (local_228 < pBVar31) {
              iVar41 = uVar29 + (U32)pBVar31;
              if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar29)) {
                iVar41 = iVar24;
              }
              pZVar8[uVar20].off = (uVar35 + 2) - uVar29;
              pZVar8[uVar20].len = (U32)pBVar31;
              uVar20 = (ulong)(uVar48 + 1);
              iVar24 = iVar41;
              local_228 = pBVar31;
              if ((pBVar31 < (BYTE *)0x1001) &&
                 ((ulong *)((long)local_220 + (long)pBVar31) != puVar42)) goto LAB_00704522;
LAB_007045ac:
              bVar63 = false;
            }
            else {
LAB_00704522:
              puVar37 = (ulong *)(pUVar47 + (uVar29 & uVar50) * 2);
              if (*(byte *)((long)local_220 + (long)pBVar31) <=
                  *(byte *)((long)local_158 + (long)(pBVar31 + uVar39))) {
                *(uint *)local_1d0 = uVar29;
                local_210 = pBVar31;
                local_1d0 = puVar37;
                if (uVar45 < uVar29) goto LAB_0070457d;
                local_1d0 = &local_148;
                goto LAB_007045ac;
              }
              *(uint *)local_170 = uVar29;
              pBVar46 = pBVar31;
              if (uVar45 < uVar29) {
                puVar37 = (ulong *)((long)puVar37 + 4);
                local_170 = puVar37;
LAB_0070457d:
                uVar39 = (ulong)(uint)*puVar37;
                bVar63 = true;
              }
              else {
                bVar63 = false;
                local_170 = &local_148;
              }
            }
            uVar48 = (uint)uVar20;
            puVar37 = puVar58;
          } while (bVar63);
          *(uint *)local_1d0 = 0;
          local_1d0 = local_170;
LAB_0070505a:
          *(uint *)local_1d0 = 0;
          ms->nextToUpdate = iVar24 - 8;
        }
LAB_00705069:
        local_198 = (ulong *)((long)local_220 + 0xc);
      }
      else {
        if (UVar18 == 5) {
          uVar20 = (ulong)((uint)local_168 == 0);
          uVar29 = (ms->cParams).targetLength;
          if (0xffe < uVar29) {
            uVar29 = 0xfff;
          }
          local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar29);
          local_1b0 = (uint *)(ms->window).base;
          uVar35 = iVar25 - (int)local_1b0;
          local_180 = (ulong *)(*local_220 * -0x30e4432345000000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
          uVar50 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar45 = uVar35 - uVar50;
          uVar56 = 0;
          if (uVar35 < uVar50) {
            uVar45 = 0;
          }
          local_1b8 = (ulong *)ms->chainTable;
          uVar61 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar48 = (ms->window).lowLimit;
          uVar36 = uVar35 - uVar61;
          if (uVar35 - uVar48 <= uVar61) {
            uVar36 = uVar48;
          }
          if (ms->loadedDictEnd != 0) {
            uVar36 = uVar48;
          }
          local_190 = (void *)CONCAT44(local_190._4_4_,uVar36);
          uVar61 = uVar36 + (uVar36 == 0);
          local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar61);
          local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar50);
          uVar21 = (ulong)((uVar50 & uVar35) * 2);
          local_1d0 = (ulong *)((long)local_1b8 + uVar21 * 4);
          local_158 = (ulong *)((long)local_1b8 + (uVar21 + 1) * 4);
          iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar18 = (ms->window).dictLimit;
          bVar63 = true;
          local_128 = ms->hashTable;
          uVar39 = (ulong)local_128[(long)local_180];
          iVar24 = uVar35 + 9;
          uVar21 = uVar20 + 3;
          puVar58 = (ulong *)((long)local_220 + 4);
          local_228 = local_120;
          puVar22 = local_180;
          do {
            if (uVar20 == 3) {
              uVar48 = (int)*local_f8 - 1;
            }
            else {
              uVar48 = *(uint *)((long)local_f8 + uVar20 * 4);
            }
            pBVar46 = (BYTE *)0x0;
            if (((uVar48 - 1 < uVar35 - UVar18) && (uVar36 <= uVar35 - uVar48)) &&
               ((uint)*local_220 == *(uint *)((long)local_220 - (ulong)uVar48))) {
              puVar51 = (ulong *)((long)puVar58 - (ulong)uVar48);
              puVar33 = puVar58;
              if (puVar58 < puVar1) {
                uVar43 = *puVar58 ^ *puVar51;
                uVar38 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = uVar38 >> 3 & 0x1fffffff;
                iVar41 = (int)uVar38;
                puVar33 = (ulong *)((long)local_220 + 0xc);
                if (*puVar51 == *puVar58) {
                  do {
                    puVar51 = puVar51 + 1;
                    if (puVar1 <= puVar33) goto LAB_007047f3;
                    uVar43 = *puVar51;
                    uVar10 = *puVar33;
                    uVar11 = 0;
                    if ((uVar10 ^ uVar43) != 0) {
                      for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    puVar52 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar33);
                    puVar33 = puVar33 + 1;
                    if (uVar43 != uVar10) {
                      uVar38 = (long)puVar52 - (long)puVar58;
                      puVar33 = puVar52;
                    }
                    iVar41 = (int)uVar38;
                  } while (uVar43 == uVar10);
                }
              }
              else {
LAB_007047f3:
                if ((puVar33 < local_130) && ((uint)*puVar51 == (uint)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 4);
                  puVar51 = (ulong *)((long)puVar51 + 4);
                }
                if ((puVar33 < local_188) && ((short)*puVar51 == (short)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 2);
                  puVar51 = (ulong *)((long)puVar51 + 2);
                }
                if (puVar33 < puVar42) {
                  puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                }
                iVar41 = (int)puVar33 - (int)puVar58;
              }
              pBVar46 = (BYTE *)(ulong)(iVar41 + 4);
            }
            uVar48 = (uint)pBVar46;
            bVar32 = true;
            if (local_228 < pBVar46) {
              pZVar8[uVar56].off = (int)uVar20 - (uint)((uint)local_168 == 0);
              uVar60 = uVar56 + 1;
              pZVar8[uVar56].len = uVar48;
              bVar64 = (ulong *)((long)local_220 + (long)pBVar46) != puVar42;
              bVar32 = bVar64 && uVar48 <= uVar29;
              puVar22 = (ulong *)((ulong)puVar22 & 0xffffffff);
              uVar56 = uVar60;
              local_228 = pBVar46;
              if (!bVar64 || uVar48 > uVar29) {
                puVar22 = (ulong *)(ulong)uVar60;
              }
            }
            uVar48 = (uint)puVar22;
            if (!bVar32) break;
            uVar20 = uVar20 + 1;
            bVar63 = uVar20 < uVar21;
          } while (bVar63);
          if (!bVar63) {
            local_128[(long)local_180] = uVar35;
            local_200 = (BYTE *)0x0;
            pBVar46 = (BYTE *)0x0;
            uVar20 = (ulong)uVar56;
            do {
              puVar58 = local_f8;
              uVar48 = (uint)uVar20;
              bVar63 = iVar30 == 0;
              iVar30 = iVar30 + -1;
              if ((bVar63) || (uVar29 = (uint)uVar39, uVar29 < uVar61)) break;
              pBVar28 = local_200;
              if (pBVar46 < local_200) {
                pBVar28 = pBVar46;
              }
              puVar37 = (ulong *)((long)local_220 + (long)pBVar28);
              puVar22 = (ulong *)((long)local_1b0 + (long)(pBVar28 + uVar39));
              puVar33 = puVar37;
              if (puVar37 < puVar1) {
                uVar38 = *puVar37 ^ *puVar22;
                uVar21 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar31 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar22 == *puVar37) {
                  do {
                    puVar33 = puVar33 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar33) goto LAB_00704999;
                    uVar38 = *puVar33 ^ *puVar22;
                    uVar21 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar31 = (BYTE *)((long)puVar33 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar37))
                    ;
                  } while (*puVar22 == *puVar33);
                }
              }
              else {
LAB_00704999:
                if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar33 < puVar42) {
                  puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                }
                pBVar31 = (BYTE *)((long)puVar33 - (long)puVar37);
              }
              pBVar31 = pBVar31 + (long)pBVar28;
              if (local_228 < pBVar31) {
                iVar41 = uVar29 + (U32)pBVar31;
                if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar29)) {
                  iVar41 = iVar24;
                }
                pZVar8[uVar20].off = (uVar35 + 2) - uVar29;
                pZVar8[uVar20].len = (U32)pBVar31;
                uVar20 = (ulong)(uVar48 + 1);
                iVar24 = iVar41;
                local_228 = pBVar31;
                if ((pBVar31 < (BYTE *)0x1001) &&
                   ((ulong *)((long)local_220 + (long)pBVar31) != puVar42)) goto LAB_00704a5a;
LAB_00704ae7:
                bVar63 = false;
              }
              else {
LAB_00704a5a:
                puVar37 = (ulong *)((long)local_1b8 + (ulong)((uVar29 & uVar50) * 2) * 4);
                if (*(byte *)((long)local_220 + (long)pBVar31) <=
                    *(byte *)((long)local_1b0 + (long)(pBVar31 + uVar39))) {
                  *(uint *)local_158 = uVar29;
                  local_200 = pBVar31;
                  local_158 = puVar37;
                  if (uVar45 < uVar29) goto LAB_00704ab8;
                  local_158 = &local_148;
                  goto LAB_00704ae7;
                }
                *(uint *)local_1d0 = uVar29;
                pBVar46 = pBVar31;
                if (uVar45 < uVar29) {
                  puVar37 = (ulong *)((long)puVar37 + 4);
                  local_1d0 = puVar37;
LAB_00704ab8:
                  uVar39 = (ulong)(uint)*puVar37;
                  bVar63 = true;
                }
                else {
                  bVar63 = false;
                  local_1d0 = &local_148;
                }
              }
              uVar48 = (uint)uVar20;
              puVar37 = puVar58;
            } while (bVar63);
LAB_00705049:
            *(uint *)local_158 = 0;
            goto LAB_0070505a;
          }
          goto LAB_00705069;
        }
        if (UVar18 != 3) {
          uVar20 = (ulong)((uint)local_168 == 0);
          uVar29 = (ms->cParams).targetLength;
          if (0xffe < uVar29) {
            uVar29 = 0xfff;
          }
          local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar29);
          local_1b0 = (uint *)(ms->window).base;
          uVar35 = iVar25 - (int)local_1b0;
          local_180 = (ulong *)(ulong)((uint)*local_220 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar50 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar45 = uVar35 - uVar50;
          uVar56 = 0;
          if (uVar35 < uVar50) {
            uVar45 = 0;
          }
          local_1b8 = (ulong *)ms->chainTable;
          uVar61 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar48 = (ms->window).lowLimit;
          uVar36 = uVar35 - uVar61;
          if (uVar35 - uVar48 <= uVar61) {
            uVar36 = uVar48;
          }
          if (ms->loadedDictEnd != 0) {
            uVar36 = uVar48;
          }
          local_190 = (void *)CONCAT44(local_190._4_4_,uVar36);
          uVar61 = uVar36 + (uVar36 == 0);
          local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar61);
          local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar50);
          uVar21 = (ulong)((uVar50 & uVar35) * 2);
          local_1d0 = (ulong *)((long)local_1b8 + uVar21 * 4);
          local_158 = (ulong *)((long)local_1b8 + (uVar21 + 1) * 4);
          iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar18 = (ms->window).dictLimit;
          bVar63 = true;
          local_128 = ms->hashTable;
          uVar39 = (ulong)local_128[(long)local_180];
          iVar24 = uVar35 + 9;
          uVar21 = uVar20 + 3;
          puVar58 = (ulong *)((long)local_220 + 4);
          local_228 = local_120;
          puVar22 = local_180;
          do {
            if (uVar20 == 3) {
              uVar48 = (int)*local_f8 - 1;
            }
            else {
              uVar48 = *(uint *)((long)local_f8 + uVar20 * 4);
            }
            pBVar46 = (BYTE *)0x0;
            if (((uVar48 - 1 < uVar35 - UVar18) && (uVar36 <= uVar35 - uVar48)) &&
               ((uint)*local_220 == *(uint *)((long)local_220 - (ulong)uVar48))) {
              puVar51 = (ulong *)((long)puVar58 - (ulong)uVar48);
              puVar33 = puVar58;
              if (puVar58 < puVar1) {
                uVar43 = *puVar58 ^ *puVar51;
                uVar38 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = uVar38 >> 3 & 0x1fffffff;
                iVar41 = (int)uVar38;
                puVar33 = (ulong *)((long)local_220 + 0xc);
                if (*puVar51 == *puVar58) {
                  do {
                    puVar51 = puVar51 + 1;
                    if (puVar1 <= puVar33) goto LAB_00704d22;
                    uVar43 = *puVar51;
                    uVar10 = *puVar33;
                    uVar11 = 0;
                    if ((uVar10 ^ uVar43) != 0) {
                      for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    puVar52 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar33);
                    puVar33 = puVar33 + 1;
                    if (uVar43 != uVar10) {
                      uVar38 = (long)puVar52 - (long)puVar58;
                      puVar33 = puVar52;
                    }
                    iVar41 = (int)uVar38;
                  } while (uVar43 == uVar10);
                }
              }
              else {
LAB_00704d22:
                if ((puVar33 < local_130) && ((uint)*puVar51 == (uint)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 4);
                  puVar51 = (ulong *)((long)puVar51 + 4);
                }
                if ((puVar33 < local_188) && ((short)*puVar51 == (short)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 2);
                  puVar51 = (ulong *)((long)puVar51 + 2);
                }
                if (puVar33 < puVar42) {
                  puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                }
                iVar41 = (int)puVar33 - (int)puVar58;
              }
              pBVar46 = (BYTE *)(ulong)(iVar41 + 4);
            }
            uVar48 = (uint)pBVar46;
            bVar32 = true;
            if (local_228 < pBVar46) {
              pZVar8[uVar56].off = (int)uVar20 - (uint)((uint)local_168 == 0);
              uVar60 = uVar56 + 1;
              pZVar8[uVar56].len = uVar48;
              bVar64 = (ulong *)((long)local_220 + (long)pBVar46) != puVar42;
              bVar32 = bVar64 && uVar48 <= uVar29;
              uVar56 = uVar60;
              local_228 = pBVar46;
              if (!bVar64 || uVar48 > uVar29) {
                puVar22 = (ulong *)(ulong)uVar60;
              }
            }
            uVar48 = (uint)puVar22;
            if (!bVar32) break;
            uVar20 = uVar20 + 1;
            bVar63 = uVar20 < uVar21;
          } while (bVar63);
          if (!bVar63) {
            local_128[(long)local_180] = uVar35;
            local_200 = (BYTE *)0x0;
            pBVar46 = (BYTE *)0x0;
            uVar20 = (ulong)uVar56;
            do {
              puVar58 = local_f8;
              uVar48 = (uint)uVar20;
              bVar63 = iVar30 == 0;
              iVar30 = iVar30 + -1;
              if ((bVar63) || (uVar29 = (uint)uVar39, uVar29 < uVar61)) break;
              pBVar28 = local_200;
              if (pBVar46 < local_200) {
                pBVar28 = pBVar46;
              }
              puVar37 = (ulong *)((long)local_220 + (long)pBVar28);
              puVar22 = (ulong *)((long)local_1b0 + (long)(pBVar28 + uVar39));
              puVar33 = puVar37;
              if (puVar37 < puVar1) {
                uVar38 = *puVar37 ^ *puVar22;
                uVar21 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar31 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar22 == *puVar37) {
                  do {
                    puVar33 = puVar33 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar33) goto LAB_00704ec8;
                    uVar38 = *puVar33 ^ *puVar22;
                    uVar21 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar31 = (BYTE *)((long)puVar33 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar37))
                    ;
                  } while (*puVar22 == *puVar33);
                }
              }
              else {
LAB_00704ec8:
                if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                  puVar33 = (ulong *)((long)puVar33 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar33 < puVar42) {
                  puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                }
                pBVar31 = (BYTE *)((long)puVar33 - (long)puVar37);
              }
              pBVar31 = pBVar31 + (long)pBVar28;
              if (local_228 < pBVar31) {
                iVar41 = uVar29 + (U32)pBVar31;
                if (pBVar31 <= (BYTE *)(ulong)(iVar24 - uVar29)) {
                  iVar41 = iVar24;
                }
                pZVar8[uVar20].off = (uVar35 + 2) - uVar29;
                pZVar8[uVar20].len = (U32)pBVar31;
                uVar20 = (ulong)(uVar48 + 1);
                iVar24 = iVar41;
                local_228 = pBVar31;
                if ((pBVar31 < (BYTE *)0x1001) &&
                   ((ulong *)((long)local_220 + (long)pBVar31) != puVar42)) goto LAB_00704f89;
LAB_00705016:
                bVar63 = false;
              }
              else {
LAB_00704f89:
                puVar37 = (ulong *)((long)local_1b8 + (ulong)((uVar29 & uVar50) * 2) * 4);
                if (*(byte *)((long)local_220 + (long)pBVar31) <=
                    *(byte *)((long)local_1b0 + (long)(pBVar31 + uVar39))) {
                  *(uint *)local_158 = uVar29;
                  local_200 = pBVar31;
                  local_158 = puVar37;
                  if (uVar45 < uVar29) goto LAB_00704fe7;
                  local_158 = &local_148;
                  goto LAB_00705016;
                }
                *(uint *)local_1d0 = uVar29;
                pBVar46 = pBVar31;
                if (uVar45 < uVar29) {
                  puVar37 = (ulong *)((long)puVar37 + 4);
                  local_1d0 = puVar37;
LAB_00704fe7:
                  uVar39 = (ulong)(uint)*puVar37;
                  bVar63 = true;
                }
                else {
                  bVar63 = false;
                  local_1d0 = &local_148;
                }
              }
              uVar48 = (uint)uVar20;
              puVar37 = puVar58;
            } while (bVar63);
            goto LAB_00705049;
          }
          goto LAB_00705069;
        }
        uVar20 = (ulong)((uint)local_168 == 0);
        uVar29 = (ms->cParams).targetLength;
        if (0xffe < uVar29) {
          uVar29 = 0xfff;
        }
        local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar29);
        local_1b0 = (uint *)(ms->window).base;
        uVar45 = iVar25 - (int)local_1b0;
        uVar56 = 0;
        local_180 = (ulong *)(ulong)((uint)*local_220 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
        uVar48 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        iVar24 = uVar45 - uVar48;
        if (uVar45 < uVar48) {
          iVar24 = 0;
        }
        local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,iVar24);
        pUVar47 = ms->chainTable;
        uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar35 = (ms->window).lowLimit;
        uVar50 = uVar45 - uVar36;
        if (uVar45 - uVar35 <= uVar36) {
          uVar50 = uVar35;
        }
        if (ms->loadedDictEnd != 0) {
          uVar50 = uVar35;
        }
        local_190 = (void *)CONCAT44(local_190._4_4_,uVar50);
        local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar50 + (uVar50 == 0));
        local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar48);
        uVar21 = (ulong)((uVar48 & uVar45) * 2);
        local_1d0 = (ulong *)(pUVar47 + uVar21);
        local_158 = (ulong *)(pUVar47 + uVar21 + 1);
        iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar18 = (ms->window).dictLimit;
        bVar63 = true;
        local_128 = ms->hashTable;
        local_198 = (ulong *)(ulong)local_128[(long)local_180];
        iVar24 = uVar45 + 9;
        uVar21 = uVar20 + 3;
        puVar58 = (ulong *)((long)local_220 + 3);
        local_228 = local_120;
        puVar22 = local_180;
        do {
          if (uVar20 == 3) {
            uVar48 = (int)*local_f8 - 1;
          }
          else {
            uVar48 = *(uint *)((long)local_f8 + uVar20 * 4);
          }
          pBVar46 = (BYTE *)0x0;
          if (((uVar48 - 1 < uVar45 - UVar18) && (uVar50 <= uVar45 - uVar48)) &&
             (((*(uint *)((long)local_220 - (ulong)uVar48) ^ (uint)*local_220) & 0xffffff) == 0)) {
            puVar51 = (ulong *)((long)puVar58 - (ulong)uVar48);
            puVar33 = puVar58;
            if (puVar58 < puVar1) {
              uVar38 = *puVar58 ^ *puVar51;
              uVar39 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar39 = uVar39 >> 3 & 0x1fffffff;
              iVar41 = (int)uVar39;
              puVar33 = (ulong *)((long)local_220 + 0xb);
              if (*puVar51 == *puVar58) {
                do {
                  puVar51 = puVar51 + 1;
                  if (puVar1 <= puVar33) goto LAB_00703ecd;
                  uVar38 = *puVar51;
                  uVar43 = *puVar33;
                  uVar10 = 0;
                  if ((uVar43 ^ uVar38) != 0) {
                    for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  puVar52 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar33);
                  puVar33 = puVar33 + 1;
                  if (uVar38 != uVar43) {
                    uVar39 = (long)puVar52 - (long)puVar58;
                    puVar33 = puVar52;
                  }
                  iVar41 = (int)uVar39;
                } while (uVar38 == uVar43);
              }
            }
            else {
LAB_00703ecd:
              if ((puVar33 < local_130) && ((uint)*puVar51 == (uint)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 4);
                puVar51 = (ulong *)((long)puVar51 + 4);
              }
              if ((puVar33 < local_188) && ((short)*puVar51 == (short)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 2);
                puVar51 = (ulong *)((long)puVar51 + 2);
              }
              if (puVar33 < puVar42) {
                puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
              }
              iVar41 = (int)puVar33 - (int)puVar58;
            }
            pBVar46 = (BYTE *)(ulong)(iVar41 + 3);
          }
          uVar48 = (uint)pBVar46;
          bVar32 = true;
          if (local_228 < pBVar46) {
            pZVar8[uVar56].off = (int)uVar20 - (uint)((uint)local_168 == 0);
            uVar35 = uVar56 + 1;
            pZVar8[uVar56].len = uVar48;
            bVar64 = (ulong *)((long)local_220 + (long)pBVar46) != puVar42;
            bVar32 = bVar64 && uVar48 <= uVar29;
            uVar56 = uVar35;
            local_228 = pBVar46;
            if (!bVar64 || uVar48 > uVar29) {
              puVar22 = (ulong *)(ulong)uVar35;
            }
          }
          uVar48 = (uint)puVar22;
          if (!bVar32) break;
          uVar20 = uVar20 + 1;
          bVar63 = uVar20 < uVar21;
        } while (bVar63);
        if (!bVar63) {
          if (local_228 < (BYTE *)0x3) {
            UVar18 = ZSTD_insertAndFindFirstIndexHash3(ms,(U32 *)local_1c4,(BYTE *)local_220);
            bVar63 = true;
            if (((uint)local_178 <= UVar18) && (uVar45 - UVar18 < 0x40000)) {
              puVar22 = (ulong *)((ulong)UVar18 + (long)local_1b0);
              puVar58 = local_220;
              if (local_220 < puVar1) {
                uVar21 = *local_220 ^ *puVar22;
                uVar20 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                pBVar46 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
                if (*puVar22 == *local_220) {
                  do {
                    puVar58 = puVar58 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar58) goto LAB_00707544;
                    uVar21 = *puVar58 ^ *puVar22;
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    pBVar46 = (BYTE *)((long)puVar58 +
                                      ((uVar20 >> 3 & 0x1fffffff) - (long)local_220));
                  } while (*puVar22 == *puVar58);
                }
              }
              else {
LAB_00707544:
                if ((puVar58 < local_130) && ((uint)*puVar22 == (uint)*puVar58)) {
                  puVar58 = (ulong *)((long)puVar58 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar58 < local_188) && ((short)*puVar22 == (short)*puVar58)) {
                  puVar58 = (ulong *)((long)puVar58 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar58 < puVar42) {
                  puVar58 = (ulong *)((long)puVar58 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar58));
                }
                pBVar46 = (BYTE *)((long)puVar58 - (long)local_220);
              }
              if (&DAT_00000002 < pBVar46) {
                pZVar8->off = (uVar45 - UVar18) + 2;
                pZVar8->len = (U32)pBVar46;
                local_228 = pBVar46;
                if (((BYTE *)((ulong)local_1a0 & 0xffffffff) < pBVar46) ||
                   (uVar56 = 1, (ulong *)((long)local_220 + (long)pBVar46) == puVar42)) {
                  ms->nextToUpdate = uVar45 + 1;
                  uVar56 = 1;
                  bVar63 = false;
                  uVar48 = 1;
                }
              }
            }
            if (!bVar63) goto LAB_00705077;
          }
          local_128[(long)local_180] = uVar45;
          uVar20 = (ulong)uVar56;
          pBVar46 = (BYTE *)0x0;
          pBVar28 = (BYTE *)0x0;
          puVar58 = local_198;
          do {
            uVar48 = (uint)uVar20;
            bVar63 = iVar30 == 0;
            iVar30 = iVar30 + -1;
            if (bVar63) break;
            uVar29 = (uint)puVar58;
            if (uVar29 < (uint)local_178) break;
            pBVar31 = pBVar46;
            if (pBVar28 < pBVar46) {
              pBVar31 = pBVar28;
            }
            puVar22 = (ulong *)((long)local_220 + (long)pBVar31);
            puVar33 = (ulong *)((long)local_1b0 + (long)(pBVar31 + ((ulong)puVar58 & 0xffffffff)));
            puVar51 = puVar22;
            if (puVar22 < puVar1) {
              uVar39 = *puVar22 ^ *puVar33;
              uVar21 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              pBVar54 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
              if (*puVar33 == *puVar22) {
                do {
                  puVar51 = puVar51 + 1;
                  puVar33 = puVar33 + 1;
                  if (puVar1 <= puVar51) goto LAB_007076e7;
                  uVar39 = *puVar51 ^ *puVar33;
                  uVar21 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  pBVar54 = (BYTE *)((long)puVar51 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar22));
                } while (*puVar33 == *puVar51);
              }
            }
            else {
LAB_007076e7:
              if ((puVar51 < local_130) && ((uint)*puVar33 == (uint)*puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar51 < local_188) && ((short)*puVar33 == (short)*puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar51 < puVar42) {
                puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar51));
              }
              pBVar54 = (BYTE *)((long)puVar51 - (long)puVar22);
            }
            pBVar54 = pBVar54 + (long)pBVar31;
            if (local_228 < pBVar54) {
              iVar41 = uVar29 + (U32)pBVar54;
              if (pBVar54 <= (BYTE *)(ulong)(iVar24 - uVar29)) {
                iVar41 = iVar24;
              }
              pZVar8[uVar20].off = (uVar45 + 2) - uVar29;
              pZVar8[uVar20].len = (U32)pBVar54;
              uVar20 = (ulong)(uVar48 + 1);
              bVar63 = false;
              iVar24 = iVar41;
              local_228 = pBVar54;
              if ((pBVar54 < (BYTE *)0x1001) &&
                 ((ulong *)((long)local_220 + (long)pBVar54) != puVar42)) goto LAB_007077c2;
            }
            else {
LAB_007077c2:
              puVar22 = (ulong *)(pUVar47 + (uVar29 & (uint)local_170) * 2);
              if (*(byte *)((long)local_1b0 + (long)(pBVar54 + ((ulong)puVar58 & 0xffffffff))) <
                  *(byte *)((long)local_220 + (long)pBVar54)) {
                *(uint *)local_1d0 = uVar29;
                pBVar28 = pBVar54;
                if ((uint)local_1b8 < uVar29) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  local_1d0 = puVar22;
LAB_00707836:
                  puVar58 = (ulong *)(ulong)(uint)*puVar22;
                  bVar63 = true;
                }
                else {
                  bVar63 = false;
                  local_1d0 = &local_148;
                }
              }
              else {
                *(uint *)local_158 = uVar29;
                pBVar46 = pBVar54;
                local_158 = puVar22;
                if ((uint)local_1b8 < uVar29) goto LAB_00707836;
                bVar63 = false;
                local_158 = &local_148;
              }
            }
            uVar48 = (uint)uVar20;
          } while (bVar63);
          *(uint *)local_158 = 0;
          *(uint *)local_1d0 = 0;
          ms->nextToUpdate = iVar24 - 8;
        }
      }
LAB_00705077:
      local_148 = CONCAT44(local_148._4_4_,uVar48);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,pZVar8,(U32 *)&local_148,iVar25 - (int)local_b0,(int)puVar42 - iVar25);
      pZVar49 = local_f0;
      iVar25 = (int)local_148;
      if ((int)local_148 == 0) {
        local_220 = (ulong *)((long)local_220 + 1);
        uVar20 = 0;
        iVar25 = 2;
      }
      else {
        lVar44 = 0;
        do {
          local_f0->rep[lVar44] = *(U32 *)((long)puVar37 + lVar44 * 4);
          lVar44 = lVar44 + 1;
        } while (lVar44 != 3);
        local_f0->mlen = 0;
        local_f0->litlen = (U32)local_168;
        UVar18 = ZSTD_litLengthPrice((U32)local_168,local_110,2);
        pZVar49->price = UVar18;
        uVar48 = pZVar8[iVar25 - 1U].len;
        if ((uint)local_b8 < uVar48) {
          local_160 = (ZSTD_optimal_t *)(ulong)pZVar8[iVar25 - 1U].off;
          uVar20 = (ulong)(uVar48 + (int)local_168);
          local_150 = (ZSTD_optimal_t *)0x0;
          iVar25 = 7;
          local_c8 = (ZSTD_optimal_t *)(ulong)uVar48;
          local_d0 = (ZSTD_optimal_t *)((ulong)local_168 & 0xffffffff);
        }
        else {
          UVar17 = ZSTD_litLengthPrice(0,local_110,2);
          uVar20 = 1;
          pZVar26 = local_a0;
          do {
            pZVar26->price = 0x40000000;
            uVar20 = uVar20 + 1;
            pZVar26 = pZVar26 + 1;
          } while (local_e8 != (ulong *)uVar20);
          uVar21 = 0;
          do {
            uVar48 = pZVar8[uVar21].len;
            if ((uint)uVar20 <= uVar48) {
              UVar19 = pZVar8[uVar21].off;
              uVar56 = UVar19 + 1;
              uVar29 = 0x1f;
              if (uVar56 != 0) {
                for (; uVar56 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                }
              }
              ZVar6 = (ms->opt).priceType;
              uVar56 = (uint)uVar20 * 0x100 - 0x200;
              do {
                UVar57 = (U32)uVar20;
                if (ZVar6 == zop_predef) {
                  iVar24 = 0x1f;
                  if (UVar57 - 2 != 0) {
                    for (; UVar57 - 2 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                    }
                  }
                  iVar24 = (iVar24 + uVar29) * 0x100 + (uVar56 >> ((byte)iVar24 & 0x1f)) + 0x1000;
                }
                else {
                  uVar35 = UVar57 - 3;
                  uVar45 = (ms->opt).offCodeFreq[uVar29] + 1;
                  iVar24 = 0x1f;
                  if (uVar45 != 0) {
                    for (; uVar45 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                    }
                  }
                  if (uVar35 < 0x80) {
                    uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
                  }
                  else {
                    uVar50 = 0x1f;
                    if (uVar35 != 0) {
                      for (; uVar35 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                      }
                    }
                    uVar35 = (uVar50 ^ 0xffffffe0) + 0x44;
                  }
                  uVar50 = (ms->opt).matchLengthFreq[uVar35] + 1;
                  iVar30 = 0x1f;
                  if (uVar50 != 0) {
                    for (; uVar50 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                    }
                  }
                  iVar24 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                           ((uVar45 * 0x100 >> ((byte)iVar24 & 0x1f)) +
                           (uVar50 * 0x100 >> ((byte)iVar30 & 0x1f)))) +
                           ((ML_bits[uVar35] + uVar29) - (iVar24 + iVar30)) * 0x100 + 0x33;
                  pZVar49 = local_f0;
                }
                uVar20 = uVar20 & 0xffffffff;
                pZVar49[uVar20].mlen = UVar57;
                pZVar49[uVar20].off = UVar19;
                pZVar49[uVar20].litlen = (U32)local_168;
                pZVar49[uVar20].price = iVar24 + UVar17 + UVar18;
                uVar20 = (ulong)(UVar57 + 1);
                uVar56 = uVar56 + 0x100;
              } while (UVar57 + 1 <= uVar48);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != iVar25 + (uint)(iVar25 == 0));
          uVar20 = (ulong)((int)uVar20 - 1);
          iVar25 = 0;
        }
      }
      if (iVar25 == 7) {
LAB_00707186:
        uVar20 = (ulong)local_150 & 0xffffffff;
        pUVar47 = pZVar49[uVar20].rep;
        uVar48 = (uint)local_160;
        if ((U32)local_c8 == 0) {
          *(U32 *)(local_f8 + 1) = pZVar49[uVar20].rep[2];
          *local_f8 = *(ulong *)pUVar47;
        }
        else {
          if (uVar48 < 3) {
            uVar29 = ((U32)local_d0 == 0) + uVar48;
            if (uVar29 == 0) {
              uVar21 = *(ulong *)pUVar47;
              uVar39 = uVar21 >> 0x20;
              pUVar23 = pZVar49[uVar20].rep + 2;
              goto LAB_00707206;
            }
            if (uVar29 == 3) {
              uVar56 = *pUVar47 - 1;
            }
            else {
              uVar56 = pUVar47[uVar29];
            }
            pUVar23 = pUVar47 + (ulong)(uVar29 == 1) + 1;
            uVar39 = (ulong)*pUVar47;
          }
          else {
            uVar39 = (ulong)*pUVar47;
            pUVar23 = pZVar49[uVar20].rep + 1;
            uVar21 = (ulong)(uVar48 - 2);
LAB_00707206:
            uVar56 = (uint)uVar21;
          }
          UVar18 = *pUVar23;
          *local_f8 = (ulong)uVar56 | uVar39 << 0x20;
          *(U32 *)(local_f8 + 1) = UVar18;
        }
        uVar29 = (int)local_150 + 1;
        local_168 = (ZSTD_optimal_t *)(ulong)uVar29;
        pZVar49[(long)local_168].price = local_a4;
        pZVar49[(long)local_168].off = uVar48;
        pZVar49[(long)local_168].mlen = (U32)local_c8;
        pZVar49[(long)local_168].litlen = (U32)local_d0;
        *(undefined8 *)pZVar49[(long)local_168].rep = local_90;
        pZVar49[(long)local_168].rep[2] = local_88;
        uVar21 = (ulong)local_150 & 0xffffffff;
        uVar20 = (ulong)local_150 & 0xffffffff;
        uVar39 = (ulong)local_168;
        if ((int)local_150 != 0) {
          do {
            uVar39 = uVar20;
            uVar48 = (uint)uVar21;
            uVar56 = pZVar49[uVar21].litlen + pZVar49[uVar21].mlen;
            pZVar26 = pZVar49 + uVar21;
            iVar25 = pZVar26->price;
            UVar17 = pZVar26->off;
            UVar19 = pZVar26->mlen;
            UVar57 = pZVar26->litlen;
            pZVar26 = pZVar49 + uVar21;
            UVar18 = pZVar26->rep[0];
            uVar12 = *(undefined8 *)(&pZVar26->litlen + 2);
            pZVar13 = pZVar49 + uVar39;
            pZVar13->litlen = pZVar26->litlen;
            pZVar13->rep[0] = UVar18;
            *(undefined8 *)(&pZVar13->litlen + 2) = uVar12;
            pZVar26 = pZVar49 + uVar39;
            pZVar26->price = iVar25;
            pZVar26->off = UVar17;
            pZVar26->mlen = UVar19;
            pZVar26->litlen = UVar57;
            uVar21 = (ulong)(uVar48 - uVar56);
            if (uVar56 > uVar48) {
              uVar21 = 0;
            }
            uVar20 = (ulong)((int)uVar39 - 1);
          } while (uVar56 <= uVar48 && uVar48 - uVar56 != 0);
        }
        puVar37 = local_1a8;
        if ((uint)uVar39 <= uVar29) {
          do {
            UVar18 = pZVar49[uVar39].mlen;
            uVar48 = pZVar49[uVar39].litlen;
            uVar20 = (ulong)uVar48;
            if (UVar18 == 0) {
              local_220 = (ulong *)(uVar20 + (long)puVar37);
            }
            else {
              UVar17 = pZVar49[uVar39].off;
              ZSTD_updateStats(local_110,uVar48,(BYTE *)puVar37,UVar17,UVar18);
              puVar58 = (ulong *)((long)puVar37 + uVar20);
              if (puVar2 < puVar58) {
                puVar33 = (ulong *)local_118->lit;
                puVar22 = puVar33;
                puVar51 = puVar37;
                if (puVar37 <= puVar2) {
                  puVar22 = (ulong *)((long)puVar33 + ((long)puVar2 - (long)puVar37));
                  uVar21 = puVar37[1];
                  *puVar33 = *puVar37;
                  puVar33[1] = uVar21;
                  puVar51 = puVar2;
                  if (0x10 < (long)puVar2 - (long)puVar37) {
                    lVar44 = 0x10;
                    do {
                      uVar12 = ((undefined8 *)((long)puVar37 + lVar44))[1];
                      puVar4 = (undefined8 *)((long)puVar33 + lVar44);
                      *puVar4 = *(undefined8 *)((long)puVar37 + lVar44);
                      puVar4[1] = uVar12;
                      puVar5 = (undefined8 *)((long)puVar37 + lVar44 + 0x10);
                      uVar12 = puVar5[1];
                      puVar4[2] = *puVar5;
                      puVar4[3] = uVar12;
                      lVar44 = lVar44 + 0x20;
                    } while (puVar4 + 4 < puVar22);
                  }
                }
                if (puVar51 < puVar58) {
                  lVar44 = 0;
                  do {
                    *(BYTE *)((long)puVar22 + lVar44) = *(BYTE *)((long)puVar51 + lVar44);
                    lVar44 = lVar44 + 1;
                  } while ((long)puVar58 - (long)puVar51 != lVar44);
                }
              }
              else {
                puVar58 = (ulong *)local_118->lit;
                uVar21 = puVar37[1];
                *puVar58 = *puVar37;
                puVar58[1] = uVar21;
                if (0x10 < uVar48) {
                  pBVar46 = local_118->lit;
                  uVar21 = puVar37[3];
                  *(ulong *)(pBVar46 + 0x10) = puVar37[2];
                  *(ulong *)(pBVar46 + 0x18) = uVar21;
                  if (0x20 < uVar48) {
                    lVar44 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar37 + lVar44 + 0x20);
                      uVar12 = puVar4[1];
                      pBVar28 = pBVar46 + lVar44 + 0x20;
                      *(undefined8 *)pBVar28 = *puVar4;
                      *(undefined8 *)(pBVar28 + 8) = uVar12;
                      puVar4 = (undefined8 *)((long)puVar37 + lVar44 + 0x30);
                      uVar12 = puVar4[1];
                      *(undefined8 *)(pBVar28 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar28 + 0x18) = uVar12;
                      lVar44 = lVar44 + 0x20;
                    } while (pBVar28 + 0x20 < pBVar46 + uVar20);
                  }
                }
              }
              local_118->lit = local_118->lit + uVar20;
              if (0xffff < uVar48) {
                local_118->longLengthType = ZSTD_llt_literalLength;
                local_118->longLengthPos =
                     (U32)((ulong)((long)local_118->sequences - (long)local_118->sequencesStart) >>
                          3);
              }
              psVar9 = local_118->sequences;
              psVar9->litLength = (U16)uVar48;
              psVar9->offset = UVar17 + 1;
              if (0xffff < UVar18 - 3) {
                local_118->longLengthType = ZSTD_llt_matchLength;
                local_118->longLengthPos =
                     (U32)((ulong)((long)psVar9 - (long)local_118->sequencesStart) >> 3);
              }
              psVar9->matchLength = (U16)(UVar18 - 3);
              local_118->sequences = psVar9 + 1;
              local_220 = (ulong *)((long)puVar37 + (ulong)(UVar18 + uVar48));
              puVar37 = local_220;
            }
            uVar48 = (int)uVar39 + 1;
            uVar39 = (ulong)uVar48;
          } while (uVar48 <= (uint)local_168);
        }
        local_1a8 = puVar37;
        ZSTD_setBasePrices(local_110,2);
      }
      else if (iVar25 == 0) {
        if ((int)uVar20 != 0) {
          local_168 = (ZSTD_optimal_t *)&DAT_00000001;
LAB_00705351:
          poVar15 = local_110;
          uVar48 = (int)local_168 - 1;
          pZVar26 = pZVar49 + uVar48;
          UVar18 = 1;
          if (pZVar49[uVar48].mlen == 0) {
            UVar18 = pZVar26->litlen + 1;
          }
          puVar37 = (ulong *)((long)local_220 + (long)local_168);
          iVar25 = 0x800;
          if (((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) &&
             (iVar25 = 0x600, (ms->opt).priceType != zop_predef)) {
            uVar48 = (ms->opt).litFreq[*(byte *)((long)puVar37 + -1)] + 1;
            iVar25 = 0x1f;
            if (uVar48 != 0) {
              for (; uVar48 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            iVar25 = (ms->opt).litSumBasePrice -
                     (iVar25 * 0x100 + (uVar48 * 0x100 >> ((byte)iVar25 & 0x1f)));
          }
          iVar24 = pZVar26->price;
          local_150 = local_168;
          UVar17 = ZSTD_litLengthPrice(UVar18,local_110,2);
          UVar19 = ZSTD_litLengthPrice(UVar18 - 1,poVar15,2);
          iVar25 = (UVar17 + iVar25 + iVar24) - UVar19;
          pZVar49 = local_f0 + (long)local_168;
          if (iVar25 <= local_f0[(long)local_168].price) {
            pZVar49->off = 0;
            pZVar49->mlen = 0;
            pZVar49->litlen = UVar18;
            pZVar49->price = iVar25;
          }
          if (pZVar49->mlen == 0) {
            pZVar49->rep[2] = pZVar26->rep[2];
            *(undefined8 *)pZVar49->rep = *(undefined8 *)pZVar26->rep;
          }
          else {
            uVar29 = (int)local_150 - pZVar49->mlen;
            pUVar47 = local_f0[uVar29].rep;
            uVar48 = pZVar49->off;
            if (uVar48 < 3) {
              uVar48 = uVar48 + (pZVar49->litlen == 0);
              if (uVar48 == 0) {
                uVar21 = *(ulong *)pUVar47;
                uVar39 = uVar21 >> 0x20;
                pUVar23 = local_f0[uVar29].rep + 2;
              }
              else {
                if (uVar48 == 3) {
                  uVar29 = *pUVar47 - 1;
                }
                else {
                  uVar29 = pUVar47[uVar48];
                }
                uVar21 = (ulong)uVar29;
                pUVar23 = pUVar47 + (ulong)(uVar48 == 1) + 1;
                uVar39 = (ulong)*pUVar47;
              }
            }
            else {
              uVar39 = (ulong)*pUVar47;
              pUVar23 = local_f0[uVar29].rep + 1;
              uVar21 = (ulong)(uVar48 - 2);
            }
            UVar18 = *pUVar23;
            *(ulong *)pZVar49->rep = uVar21 & 0xffffffff | uVar39 << 0x20;
            pZVar49->rep[2] = UVar18;
          }
          uVar48 = 0x13;
          if ((puVar37 <= stack0xfffffffffffffe40) && (uVar48 = 0x11, (int)local_150 != (int)uVar20)
             ) {
            uVar48 = pZVar49->mlen;
            local_168 = (ZSTD_optimal_t *)0x0;
            if (uVar48 == 0) {
              local_168 = (ZSTD_optimal_t *)(ulong)pZVar49->litlen;
            }
            local_128 = (U32 *)CONCAT44(local_128._4_4_,pZVar49->price);
            UVar18 = ZSTD_litLengthPrice(0,local_110,2);
            local_170 = (ulong *)CONCAT44(local_170._4_4_,UVar18);
            pBVar46 = (ms->window).base;
            uVar21 = (ulong)ms->nextToUpdate;
            iVar25 = (int)puVar37;
            uVar29 = 0;
            if (pBVar46 + uVar21 <= puVar37) {
              UVar18 = (ms->cParams).minMatch;
              uVar29 = iVar25 - (int)pBVar46;
              for (; (uint)uVar21 < uVar29; uVar21 = (ulong)((uint)uVar21 + UVar17)) {
                UVar17 = ZSTD_insertBt1(ms,pBVar46 + uVar21,(BYTE *)puVar42,UVar18,0);
              }
              ms->nextToUpdate = uVar29;
              if (UVar18 - 6 < 2) {
                puVar58 = (ulong *)(ulong)(uVar48 != 0);
                uVar29 = (ms->cParams).targetLength;
                if (0xffe < uVar29) {
                  uVar29 = 0xfff;
                }
                pBVar46 = (ms->window).base;
                uVar56 = iVar25 - (int)pBVar46;
                local_c0 = (ulong *)(*puVar37 * -0x30e4432340650000 >>
                                    (-(char)(ms->cParams).hashLog & 0x3fU));
                uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                uVar45 = uVar56 - uVar35;
                local_1a0 = (ulong *)((ulong)local_1a0._4_4_ << 0x20);
                if (uVar56 < uVar35) {
                  uVar45 = 0;
                }
                local_198 = (ulong *)CONCAT44(local_198._4_4_,uVar45);
                local_180 = (ulong *)ms->chainTable;
                uVar50 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                UVar18 = (ms->window).lowLimit;
                UVar17 = uVar56 - uVar50;
                if (uVar56 - UVar18 <= uVar50) {
                  UVar17 = UVar18;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar17 = UVar18;
                }
                local_178 = (BYTE *)CONCAT44(local_178._4_4_,UVar17);
                uVar50 = UVar17 + (UVar17 == 0);
                local_158 = (ulong *)CONCAT44(local_158._4_4_,uVar50);
                uVar21 = (ulong)((uVar35 & uVar56) * 2);
                local_1d8 = (ulong *)((long)local_180 + uVar21 * 4);
                local_1b8 = (ulong *)((long)local_180 + uVar21 * 4 + 4);
                iVar30 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                uVar36 = uVar56 - (ms->window).dictLimit;
                local_1b0 = (uint *)-(long)puVar58;
                bVar63 = true;
                local_108 = (ulong *)ms->hashTable;
                uVar21 = (ulong)*(uint *)((long)local_108 + (long)local_c0 * 4);
                iVar24 = uVar56 + 9;
                local_100 = (ulong *)((long)puVar58 + 3);
                pUVar47 = (U32 *)((long)puVar37 + 4);
                local_e0 = (U32 *)((long)puVar37 + 0xc);
                local_210 = local_120;
                local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar36);
                do {
                  if (puVar58 == (ulong *)0x3) {
                    uVar61 = pZVar49->rep[0] - 1;
                  }
                  else {
                    uVar61 = pZVar49->rep[(long)puVar58];
                  }
                  pBVar28 = (BYTE *)0x0;
                  if (((uVar61 - 1 < uVar36) && (UVar17 <= uVar56 - uVar61)) &&
                     ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)uVar61))) {
                    puVar22 = (ulong *)((long)pUVar47 - (ulong)uVar61);
                    pUVar23 = pUVar47;
                    if (pUVar47 < puVar1) {
                      uVar38 = *(ulong *)pUVar47 ^ *puVar22;
                      uVar39 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = uVar39 >> 3 & 0x1fffffff;
                      iVar41 = (int)uVar39;
                      pUVar23 = local_e0;
                      if (*puVar22 == *(ulong *)pUVar47) {
                        do {
                          puVar22 = puVar22 + 1;
                          if (puVar1 <= pUVar23) goto LAB_00705c65;
                          uVar38 = *puVar22;
                          uVar43 = *(ulong *)pUVar23;
                          uVar10 = 0;
                          if ((uVar43 ^ uVar38) != 0) {
                            for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                            }
                          }
                          pUVar55 = (U32 *)((uVar10 >> 3 & 0x1fffffff) + (long)pUVar23);
                          pUVar23 = pUVar23 + 2;
                          if (uVar38 != uVar43) {
                            uVar39 = (long)pUVar55 - (long)pUVar47;
                            pUVar23 = pUVar55;
                          }
                          iVar41 = (int)uVar39;
                        } while (uVar38 == uVar43);
                      }
                    }
                    else {
LAB_00705c65:
                      if ((pUVar23 < local_130) && ((uint)*puVar22 == *pUVar23)) {
                        pUVar23 = pUVar23 + 1;
                        puVar22 = (ulong *)((long)puVar22 + 4);
                      }
                      if ((pUVar23 < local_188) && ((short)*puVar22 == (short)*pUVar23)) {
                        pUVar23 = (U32 *)((long)pUVar23 + 2);
                        puVar22 = (ulong *)((long)puVar22 + 2);
                      }
                      if (pUVar23 < puVar42) {
                        pUVar23 = (U32 *)((long)pUVar23 + (ulong)((BYTE)*puVar22 == (BYTE)*pUVar23))
                        ;
                      }
                      iVar41 = (int)pUVar23 - (int)pUVar47;
                    }
                    pBVar28 = (BYTE *)(ulong)(iVar41 + 4);
                  }
                  uVar61 = (uint)pBVar28;
                  bVar32 = true;
                  if (local_210 < pBVar28) {
                    pZVar8[(ulong)local_1a0 & 0xffffffff].off = (int)puVar58 + (int)local_1b0;
                    uVar60 = (uint)local_1a0 + 1;
                    pZVar8[(ulong)local_1a0 & 0xffffffff].len = uVar61;
                    bVar64 = (ulong *)((long)puVar37 + (long)pBVar28) != puVar42;
                    bVar32 = bVar64 && uVar61 <= uVar29;
                    local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar60);
                    local_210 = pBVar28;
                    if (!bVar64 || uVar61 > uVar29) {
                      uVar48 = uVar60;
                    }
                  }
                  if (!bVar32) break;
                  puVar58 = (ulong *)((long)puVar58 + 1);
                  bVar63 = puVar58 < local_100;
                } while (bVar63);
                if (!bVar63) {
                  *(uint *)((long)local_108 + (long)local_c0 * 4) = uVar56;
                  uVar56 = uVar56 + 2;
                  local_230 = (BYTE *)0x0;
                  pBVar28 = (BYTE *)0x0;
                  do {
                    bVar63 = iVar30 == 0;
                    iVar30 = iVar30 + -1;
                    if ((bVar63) || (uVar48 = (uint)uVar21, uVar48 < uVar50)) break;
                    pBVar31 = local_230;
                    if (pBVar28 < local_230) {
                      pBVar31 = pBVar28;
                    }
                    puVar58 = (ulong *)((long)puVar37 + (long)pBVar31);
                    puVar22 = (ulong *)(pBVar46 + (long)(pBVar31 + uVar21));
                    puVar33 = puVar58;
                    if (puVar58 < puVar1) {
                      uVar38 = *puVar58 ^ *puVar22;
                      uVar39 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      pBVar54 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                      if (*puVar22 == *puVar58) {
                        do {
                          puVar33 = puVar33 + 1;
                          puVar22 = puVar22 + 1;
                          if (puVar1 <= puVar33) goto LAB_00705e26;
                          uVar38 = *puVar33 ^ *puVar22;
                          uVar39 = 0;
                          if (uVar38 != 0) {
                            for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                            }
                          }
                          pBVar54 = (BYTE *)((long)puVar33 +
                                            ((uVar39 >> 3 & 0x1fffffff) - (long)puVar58));
                        } while (*puVar22 == *puVar33);
                      }
                    }
                    else {
LAB_00705e26:
                      if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                        puVar33 = (ulong *)((long)puVar33 + 4);
                        puVar22 = (ulong *)((long)puVar22 + 4);
                      }
                      if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                        puVar33 = (ulong *)((long)puVar33 + 2);
                        puVar22 = (ulong *)((long)puVar22 + 2);
                      }
                      if (puVar33 < puVar42) {
                        puVar33 = (ulong *)((long)puVar33 +
                                           (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                      }
                      pBVar54 = (BYTE *)((long)puVar33 - (long)puVar58);
                    }
                    pBVar54 = pBVar54 + (long)pBVar31;
                    if (local_210 < pBVar54) {
                      iVar41 = uVar48 + (U32)pBVar54;
                      if (pBVar54 <= (BYTE *)(ulong)(iVar24 - uVar48)) {
                        iVar41 = iVar24;
                      }
                      pZVar8[(ulong)local_1a0 & 0xffffffff].off = uVar56 - uVar48;
                      pZVar8[(ulong)local_1a0 & 0xffffffff].len = (U32)pBVar54;
                      local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,(uint)local_1a0 + 1);
                      iVar24 = iVar41;
                      local_210 = pBVar54;
                      if ((pBVar54 < (BYTE *)0x1001) &&
                         ((ulong *)((long)puVar37 + (long)pBVar54) != puVar42)) goto LAB_00705ee6;
LAB_00705f6f:
                      bVar63 = false;
                      pBVar54 = pBVar28;
                    }
                    else {
LAB_00705ee6:
                      puVar58 = (ulong *)((long)local_180 + (ulong)((uVar48 & uVar35) * 2) * 4);
                      if (*(byte *)((long)puVar37 + (long)pBVar54) <=
                          pBVar46[(long)(pBVar54 + uVar21)]) {
                        *(uint *)local_1b8 = uVar48;
                        local_230 = pBVar54;
                        local_1b8 = puVar58;
                        if (uVar45 < uVar48) goto LAB_00705f41;
                        local_1b8 = &local_148;
                        goto LAB_00705f6f;
                      }
                      *(uint *)local_1d8 = uVar48;
                      if (uVar45 < uVar48) {
                        puVar58 = (ulong *)((long)puVar58 + 4);
                        pBVar28 = pBVar54;
                        local_1d8 = puVar58;
LAB_00705f41:
                        uVar21 = (ulong)(uint)*puVar58;
                        bVar63 = true;
                        pBVar54 = pBVar28;
                      }
                      else {
                        bVar63 = false;
                        local_1d8 = &local_148;
                      }
                    }
                    pBVar28 = pBVar54;
                  } while (bVar63);
                  *(uint *)local_1b8 = 0;
                  *(uint *)local_1d8 = 0;
                  ms->nextToUpdate = iVar24 - 8;
                  uVar48 = (uint)local_1a0;
                }
                local_190 = (void *)(ulong)uVar56;
                uVar29 = uVar48;
                goto LAB_00706df6;
              }
              if (UVar18 != 5) {
                if (UVar18 == 3) {
                  uVar21 = (ulong)(uVar48 != 0);
                  uVar29 = (ms->cParams).targetLength;
                  if (0xffe < uVar29) {
                    uVar29 = 0xfff;
                  }
                  local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,uVar29);
                  local_1b8 = (ulong *)(ms->window).base;
                  uVar56 = iVar25 - (int)local_1b8;
                  local_190 = (void *)(ulong)uVar56;
                  local_c0 = (ulong *)(ulong)((uint)*puVar37 * -0x61c8864f >>
                                             (-(char)(ms->cParams).hashLog & 0x1fU));
                  uVar45 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                  iVar24 = uVar56 - uVar45;
                  local_1a0 = (ulong *)((ulong)local_1a0._4_4_ << 0x20);
                  if (uVar56 < uVar45) {
                    iVar24 = 0;
                  }
                  local_180 = (ulong *)CONCAT44(local_180._4_4_,iVar24);
                  local_138 = ms->chainTable;
                  uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                  uVar35 = (ms->window).lowLimit;
                  uVar50 = uVar56 - uVar36;
                  if (uVar56 - uVar35 <= uVar36) {
                    uVar50 = uVar35;
                  }
                  if (ms->loadedDictEnd != 0) {
                    uVar50 = uVar35;
                  }
                  uVar35 = uVar50 + (uVar50 == 0);
                  local_198 = (ulong *)CONCAT44(local_198._4_4_,uVar45);
                  uVar39 = (ulong)((uVar45 & uVar56) * 2);
                  local_1e0 = (ulong *)(local_138 + uVar39);
                  local_1d8 = (ulong *)(local_138 + uVar39 + 1);
                  local_178 = (BYTE *)CONCAT44(local_178._4_4_,
                                               1 << ((byte)(ms->cParams).searchLog & 0x1f));
                  UVar18 = (ms->window).dictLimit;
                  local_158 = (ulong *)-uVar21;
                  bVar63 = true;
                  local_108 = (ulong *)ms->hashTable;
                  local_e0 = (U32 *)(ulong)*(uint *)((long)local_108 + (long)local_c0 * 4);
                  iVar24 = uVar56 + 9;
                  uVar39 = uVar21 + 3;
                  puVar58 = (ulong *)((long)puVar37 + 3);
                  local_100 = (ulong *)((long)puVar37 + 0xb);
                  local_210 = local_120;
                  do {
                    if (uVar21 == 3) {
                      UVar17 = pZVar49->rep[0] - 1;
                    }
                    else {
                      UVar17 = pZVar49->rep[uVar21];
                    }
                    pBVar46 = (BYTE *)0x0;
                    if (((UVar17 - 1 < uVar56 - UVar18) && (uVar50 <= uVar56 - UVar17)) &&
                       (((*(uint *)((long)puVar37 - (ulong)UVar17) ^ (uint)*puVar37) & 0xffffff) ==
                        0)) {
                      puVar33 = (ulong *)((long)puVar58 - (ulong)UVar17);
                      puVar22 = puVar58;
                      if (puVar58 < puVar1) {
                        uVar43 = *puVar58 ^ *puVar33;
                        uVar38 = 0;
                        if (uVar43 != 0) {
                          for (; (uVar43 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                          }
                        }
                        uVar38 = uVar38 >> 3 & 0x1fffffff;
                        iVar30 = (int)uVar38;
                        puVar22 = local_100;
                        if (*puVar33 == *puVar58) {
                          do {
                            puVar33 = puVar33 + 1;
                            if (puVar1 <= puVar22) goto LAB_0070586c;
                            uVar43 = *puVar33;
                            uVar10 = *puVar22;
                            uVar11 = 0;
                            if ((uVar10 ^ uVar43) != 0) {
                              for (; ((uVar10 ^ uVar43) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                              }
                            }
                            puVar51 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar22);
                            puVar22 = puVar22 + 1;
                            if (uVar43 != uVar10) {
                              uVar38 = (long)puVar51 - (long)puVar58;
                              puVar22 = puVar51;
                            }
                            iVar30 = (int)uVar38;
                          } while (uVar43 == uVar10);
                        }
                      }
                      else {
LAB_0070586c:
                        if ((puVar22 < local_130) && ((uint)*puVar33 == (uint)*puVar22)) {
                          puVar22 = (ulong *)((long)puVar22 + 4);
                          puVar33 = (ulong *)((long)puVar33 + 4);
                        }
                        if ((puVar22 < local_188) && ((short)*puVar33 == (short)*puVar22)) {
                          puVar22 = (ulong *)((long)puVar22 + 2);
                          puVar33 = (ulong *)((long)puVar33 + 2);
                        }
                        if (puVar22 < puVar42) {
                          puVar22 = (ulong *)((long)puVar22 +
                                             (ulong)((BYTE)*puVar33 == (BYTE)*puVar22));
                        }
                        iVar30 = (int)puVar22 - (int)puVar58;
                      }
                      pBVar46 = (BYTE *)(ulong)(iVar30 + 3);
                    }
                    uVar45 = (uint)pBVar46;
                    bVar32 = true;
                    if (local_210 < pBVar46) {
                      pZVar8[(ulong)local_1a0 & 0xffffffff].off = (int)local_158 + (int)uVar21;
                      uVar36 = (uint)local_1a0 + 1;
                      pZVar8[(ulong)local_1a0 & 0xffffffff].len = uVar45;
                      bVar64 = (ulong *)((long)puVar37 + (long)pBVar46) != puVar42;
                      bVar32 = bVar64 && uVar45 <= uVar29;
                      local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar36);
                      local_210 = pBVar46;
                      if (!bVar64 || uVar45 > uVar29) {
                        uVar48 = uVar36;
                      }
                    }
                    if (!bVar32) break;
                    uVar21 = uVar21 + 1;
                    bVar63 = uVar21 < uVar39;
                  } while (bVar63);
                  uVar29 = uVar48;
                  if (!bVar63) {
                    if (local_210 < (BYTE *)0x3) {
                      UVar18 = ZSTD_insertAndFindFirstIndexHash3
                                         (ms,(U32 *)local_1c4,(BYTE *)puVar37);
                      bVar63 = true;
                      if (UVar18 < uVar35) {
LAB_00706b48:
                        uVar56 = (uint)local_1a0;
                      }
                      else {
                        uVar29 = (int)local_190 - UVar18;
                        if (0x3ffff < uVar29) goto LAB_00706b48;
                        puVar22 = (ulong *)((ulong)UVar18 + (long)local_1b8);
                        puVar58 = puVar37;
                        if (puVar37 < puVar1) {
                          uVar39 = *puVar37 ^ *puVar22;
                          uVar21 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                            }
                          }
                          pBVar46 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                          if (*puVar22 == *puVar37) {
                            do {
                              puVar58 = puVar58 + 1;
                              puVar22 = puVar22 + 1;
                              if (puVar1 <= puVar58) goto LAB_00706aa7;
                              uVar39 = *puVar58 ^ *puVar22;
                              uVar21 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                }
                              }
                              pBVar46 = (BYTE *)((long)puVar58 +
                                                ((uVar21 >> 3 & 0x1fffffff) - (long)puVar37));
                            } while (*puVar22 == *puVar58);
                          }
                        }
                        else {
LAB_00706aa7:
                          if ((puVar58 < local_130) && ((uint)*puVar22 == (uint)*puVar58)) {
                            puVar58 = (ulong *)((long)puVar58 + 4);
                            puVar22 = (ulong *)((long)puVar22 + 4);
                          }
                          if ((puVar58 < local_188) && ((short)*puVar22 == (short)*puVar58)) {
                            puVar58 = (ulong *)((long)puVar58 + 2);
                            puVar22 = (ulong *)((long)puVar22 + 2);
                          }
                          if (puVar58 < puVar42) {
                            puVar58 = (ulong *)((long)puVar58 +
                                               (ulong)((BYTE)*puVar22 == (BYTE)*puVar58));
                          }
                          pBVar46 = (BYTE *)((long)puVar58 - (long)puVar37);
                        }
                        if (pBVar46 < (BYTE *)0x3) goto LAB_00706b48;
                        pZVar8->off = uVar29 + 2;
                        pZVar8->len = (U32)pBVar46;
                        local_210 = pBVar46;
                        if (((BYTE *)((ulong)local_1b0 & 0xffffffff) < pBVar46) ||
                           (uVar56 = 1, (ulong *)((long)puVar37 + (long)pBVar46) == puVar42)) {
                          ms->nextToUpdate = (int)local_190 + 1;
                          bVar63 = false;
                          uVar48 = 1;
                          uVar56 = 1;
                        }
                      }
                      uVar29 = uVar48;
                      if (!bVar63) goto LAB_00706df6;
                    }
                    else {
                      uVar56 = (uint)local_1a0;
                    }
                    *(uint *)((long)local_108 + (long)local_c0 * 4) = (uint)local_190;
                    uVar48 = (uint)local_190 + 2;
                    local_190 = (void *)(ulong)uVar48;
                    pBVar28 = (BYTE *)0x0;
                    pBVar46 = (BYTE *)0x0;
                    pUVar47 = local_e0;
                    do {
                      if (((uint)local_178 == 0) || (uVar29 = (uint)pUVar47, uVar29 < uVar35))
                      break;
                      local_178 = (BYTE *)CONCAT44(local_178._4_4_,(uint)local_178 + -1);
                      pBVar31 = pBVar28;
                      if (pBVar46 < pBVar28) {
                        pBVar31 = pBVar46;
                      }
                      puVar58 = (ulong *)((long)puVar37 + (long)pBVar31);
                      puVar22 = (ulong *)((long)local_1b8 +
                                         (long)(pBVar31 + ((ulong)pUVar47 & 0xffffffff)));
                      puVar33 = puVar58;
                      if (puVar58 < puVar1) {
                        uVar39 = *puVar58 ^ *puVar22;
                        uVar21 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        pBVar54 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                        if (*puVar22 == *puVar58) {
                          do {
                            puVar33 = puVar33 + 1;
                            puVar22 = puVar22 + 1;
                            if (puVar1 <= puVar33) goto LAB_00706c4a;
                            uVar39 = *puVar33 ^ *puVar22;
                            uVar21 = 0;
                            if (uVar39 != 0) {
                              for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                              }
                            }
                            pBVar54 = (BYTE *)((long)puVar33 +
                                              ((uVar21 >> 3 & 0x1fffffff) - (long)puVar58));
                          } while (*puVar22 == *puVar33);
                        }
                      }
                      else {
LAB_00706c4a:
                        if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 4);
                          puVar22 = (ulong *)((long)puVar22 + 4);
                        }
                        if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 2);
                          puVar22 = (ulong *)((long)puVar22 + 2);
                        }
                        if (puVar33 < puVar42) {
                          puVar33 = (ulong *)((long)puVar33 +
                                             (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                        }
                        pBVar54 = (BYTE *)((long)puVar33 - (long)puVar58);
                      }
                      pBVar54 = pBVar54 + (long)pBVar31;
                      if (local_210 < pBVar54) {
                        iVar30 = uVar29 + (U32)pBVar54;
                        if (pBVar54 <= (BYTE *)(ulong)(iVar24 - uVar29)) {
                          iVar30 = iVar24;
                        }
                        pZVar8[uVar56].off = uVar48 - uVar29;
                        pZVar8[uVar56].len = (U32)pBVar54;
                        uVar56 = uVar56 + 1;
                        bVar63 = false;
                        iVar24 = iVar30;
                        local_210 = pBVar54;
                        if ((pBVar54 < (BYTE *)0x1001) &&
                           ((ulong *)((long)puVar37 + (long)pBVar54) != puVar42)) goto LAB_00706d20;
                      }
                      else {
LAB_00706d20:
                        puVar58 = (ulong *)(local_138 + (uVar29 & (uint)local_198) * 2);
                        if (*(byte *)((long)local_1b8 +
                                     (long)(pBVar54 + ((ulong)pUVar47 & 0xffffffff))) <
                            *(byte *)((long)puVar37 + (long)pBVar54)) {
                          *(uint *)local_1e0 = uVar29;
                          pBVar46 = pBVar54;
                          if ((uint)local_180 < uVar29) {
                            puVar58 = (ulong *)((long)puVar58 + 4);
                            pBVar54 = pBVar28;
                            local_1e0 = puVar58;
LAB_00706d81:
                            pUVar47 = (U32 *)(ulong)(uint)*puVar58;
                            bVar63 = true;
                            pBVar28 = pBVar54;
                          }
                          else {
                            bVar63 = false;
                            local_1e0 = &local_148;
                          }
                        }
                        else {
                          *(uint *)local_1d8 = uVar29;
                          local_1d8 = puVar58;
                          if ((uint)local_180 < uVar29) goto LAB_00706d81;
                          bVar63 = false;
                          local_1d8 = &local_148;
                          pBVar28 = pBVar54;
                        }
                      }
                    } while (bVar63);
                    *(uint *)local_1d8 = 0;
                    *(uint *)local_1e0 = 0;
                    ms->nextToUpdate = iVar24 - 8;
                    uVar29 = uVar56;
                  }
                }
                else {
                  puVar58 = (ulong *)(ulong)(uVar48 != 0);
                  uVar29 = (ms->cParams).targetLength;
                  if (0xffe < uVar29) {
                    uVar29 = 0xfff;
                  }
                  local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar29);
                  local_1b8 = (ulong *)(ms->window).base;
                  uVar45 = iVar25 - (int)local_1b8;
                  local_108 = (ulong *)(ulong)((uint)*puVar37 * -0x61c8864f >>
                                              (-(char)(ms->cParams).hashLog & 0x1fU));
                  uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                  uVar56 = uVar45 - uVar35;
                  local_1a0 = (ulong *)((ulong)local_1a0._4_4_ << 0x20);
                  if (uVar45 < uVar35) {
                    uVar56 = 0;
                  }
                  local_180 = (ulong *)CONCAT44(local_180._4_4_,uVar56);
                  local_138 = ms->chainTable;
                  uVar50 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                  UVar18 = (ms->window).lowLimit;
                  UVar17 = uVar45 - uVar50;
                  if (uVar45 - UVar18 <= uVar50) {
                    UVar17 = UVar18;
                  }
                  if (ms->loadedDictEnd != 0) {
                    UVar17 = UVar18;
                  }
                  local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,UVar17);
                  local_198 = (ulong *)CONCAT44(local_198._4_4_,uVar35);
                  uVar21 = (ulong)((uVar35 & uVar45) * 2);
                  local_1e0 = (ulong *)(local_138 + uVar21);
                  local_1d8 = (ulong *)(local_138 + uVar21 + 1);
                  iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                  uVar50 = uVar45 - (ms->window).dictLimit;
                  local_158 = (ulong *)-(long)puVar58;
                  bVar63 = true;
                  local_d8 = ms->hashTable;
                  uVar21 = (ulong)local_d8[(long)local_108];
                  local_190 = (void *)CONCAT44(local_190._4_4_,uVar45 + 9);
                  local_e0 = (U32 *)((long)puVar58 + 3);
                  puVar22 = (ulong *)((long)puVar37 + 4);
                  local_c0 = (ulong *)((long)puVar37 + 0xc);
                  local_210 = local_120;
                  local_100 = (ulong *)CONCAT44(local_100._4_4_,uVar50);
                  do {
                    if (puVar58 == (ulong *)0x3) {
                      uVar36 = pZVar49->rep[0] - 1;
                    }
                    else {
                      uVar36 = pZVar49->rep[(long)puVar58];
                    }
                    pBVar46 = (BYTE *)0x0;
                    if (((uVar36 - 1 < uVar50) && (UVar17 <= uVar45 - uVar36)) &&
                       ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)uVar36))) {
                      puVar51 = (ulong *)((long)puVar22 - (ulong)uVar36);
                      puVar33 = puVar22;
                      if (puVar22 < puVar1) {
                        uVar38 = *puVar22 ^ *puVar51;
                        uVar39 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                        iVar30 = (int)uVar39;
                        puVar33 = local_c0;
                        if (*puVar51 == *puVar22) {
                          do {
                            puVar51 = puVar51 + 1;
                            if (puVar1 <= puVar33) goto LAB_00706711;
                            uVar38 = *puVar51;
                            uVar43 = *puVar33;
                            uVar10 = 0;
                            if ((uVar43 ^ uVar38) != 0) {
                              for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                              }
                            }
                            puVar52 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar33);
                            puVar33 = puVar33 + 1;
                            if (uVar38 != uVar43) {
                              uVar39 = (long)puVar52 - (long)puVar22;
                              puVar33 = puVar52;
                            }
                            iVar30 = (int)uVar39;
                          } while (uVar38 == uVar43);
                        }
                      }
                      else {
LAB_00706711:
                        if ((puVar33 < local_130) && ((uint)*puVar51 == (uint)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 4);
                          puVar51 = (ulong *)((long)puVar51 + 4);
                        }
                        if ((puVar33 < local_188) && ((short)*puVar51 == (short)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 2);
                          puVar51 = (ulong *)((long)puVar51 + 2);
                        }
                        if (puVar33 < puVar42) {
                          puVar33 = (ulong *)((long)puVar33 +
                                             (ulong)((BYTE)*puVar51 == (BYTE)*puVar33));
                        }
                        iVar30 = (int)puVar33 - (int)puVar22;
                      }
                      pBVar46 = (BYTE *)(ulong)(iVar30 + 4);
                    }
                    uVar36 = (uint)pBVar46;
                    bVar32 = true;
                    if (local_210 < pBVar46) {
                      pZVar8[(ulong)local_1a0 & 0xffffffff].off = (int)puVar58 + (int)local_158;
                      uVar61 = (uint)local_1a0 + 1;
                      pZVar8[(ulong)local_1a0 & 0xffffffff].len = uVar36;
                      bVar64 = (ulong *)((long)puVar37 + (long)pBVar46) != puVar42;
                      bVar32 = bVar64 && uVar36 <= uVar29;
                      local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar61);
                      local_210 = pBVar46;
                      if (!bVar64 || uVar36 > uVar29) {
                        uVar48 = uVar61;
                      }
                    }
                    if (!bVar32) break;
                    puVar58 = (ulong *)((long)puVar58 + 1);
                    bVar63 = puVar58 < local_e0;
                  } while (bVar63);
                  uVar29 = uVar48;
                  if (!bVar63) {
                    local_d8[(long)local_108] = uVar45;
                    local_230 = (BYTE *)0x0;
                    pBVar46 = (BYTE *)0x0;
                    do {
                      bVar63 = iVar24 == 0;
                      iVar24 = iVar24 + -1;
                      if ((bVar63) || (uVar48 = (uint)uVar21, uVar48 < UVar17 + (UVar17 == 0)))
                      goto LAB_00706a5b;
                      pBVar28 = local_230;
                      if (pBVar46 < local_230) {
                        pBVar28 = pBVar46;
                      }
                      puVar58 = (ulong *)((long)puVar37 + (long)pBVar28);
                      puVar22 = (ulong *)((long)local_1b8 + (long)(pBVar28 + uVar21));
                      puVar33 = puVar58;
                      if (puVar58 < puVar1) {
                        uVar38 = *puVar58 ^ *puVar22;
                        uVar39 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        pBVar31 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                        if (*puVar22 == *puVar58) {
                          do {
                            puVar33 = puVar33 + 1;
                            puVar22 = puVar22 + 1;
                            if (puVar1 <= puVar33) goto LAB_007068c5;
                            uVar38 = *puVar33 ^ *puVar22;
                            uVar39 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                              }
                            }
                            pBVar31 = (BYTE *)((long)puVar33 +
                                              ((uVar39 >> 3 & 0x1fffffff) - (long)puVar58));
                          } while (*puVar22 == *puVar33);
                        }
                      }
                      else {
LAB_007068c5:
                        if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 4);
                          puVar22 = (ulong *)((long)puVar22 + 4);
                        }
                        if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                          puVar33 = (ulong *)((long)puVar33 + 2);
                          puVar22 = (ulong *)((long)puVar22 + 2);
                        }
                        if (puVar33 < puVar42) {
                          puVar33 = (ulong *)((long)puVar33 +
                                             (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                        }
                        pBVar31 = (BYTE *)((long)puVar33 - (long)puVar58);
                      }
                      pBVar31 = pBVar31 + (long)pBVar28;
                      iVar30 = (int)local_190;
                      if (local_210 < pBVar31) {
                        iVar30 = uVar48 + (U32)pBVar31;
                        if (pBVar31 <= (BYTE *)(ulong)((int)local_190 - uVar48)) {
                          iVar30 = (int)local_190;
                        }
                        pZVar8[(ulong)local_1a0 & 0xffffffff].off = (uVar45 + 2) - uVar48;
                        pZVar8[(ulong)local_1a0 & 0xffffffff].len = (U32)pBVar31;
                        local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,(uint)local_1a0 + 1);
                        local_210 = pBVar31;
                        if ((pBVar31 < (BYTE *)0x1001) &&
                           ((ulong *)((long)puVar37 + (long)pBVar31) != puVar42)) goto LAB_00706984;
LAB_00706a07:
                        bVar63 = false;
                        pBVar31 = pBVar46;
                      }
                      else {
LAB_00706984:
                        puVar58 = (ulong *)(local_138 + (uVar48 & uVar35) * 2);
                        if (*(byte *)((long)puVar37 + (long)pBVar31) <=
                            *(byte *)((long)local_1b8 + (long)(pBVar31 + uVar21))) {
                          *(uint *)local_1d8 = uVar48;
                          local_230 = pBVar31;
                          local_1d8 = puVar58;
                          if (uVar56 < uVar48) goto LAB_007069dc;
                          local_1d8 = &local_148;
                          goto LAB_00706a07;
                        }
                        *(uint *)local_1e0 = uVar48;
                        if (uVar56 < uVar48) {
                          puVar58 = (ulong *)((long)puVar58 + 4);
                          pBVar46 = pBVar31;
                          local_1e0 = puVar58;
LAB_007069dc:
                          uVar21 = (ulong)(uint)*puVar58;
                          bVar63 = true;
                          pBVar31 = pBVar46;
                        }
                        else {
                          bVar63 = false;
                          local_1e0 = &local_148;
                        }
                      }
                      local_190 = (void *)CONCAT44(local_190._4_4_,iVar30);
                      pBVar46 = pBVar31;
                    } while (bVar63);
                    goto LAB_00706a63;
                  }
                }
                goto LAB_00706df6;
              }
              puVar58 = (ulong *)(ulong)(uVar48 != 0);
              uVar29 = (ms->cParams).targetLength;
              if (0xffe < uVar29) {
                uVar29 = 0xfff;
              }
              local_178 = (BYTE *)CONCAT44(local_178._4_4_,uVar29);
              local_1b8 = (ulong *)(ms->window).base;
              uVar45 = iVar25 - (int)local_1b8;
              local_108 = (ulong *)(*puVar37 * -0x30e4432345000000 >>
                                   (-(char)(ms->cParams).hashLog & 0x3fU));
              uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar56 = uVar45 - uVar35;
              local_1a0 = (ulong *)((ulong)local_1a0._4_4_ << 0x20);
              if (uVar45 < uVar35) {
                uVar56 = 0;
              }
              local_180 = (ulong *)CONCAT44(local_180._4_4_,uVar56);
              local_138 = ms->chainTable;
              uVar50 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar18 = (ms->window).lowLimit;
              UVar17 = uVar45 - uVar50;
              if (uVar45 - UVar18 <= uVar50) {
                UVar17 = UVar18;
              }
              if (ms->loadedDictEnd != 0) {
                UVar17 = UVar18;
              }
              local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,UVar17);
              local_198 = (ulong *)CONCAT44(local_198._4_4_,uVar35);
              uVar21 = (ulong)((uVar35 & uVar45) * 2);
              local_1e0 = (ulong *)(local_138 + uVar21);
              local_1d8 = (ulong *)(local_138 + uVar21 + 1);
              iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              uVar50 = uVar45 - (ms->window).dictLimit;
              local_158 = (ulong *)-(long)puVar58;
              bVar63 = true;
              local_d8 = ms->hashTable;
              uVar21 = (ulong)local_d8[(long)local_108];
              local_190 = (void *)CONCAT44(local_190._4_4_,uVar45 + 9);
              local_e0 = (U32 *)((long)puVar58 + 3);
              puVar22 = (ulong *)((long)puVar37 + 4);
              local_c0 = (ulong *)((long)puVar37 + 0xc);
              local_210 = local_120;
              local_100 = (ulong *)CONCAT44(local_100._4_4_,uVar50);
              do {
                if (puVar58 == (ulong *)0x3) {
                  uVar36 = pZVar49->rep[0] - 1;
                }
                else {
                  uVar36 = pZVar49->rep[(long)puVar58];
                }
                pBVar46 = (BYTE *)0x0;
                if (((uVar36 - 1 < uVar50) && (UVar17 <= uVar45 - uVar36)) &&
                   ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)uVar36))) {
                  puVar51 = (ulong *)((long)puVar22 - (ulong)uVar36);
                  puVar33 = puVar22;
                  if (puVar22 < puVar1) {
                    uVar38 = *puVar22 ^ *puVar51;
                    uVar39 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    uVar39 = uVar39 >> 3 & 0x1fffffff;
                    iVar30 = (int)uVar39;
                    puVar33 = local_c0;
                    if (*puVar51 == *puVar22) {
                      do {
                        puVar51 = puVar51 + 1;
                        if (puVar1 <= puVar33) goto LAB_007061ca;
                        uVar38 = *puVar51;
                        uVar43 = *puVar33;
                        uVar10 = 0;
                        if ((uVar43 ^ uVar38) != 0) {
                          for (; ((uVar43 ^ uVar38) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                          }
                        }
                        puVar52 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar33);
                        puVar33 = puVar33 + 1;
                        if (uVar38 != uVar43) {
                          uVar39 = (long)puVar52 - (long)puVar22;
                          puVar33 = puVar52;
                        }
                        iVar30 = (int)uVar39;
                      } while (uVar38 == uVar43);
                    }
                  }
                  else {
LAB_007061ca:
                    if ((puVar33 < local_130) && ((uint)*puVar51 == (uint)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar51 = (ulong *)((long)puVar51 + 4);
                    }
                    if ((puVar33 < local_188) && ((short)*puVar51 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar51 = (ulong *)((long)puVar51 + 2);
                    }
                    if (puVar33 < puVar42) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar33))
                      ;
                    }
                    iVar30 = (int)puVar33 - (int)puVar22;
                  }
                  pBVar46 = (BYTE *)(ulong)(iVar30 + 4);
                }
                uVar36 = (uint)pBVar46;
                bVar32 = true;
                if (local_210 < pBVar46) {
                  pZVar8[(ulong)local_1a0 & 0xffffffff].off = (int)puVar58 + (int)local_158;
                  uVar61 = (uint)local_1a0 + 1;
                  pZVar8[(ulong)local_1a0 & 0xffffffff].len = uVar36;
                  bVar64 = (ulong *)((long)puVar37 + (long)pBVar46) != puVar42;
                  bVar32 = bVar64 && uVar36 <= uVar29;
                  local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar61);
                  local_210 = pBVar46;
                  if (!bVar64 || uVar36 > uVar29) {
                    uVar48 = uVar61;
                  }
                }
                if (!bVar32) break;
                puVar58 = (ulong *)((long)puVar58 + 1);
                bVar63 = puVar58 < local_e0;
              } while (bVar63);
              uVar29 = uVar48;
              if (bVar63) goto LAB_00706df6;
              local_d8[(long)local_108] = uVar45;
              local_230 = (BYTE *)0x0;
              pBVar46 = (BYTE *)0x0;
              do {
                bVar63 = iVar24 == 0;
                iVar24 = iVar24 + -1;
                if ((bVar63) || (uVar48 = (uint)uVar21, uVar48 < UVar17 + (UVar17 == 0)))
                goto LAB_00706a5b;
                pBVar28 = local_230;
                if (pBVar46 < local_230) {
                  pBVar28 = pBVar46;
                }
                puVar58 = (ulong *)((long)puVar37 + (long)pBVar28);
                puVar22 = (ulong *)((long)local_1b8 + (long)(pBVar28 + uVar21));
                puVar33 = puVar58;
                if (puVar58 < puVar1) {
                  uVar38 = *puVar58 ^ *puVar22;
                  uVar39 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  pBVar31 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                  if (*puVar22 == *puVar58) {
                    do {
                      puVar33 = puVar33 + 1;
                      puVar22 = puVar22 + 1;
                      if (puVar1 <= puVar33) goto LAB_0070637e;
                      uVar38 = *puVar33 ^ *puVar22;
                      uVar39 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      pBVar31 = (BYTE *)((long)puVar33 +
                                        ((uVar39 >> 3 & 0x1fffffff) - (long)puVar58));
                    } while (*puVar22 == *puVar33);
                  }
                }
                else {
LAB_0070637e:
                  if ((puVar33 < local_130) && ((uint)*puVar22 == (uint)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 4);
                    puVar22 = (ulong *)((long)puVar22 + 4);
                  }
                  if ((puVar33 < local_188) && ((short)*puVar22 == (short)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 2);
                    puVar22 = (ulong *)((long)puVar22 + 2);
                  }
                  if (puVar33 < puVar42) {
                    puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar33));
                  }
                  pBVar31 = (BYTE *)((long)puVar33 - (long)puVar58);
                }
                pBVar31 = pBVar31 + (long)pBVar28;
                iVar30 = (int)local_190;
                if (local_210 < pBVar31) {
                  iVar30 = uVar48 + (U32)pBVar31;
                  if (pBVar31 <= (BYTE *)(ulong)((int)local_190 - uVar48)) {
                    iVar30 = (int)local_190;
                  }
                  pZVar8[(ulong)local_1a0 & 0xffffffff].off = (uVar45 + 2) - uVar48;
                  pZVar8[(ulong)local_1a0 & 0xffffffff].len = (U32)pBVar31;
                  local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,(uint)local_1a0 + 1);
                  local_210 = pBVar31;
                  if ((pBVar31 < (BYTE *)0x1001) &&
                     ((ulong *)((long)puVar37 + (long)pBVar31) != puVar42)) goto LAB_0070643d;
LAB_007064c0:
                  bVar63 = false;
                  pBVar31 = pBVar46;
                }
                else {
LAB_0070643d:
                  puVar58 = (ulong *)(local_138 + (uVar48 & uVar35) * 2);
                  if (*(byte *)((long)puVar37 + (long)pBVar31) <=
                      *(byte *)((long)local_1b8 + (long)(pBVar31 + uVar21))) {
                    *(uint *)local_1d8 = uVar48;
                    local_230 = pBVar31;
                    local_1d8 = puVar58;
                    if (uVar56 < uVar48) goto LAB_00706495;
                    local_1d8 = &local_148;
                    goto LAB_007064c0;
                  }
                  *(uint *)local_1e0 = uVar48;
                  if (uVar56 < uVar48) {
                    puVar58 = (ulong *)((long)puVar58 + 4);
                    pBVar46 = pBVar31;
                    local_1e0 = puVar58;
LAB_00706495:
                    uVar21 = (ulong)(uint)*puVar58;
                    bVar63 = true;
                    pBVar31 = pBVar46;
                  }
                  else {
                    bVar63 = false;
                    local_1e0 = &local_148;
                  }
                }
                local_190 = (void *)CONCAT44(local_190._4_4_,iVar30);
                pBVar46 = pBVar31;
              } while (bVar63);
              goto LAB_00706a63;
            }
            goto LAB_00706df6;
          }
          goto LAB_007070f0;
        }
LAB_0070712a:
        uVar21 = uVar20 & 0xffffffff;
        local_a4 = pZVar49[uVar21].price;
        local_160 = (ZSTD_optimal_t *)(ulong)pZVar49[uVar21].off;
        local_c8 = (ZSTD_optimal_t *)(ulong)pZVar49[uVar21].mlen;
        local_d0 = (ZSTD_optimal_t *)(ulong)pZVar49[uVar21].litlen;
        local_88 = pZVar49[uVar21].rep[2];
        local_90 = *(undefined8 *)pZVar49[uVar21].rep;
        uVar48 = pZVar49[uVar21].litlen + pZVar49[uVar21].mlen;
        local_150 = (ZSTD_optimal_t *)(ulong)((uint)uVar20 - uVar48);
        if ((uint)uVar20 < uVar48) {
          local_150 = (ZSTD_optimal_t *)0x0;
        }
        goto LAB_00707186;
      }
LAB_007074f2:
    } while (local_220 < stack0xfffffffffffffe40);
  }
  return (long)puVar42 - (long)local_1a8;
LAB_00706a5b:
  iVar30 = (int)local_190;
LAB_00706a63:
  *(uint *)local_1d8 = 0;
  *(uint *)local_1e0 = 0;
  ms->nextToUpdate = iVar30 - 8;
  uVar29 = (uint)local_1a0;
LAB_00706df6:
  local_148 = CONCAT44(local_148._4_4_,uVar29);
  ZSTD_optLdm_processMatchCandidate
            (&local_68,pZVar8,(U32 *)&local_148,iVar25 - (int)local_b0,(int)puVar42 - iVar25);
  if ((int)local_148 == 0) {
    uVar48 = 0x13;
  }
  else {
    uVar29 = pZVar8[(int)local_148 - 1U].len;
    pZVar26 = (ZSTD_optimal_t *)(ulong)uVar29;
    bVar63 = 0xfff < (int)local_150 + uVar29;
    uVar48 = 0;
    if (bVar63 || (uint)local_b8 < uVar29) {
      UVar18 = 0;
      if (pZVar49->mlen == 0) {
        UVar18 = pZVar49->litlen;
      }
      local_160 = (ZSTD_optimal_t *)(ulong)pZVar8[(int)local_148 - 1U].off;
      uVar48 = (int)local_150 - UVar18;
      uVar20 = (ulong)(uVar29 + (U32)local_168 + uVar48);
      local_150 = (ZSTD_optimal_t *)(ulong)uVar48;
      if (0x1000 < uVar48) {
        local_150 = (ZSTD_optimal_t *)0x0;
      }
      uVar48 = 7;
      local_d0 = (ZSTD_optimal_t *)((ulong)local_168 & 0xffffffff);
    }
    else {
      pZVar26 = (ZSTD_optimal_t *)((ulong)local_c8 & 0xffffffff);
    }
    local_c8 = pZVar26;
    if (!bVar63 && (uint)local_b8 >= uVar29) {
      uVar21 = 0;
      do {
        uVar48 = (uint)local_78;
        if (uVar21 != 0) {
          uVar48 = pZVar8[uVar21 - 1].len + 1;
        }
        uVar29 = pZVar8[uVar21].len;
        if (uVar48 <= uVar29) {
          UVar18 = pZVar8[uVar21].off;
          uVar56 = UVar18 + 1;
          uVar45 = 0x1f;
          if (uVar56 != 0) {
            for (; uVar56 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          ZVar6 = (ms->opt).priceType;
          do {
            if (ZVar6 == zop_predef) {
              uVar56 = uVar29 - 2;
              iVar25 = 0x1f;
              if (uVar56 != 0) {
                for (; uVar56 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                }
              }
              iVar25 = (uVar56 * 0x100 >> ((byte)iVar25 & 0x1f)) + (iVar25 + uVar45) * 0x100 +
                       0x1000;
            }
            else {
              uVar35 = uVar29 - 3;
              uVar56 = (ms->opt).offCodeFreq[uVar45] + 1;
              iVar25 = 0x1f;
              if (uVar56 != 0) {
                for (; uVar56 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                }
              }
              if (uVar35 < 0x80) {
                uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
              }
              else {
                uVar50 = 0x1f;
                if (uVar35 != 0) {
                  for (; uVar35 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                  }
                }
                uVar35 = (uVar50 ^ 0xffffffe0) + 0x44;
              }
              uVar50 = (ms->opt).matchLengthFreq[uVar35] + 1;
              iVar24 = 0x1f;
              if (uVar50 != 0) {
                for (; uVar50 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                }
              }
              iVar25 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                       ((uVar56 * 0x100 >> ((byte)iVar25 & 0x1f)) +
                       (uVar50 * 0x100 >> ((byte)iVar24 & 0x1f)))) +
                       ((ML_bits[uVar35] + uVar45) - (iVar25 + iVar24)) * 0x100 + 0x33;
            }
            iVar25 = iVar25 + (uint)local_170 + (int)local_128;
            uVar56 = uVar29 + (int)local_150;
            uVar39 = (ulong)uVar56;
            if (((uint)uVar20 < uVar56) || (iVar25 < local_f0[uVar39].price)) {
              if ((uint)uVar20 < uVar56) {
                uVar20 = uVar20 & 0xffffffff;
                pZVar49 = local_a0 + uVar20;
                do {
                  uVar20 = uVar20 + 1;
                  pZVar49->price = 0x40000000;
                  pZVar49 = pZVar49 + 1;
                } while (uVar20 < uVar39);
              }
              local_f0[uVar39].mlen = uVar29;
              local_f0[uVar39].off = UVar18;
              local_f0[uVar39].litlen = (U32)local_168;
              local_f0[uVar39].price = iVar25;
            }
            uVar29 = uVar29 - 1;
          } while (uVar48 <= uVar29);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != (int)local_148 + (uint)((int)local_148 == 0));
      uVar48 = 0;
    }
  }
LAB_007070f0:
  pZVar49 = local_f0;
  if (uVar48 < 0x11) {
    if (uVar48 != 0) {
      if (uVar48 == 7) goto LAB_00707186;
      goto LAB_007074f2;
    }
  }
  else if (uVar48 != 0x13) {
    if (uVar48 != 0x11) goto LAB_007074f2;
    goto LAB_0070712a;
  }
  uVar48 = (int)local_150 + 1;
  local_168 = (ZSTD_optimal_t *)(ulong)uVar48;
  if ((uint)uVar20 < uVar48) goto LAB_0070712a;
  goto LAB_00705351;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const curr = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (curr == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}